

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack16to8.h
# Opt level: O0

void ncnn::convolution_pack16to8_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined1 auVar128 [24];
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  undefined8 uVar139;
  undefined8 uVar140;
  undefined8 uVar141;
  undefined8 uVar142;
  undefined8 uVar143;
  undefined8 uVar144;
  undefined8 uVar145;
  undefined8 uVar146;
  undefined8 uVar147;
  undefined1 auVar148 [24];
  undefined1 auVar149 [16];
  undefined8 uVar150;
  undefined8 uVar151;
  undefined8 uVar152;
  undefined8 uVar153;
  undefined8 uVar154;
  undefined8 uVar155;
  undefined8 uVar156;
  undefined8 uVar157;
  undefined8 uVar158;
  undefined8 uVar159;
  undefined8 uVar160;
  undefined8 uVar161;
  undefined8 uVar162;
  undefined8 uVar163;
  undefined8 uVar164;
  undefined8 uVar165;
  undefined8 uVar166;
  undefined8 uVar167;
  undefined8 uVar168;
  undefined8 uVar169;
  undefined8 uVar170;
  undefined8 uVar171;
  undefined8 uVar172;
  undefined8 uVar173;
  undefined8 uVar174;
  undefined8 uVar175;
  undefined8 uVar176;
  undefined8 uVar177;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar183;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _wf;
  __m256 _we;
  __m256 _wd;
  __m256 _wc;
  __m256 _wb;
  __m256 _wa;
  __m256 _w9;
  __m256 _w8;
  __m256 _w7;
  __m256 _w6;
  __m256 _w5;
  __m256 _w4;
  __m256 _w3;
  __m256 _w2;
  __m256 _w1;
  __m256 _w0;
  __m256 _valf;
  __m256 _vale;
  __m256 _vald;
  __m256 _valc;
  __m256 _valb;
  __m256 _vala;
  __m256 _val9;
  __m256 _val8;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  float *slptr;
  int k;
  float *sptr;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  __m256 y_2;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  allocator_type *in_stack_ffffffffffffaaf8;
  size_type in_stack_ffffffffffffab00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffab08;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 local_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  int local_4bac;
  undefined8 local_4ba0;
  undefined8 local_4b98;
  undefined8 local_4b90;
  undefined4 local_4b88;
  long local_4b80;
  undefined4 local_4b78;
  undefined4 local_4b74;
  undefined4 local_4b70;
  undefined4 local_4b6c;
  undefined4 local_4b68;
  undefined8 local_4b60;
  int local_4b54;
  undefined8 local_4b50;
  undefined8 local_4b48;
  undefined8 local_4b40;
  undefined4 local_4b38;
  long local_4b30;
  undefined4 local_4b28;
  undefined4 local_4b24;
  undefined4 local_4b20;
  undefined4 local_4b1c;
  undefined4 local_4b18;
  undefined8 local_4b10;
  undefined1 (*local_4b08) [32];
  undefined1 local_4b00 [32];
  int local_4ad0;
  int local_4acc;
  undefined8 local_4ac8;
  undefined8 local_4ac0;
  undefined8 local_4ab8;
  undefined4 local_4ab0;
  long local_4aa8;
  undefined4 local_4aa0;
  undefined4 local_4a9c;
  undefined4 local_4a98;
  undefined4 local_4a94;
  undefined4 local_4a90;
  undefined8 local_4a88;
  undefined1 (*local_4a80) [32];
  int local_4a74;
  long local_4a70;
  int local_4a64;
  int local_4a60;
  int local_4a5c;
  int local_4a58;
  int local_4a54;
  reference local_4a50;
  vector<int,_std::allocator<int>_> local_4a30;
  int local_4a18;
  int local_4a14;
  int local_4a10;
  int local_4a0c;
  int local_4a08;
  int local_4a04;
  int local_4a00;
  int local_49fc;
  long *local_49f8;
  long *local_49f0;
  long *local_49e8;
  long *local_49e0;
  undefined8 *local_49d8;
  undefined8 *local_49c8;
  undefined8 *local_49b8;
  undefined8 *local_4990;
  undefined8 *local_4970;
  undefined8 *local_4950;
  undefined1 local_4945;
  int local_4944;
  undefined8 *local_4938;
  undefined8 *local_4918;
  undefined8 *local_4910;
  long *local_4908;
  int local_48fc;
  undefined8 *local_48f8;
  undefined1 local_48ed;
  int local_48ec;
  undefined8 *local_48e0;
  undefined1 local_48bd;
  int local_48bc;
  undefined8 *local_48b0;
  undefined1 (*local_4848) [32];
  undefined1 (*local_4840) [32];
  undefined1 (*local_4838) [32];
  undefined1 (*local_4830) [32];
  undefined1 (*local_4828) [32];
  undefined1 (*local_4820) [32];
  undefined1 (*local_4818) [32];
  undefined1 (*local_4810) [32];
  undefined1 (*local_4808) [32];
  undefined1 (*local_4800) [32];
  undefined1 (*local_47f8) [32];
  undefined1 (*local_47f0) [32];
  undefined1 (*local_47e8) [32];
  undefined1 (*local_47e0) [32];
  undefined1 (*local_47d8) [32];
  undefined1 (*local_47d0) [32];
  undefined1 (*local_47c8) [32];
  undefined4 local_47c0;
  undefined4 uStack_47bc;
  undefined4 uStack_47b8;
  undefined4 uStack_47b4;
  undefined4 uStack_47b0;
  undefined4 uStack_47ac;
  undefined4 uStack_47a8;
  undefined4 uStack_47a4;
  undefined4 local_478c;
  undefined4 *local_4788;
  undefined4 local_4780;
  undefined4 uStack_477c;
  undefined4 uStack_4778;
  undefined4 uStack_4774;
  undefined4 uStack_4770;
  undefined4 uStack_476c;
  undefined4 uStack_4768;
  undefined4 uStack_4764;
  undefined4 local_474c;
  undefined4 *local_4748;
  undefined4 local_4740;
  undefined4 uStack_473c;
  undefined4 uStack_4738;
  undefined4 uStack_4734;
  undefined4 uStack_4730;
  undefined4 uStack_472c;
  undefined4 uStack_4728;
  undefined4 uStack_4724;
  undefined4 local_470c;
  undefined4 *local_4708;
  undefined4 local_4700;
  undefined4 uStack_46fc;
  undefined4 uStack_46f8;
  undefined4 uStack_46f4;
  undefined4 uStack_46f0;
  undefined4 uStack_46ec;
  undefined4 uStack_46e8;
  undefined4 uStack_46e4;
  undefined4 local_46cc;
  undefined4 *local_46c8;
  undefined4 local_46c0;
  undefined4 uStack_46bc;
  undefined4 uStack_46b8;
  undefined4 uStack_46b4;
  undefined4 uStack_46b0;
  undefined4 uStack_46ac;
  undefined4 uStack_46a8;
  undefined4 uStack_46a4;
  undefined4 local_468c;
  undefined4 *local_4688;
  undefined4 local_4680;
  undefined4 uStack_467c;
  undefined4 uStack_4678;
  undefined4 uStack_4674;
  undefined4 uStack_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined4 local_464c;
  undefined4 *local_4648;
  undefined4 local_4640;
  undefined4 uStack_463c;
  undefined4 uStack_4638;
  undefined4 uStack_4634;
  undefined4 uStack_4630;
  undefined4 uStack_462c;
  undefined4 uStack_4628;
  undefined4 uStack_4624;
  undefined4 local_460c;
  undefined4 *local_4608;
  undefined4 local_4600;
  undefined4 uStack_45fc;
  undefined4 uStack_45f8;
  undefined4 uStack_45f4;
  undefined4 uStack_45f0;
  undefined4 uStack_45ec;
  undefined4 uStack_45e8;
  undefined4 uStack_45e4;
  undefined4 local_45cc;
  undefined4 *local_45c8;
  undefined4 local_45c0;
  undefined4 uStack_45bc;
  undefined4 uStack_45b8;
  undefined4 uStack_45b4;
  undefined4 uStack_45b0;
  undefined4 uStack_45ac;
  undefined4 uStack_45a8;
  undefined4 uStack_45a4;
  undefined4 local_458c;
  undefined4 *local_4588;
  undefined4 local_4580;
  undefined4 uStack_457c;
  undefined4 uStack_4578;
  undefined4 uStack_4574;
  undefined4 uStack_4570;
  undefined4 uStack_456c;
  undefined4 uStack_4568;
  undefined4 uStack_4564;
  undefined4 local_454c;
  undefined4 *local_4548;
  undefined4 local_4540;
  undefined4 uStack_453c;
  undefined4 uStack_4538;
  undefined4 uStack_4534;
  undefined4 uStack_4530;
  undefined4 uStack_452c;
  undefined4 uStack_4528;
  undefined4 uStack_4524;
  undefined4 local_450c;
  undefined4 *local_4508;
  undefined4 local_4500;
  undefined4 uStack_44fc;
  undefined4 uStack_44f8;
  undefined4 uStack_44f4;
  undefined4 uStack_44f0;
  undefined4 uStack_44ec;
  undefined4 uStack_44e8;
  undefined4 uStack_44e4;
  undefined4 local_44cc;
  undefined4 *local_44c8;
  undefined4 local_44c0;
  undefined4 uStack_44bc;
  undefined4 uStack_44b8;
  undefined4 uStack_44b4;
  undefined4 uStack_44b0;
  undefined4 uStack_44ac;
  undefined4 uStack_44a8;
  undefined4 uStack_44a4;
  undefined4 local_448c;
  undefined4 *local_4488;
  undefined4 local_4480;
  undefined4 uStack_447c;
  undefined4 uStack_4478;
  undefined4 uStack_4474;
  undefined4 uStack_4470;
  undefined4 uStack_446c;
  undefined4 uStack_4468;
  undefined4 uStack_4464;
  undefined4 local_444c;
  undefined4 *local_4448;
  undefined4 local_4440;
  undefined4 uStack_443c;
  undefined4 uStack_4438;
  undefined4 uStack_4434;
  undefined4 uStack_4430;
  undefined4 uStack_442c;
  undefined4 uStack_4428;
  undefined4 uStack_4424;
  undefined4 local_440c;
  undefined4 *local_4408;
  undefined4 local_4400;
  undefined4 uStack_43fc;
  undefined4 uStack_43f8;
  undefined4 uStack_43f4;
  undefined4 uStack_43f0;
  undefined4 uStack_43ec;
  undefined4 uStack_43e8;
  undefined4 uStack_43e4;
  undefined4 local_43cc;
  undefined4 *local_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  long *local_3d10;
  int local_3d04;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined1 local_3ce0 [48];
  undefined8 local_3cb0;
  long *local_3ca8;
  undefined8 local_3ca0;
  long *local_3c98;
  undefined8 local_3c90;
  long *local_3c88;
  undefined8 local_3c80;
  long *local_3c78;
  undefined8 local_3c70;
  long *local_3c68;
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  allocator_type *paStack_3c28;
  undefined1 (*local_3c08) [32];
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined1 local_3b80 [32];
  undefined1 local_3b60 [32];
  uint local_3b24;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  uint local_3a74;
  uint local_3a70;
  uint local_3a6c;
  uint local_3a68;
  uint local_3a64;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined1 local_3a00 [32];
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined4 local_3964;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined4 local_3924;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined1 local_3900 [32];
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined4 local_3824;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  float local_3760;
  float fStack_375c;
  float fStack_3758;
  float fStack_3754;
  float fStack_3750;
  float fStack_374c;
  float fStack_3748;
  float fStack_3744;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined1 local_3660 [16];
  undefined1 auStack_3650 [16];
  undefined4 local_3640;
  undefined4 local_363c;
  undefined4 local_3638;
  undefined4 local_3634;
  undefined4 local_3630;
  undefined4 local_362c;
  undefined4 local_3628;
  undefined4 local_3624;
  undefined1 local_3620 [16];
  undefined1 auStack_3610 [16];
  undefined4 local_3600;
  undefined4 local_35fc;
  undefined4 local_35f8;
  undefined4 local_35f4;
  undefined4 local_35f0;
  undefined4 local_35ec;
  undefined4 local_35e8;
  undefined4 local_35e4;
  undefined1 local_35e0 [16];
  undefined1 auStack_35d0 [16];
  undefined4 local_35c0;
  undefined4 local_35bc;
  undefined4 local_35b8;
  undefined4 local_35b4;
  undefined4 local_35b0;
  undefined4 local_35ac;
  undefined4 local_35a8;
  undefined4 local_35a4;
  undefined1 local_35a0 [32];
  uint local_3580;
  uint local_357c;
  uint local_3578;
  uint local_3574;
  uint local_3570;
  uint local_356c;
  uint local_3568;
  uint local_3564;
  undefined1 local_3560 [32];
  uint local_3540;
  uint local_353c;
  uint local_3538;
  uint local_3534;
  uint local_3530;
  uint local_352c;
  uint local_3528;
  uint local_3524;
  undefined1 local_3520 [32];
  uint local_3500;
  uint local_34fc;
  uint local_34f8;
  uint local_34f4;
  uint local_34f0;
  uint local_34ec;
  uint local_34e8;
  uint local_34e4;
  undefined1 local_34e0 [32];
  uint local_34c0;
  uint local_34bc;
  uint local_34b8;
  uint local_34b4;
  uint local_34b0;
  uint local_34ac;
  uint local_34a8;
  uint local_34a4;
  undefined1 local_34a0 [32];
  uint local_3480;
  uint local_347c;
  uint local_3478;
  uint local_3474;
  uint local_3470;
  uint local_346c;
  uint local_3468;
  uint local_3464;
  float local_3460;
  float fStack_345c;
  float fStack_3458;
  float fStack_3454;
  float fStack_3450;
  float fStack_344c;
  float fStack_3448;
  float fStack_3444;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined1 local_3400 [8];
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined1 local_33e0 [32];
  undefined4 local_33c0;
  undefined4 uStack_33bc;
  undefined4 uStack_33b8;
  undefined4 uStack_33b4;
  undefined4 uStack_33b0;
  undefined4 uStack_33ac;
  undefined4 uStack_33a8;
  undefined4 uStack_33a4;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined1 local_3380 [32];
  undefined1 local_3360 [8];
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined1 local_3340 [32];
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined4 local_3300;
  undefined4 uStack_32fc;
  undefined4 uStack_32f8;
  undefined4 uStack_32f4;
  undefined4 uStack_32f0;
  undefined4 uStack_32ec;
  undefined4 uStack_32e8;
  undefined4 uStack_32e4;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined4 local_32c0;
  undefined4 uStack_32bc;
  undefined4 uStack_32b8;
  undefined4 uStack_32b4;
  undefined4 uStack_32b0;
  undefined4 uStack_32ac;
  undefined4 uStack_32a8;
  undefined4 uStack_32a4;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined1 local_31a0 [8];
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined1 local_3180 [32];
  undefined4 local_3160;
  undefined4 uStack_315c;
  undefined4 uStack_3158;
  undefined4 uStack_3154;
  undefined4 uStack_3150;
  undefined4 uStack_314c;
  undefined4 uStack_3148;
  undefined4 uStack_3144;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined1 local_3120 [32];
  undefined1 local_3100 [8];
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined1 local_30e0 [32];
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined4 local_30a0;
  undefined4 uStack_309c;
  undefined4 uStack_3098;
  undefined4 uStack_3094;
  undefined4 uStack_3090;
  undefined4 uStack_308c;
  undefined4 uStack_3088;
  undefined4 uStack_3084;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined4 local_3060;
  undefined4 uStack_305c;
  undefined4 uStack_3058;
  undefined4 uStack_3054;
  undefined4 uStack_3050;
  undefined4 uStack_304c;
  undefined4 uStack_3048;
  undefined4 uStack_3044;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined4 local_2de0;
  undefined4 uStack_2ddc;
  undefined4 uStack_2dd8;
  undefined4 uStack_2dd4;
  undefined4 uStack_2dd0;
  undefined4 uStack_2dcc;
  undefined4 uStack_2dc8;
  undefined4 uStack_2dc4;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined4 local_2d20;
  undefined4 uStack_2d1c;
  undefined4 uStack_2d18;
  undefined4 uStack_2d14;
  undefined4 uStack_2d10;
  undefined4 uStack_2d0c;
  undefined4 uStack_2d08;
  undefined4 uStack_2d04;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined4 local_2c60;
  undefined4 uStack_2c5c;
  undefined4 uStack_2c58;
  undefined4 uStack_2c54;
  undefined4 uStack_2c50;
  undefined4 uStack_2c4c;
  undefined4 uStack_2c48;
  undefined4 uStack_2c44;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined4 local_2ba0;
  undefined4 uStack_2b9c;
  undefined4 uStack_2b98;
  undefined4 uStack_2b94;
  undefined4 uStack_2b90;
  undefined4 uStack_2b8c;
  undefined4 uStack_2b88;
  undefined4 uStack_2b84;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined4 local_2ae0;
  undefined4 uStack_2adc;
  undefined4 uStack_2ad8;
  undefined4 uStack_2ad4;
  undefined4 uStack_2ad0;
  undefined4 uStack_2acc;
  undefined4 uStack_2ac8;
  undefined4 uStack_2ac4;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined4 local_2a20;
  undefined4 uStack_2a1c;
  undefined4 uStack_2a18;
  undefined4 uStack_2a14;
  undefined4 uStack_2a10;
  undefined4 uStack_2a0c;
  undefined4 uStack_2a08;
  undefined4 uStack_2a04;
  undefined4 local_2a00;
  undefined4 uStack_29fc;
  undefined4 uStack_29f8;
  undefined4 uStack_29f4;
  undefined4 uStack_29f0;
  undefined4 uStack_29ec;
  undefined4 uStack_29e8;
  undefined4 uStack_29e4;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined4 local_28a0;
  undefined4 uStack_289c;
  undefined4 uStack_2898;
  undefined4 uStack_2894;
  undefined4 uStack_2890;
  undefined4 uStack_288c;
  undefined4 uStack_2888;
  undefined4 uStack_2884;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined4 local_27e0;
  undefined4 uStack_27dc;
  undefined4 uStack_27d8;
  undefined4 uStack_27d4;
  undefined4 uStack_27d0;
  undefined4 uStack_27cc;
  undefined4 uStack_27c8;
  undefined4 uStack_27c4;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined4 local_2720;
  undefined4 uStack_271c;
  undefined4 uStack_2718;
  undefined4 uStack_2714;
  undefined4 uStack_2710;
  undefined4 uStack_270c;
  undefined4 uStack_2708;
  undefined4 uStack_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined4 local_25a0;
  undefined4 uStack_259c;
  undefined4 uStack_2598;
  undefined4 uStack_2594;
  undefined4 uStack_2590;
  undefined4 uStack_258c;
  undefined4 uStack_2588;
  undefined4 uStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined4 local_24e0;
  undefined4 uStack_24dc;
  undefined4 uStack_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined4 local_22c0;
  undefined4 uStack_22bc;
  undefined4 uStack_22b8;
  undefined4 uStack_22b4;
  undefined4 uStack_22b0;
  undefined4 uStack_22ac;
  undefined4 uStack_22a8;
  undefined4 uStack_22a4;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined4 local_2260;
  undefined4 uStack_225c;
  undefined4 uStack_2258;
  undefined4 uStack_2254;
  undefined4 uStack_2250;
  undefined4 uStack_224c;
  undefined4 uStack_2248;
  undefined4 uStack_2244;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined4 local_2200;
  undefined4 uStack_21fc;
  undefined4 uStack_21f8;
  undefined4 uStack_21f4;
  undefined4 uStack_21f0;
  undefined4 uStack_21ec;
  undefined4 uStack_21e8;
  undefined4 uStack_21e4;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined4 local_21a0;
  undefined4 uStack_219c;
  undefined4 uStack_2198;
  undefined4 uStack_2194;
  undefined4 uStack_2190;
  undefined4 uStack_218c;
  undefined4 uStack_2188;
  undefined4 uStack_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined4 local_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined4 local_2044;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined4 local_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined4 local_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined4 local_1ce8;
  undefined4 local_1ce4;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float fStack_1ca8;
  undefined4 uStack_1ca4;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined4 local_1c64;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  float fStack_1c24;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined1 local_1be0 [16];
  undefined1 auStack_1bd0 [16];
  undefined4 local_1bc0;
  undefined4 local_1bbc;
  undefined4 local_1bb8;
  undefined4 local_1bb4;
  undefined4 local_1bb0;
  undefined4 local_1bac;
  undefined4 local_1ba8;
  undefined4 local_1ba4;
  undefined1 local_1ba0 [16];
  undefined1 auStack_1b90 [16];
  undefined4 local_1b80;
  undefined4 local_1b7c;
  undefined4 local_1b78;
  undefined4 local_1b74;
  undefined4 local_1b70;
  undefined4 local_1b6c;
  undefined4 local_1b68;
  undefined4 local_1b64;
  undefined1 local_1b60 [16];
  undefined1 auStack_1b50 [16];
  undefined4 local_1b40;
  undefined4 local_1b3c;
  undefined4 local_1b38;
  undefined4 local_1b34;
  undefined4 local_1b30;
  undefined4 local_1b2c;
  undefined4 local_1b28;
  undefined4 local_1b24;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined1 local_1ac0 [8];
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined1 local_1aa0 [32];
  undefined4 local_1a80;
  undefined4 uStack_1a7c;
  undefined4 uStack_1a78;
  undefined4 uStack_1a74;
  undefined4 uStack_1a70;
  undefined4 uStack_1a6c;
  undefined4 uStack_1a68;
  undefined4 uStack_1a64;
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [8];
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined1 local_1a00 [32];
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined4 local_19c0;
  undefined4 uStack_19bc;
  undefined4 uStack_19b8;
  undefined4 uStack_19b4;
  undefined4 uStack_19b0;
  undefined4 uStack_19ac;
  undefined4 uStack_19a8;
  undefined4 uStack_19a4;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined4 local_1980;
  undefined4 uStack_197c;
  undefined4 uStack_1978;
  undefined4 uStack_1974;
  undefined4 uStack_1970;
  undefined4 uStack_196c;
  undefined4 uStack_1968;
  undefined4 uStack_1964;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined4 local_1740;
  undefined4 uStack_173c;
  undefined4 uStack_1738;
  undefined4 uStack_1734;
  undefined4 uStack_1730;
  undefined4 uStack_172c;
  undefined4 uStack_1728;
  undefined4 uStack_1724;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined4 local_1680;
  undefined4 uStack_167c;
  undefined4 uStack_1678;
  undefined4 uStack_1674;
  undefined4 uStack_1670;
  undefined4 uStack_166c;
  undefined4 uStack_1668;
  undefined4 uStack_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined4 local_15c0;
  undefined4 uStack_15bc;
  undefined4 uStack_15b8;
  undefined4 uStack_15b4;
  undefined4 uStack_15b0;
  undefined4 uStack_15ac;
  undefined4 uStack_15a8;
  undefined4 uStack_15a4;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined4 local_1500;
  undefined4 uStack_14fc;
  undefined4 uStack_14f8;
  undefined4 uStack_14f4;
  undefined4 uStack_14f0;
  undefined4 uStack_14ec;
  undefined4 uStack_14e8;
  undefined4 uStack_14e4;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined4 local_1440;
  undefined4 uStack_143c;
  undefined4 uStack_1438;
  undefined4 uStack_1434;
  undefined4 uStack_1430;
  undefined4 uStack_142c;
  undefined4 uStack_1428;
  undefined4 uStack_1424;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined4 local_1380;
  undefined4 uStack_137c;
  undefined4 uStack_1378;
  undefined4 uStack_1374;
  undefined4 uStack_1370;
  undefined4 uStack_136c;
  undefined4 uStack_1368;
  undefined4 uStack_1364;
  undefined4 local_1360;
  undefined4 uStack_135c;
  undefined4 uStack_1358;
  undefined4 uStack_1354;
  undefined4 uStack_1350;
  undefined4 uStack_134c;
  undefined4 uStack_1348;
  undefined4 uStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined4 local_1260;
  undefined4 uStack_125c;
  undefined4 uStack_1258;
  undefined4 uStack_1254;
  undefined4 uStack_1250;
  undefined4 uStack_124c;
  undefined4 uStack_1248;
  undefined4 uStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined4 local_1200;
  undefined4 uStack_11fc;
  undefined4 uStack_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined4 local_1144;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined4 local_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [8];
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined1 local_f80 [32];
  undefined1 local_f60 [32];
  undefined1 local_f40 [8];
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined1 local_f20 [32];
  undefined4 local_f00;
  undefined4 uStack_efc;
  undefined4 uStack_ef8;
  undefined4 uStack_ef4;
  undefined4 uStack_ef0;
  undefined4 uStack_eec;
  undefined4 uStack_ee8;
  undefined4 uStack_ee4;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [8];
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined4 local_e80;
  undefined4 uStack_e7c;
  undefined4 uStack_e78;
  undefined4 uStack_e74;
  undefined4 uStack_e70;
  undefined4 uStack_e6c;
  undefined4 uStack_e68;
  undefined4 uStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  ulong uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [32];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined4 local_c20;
  undefined4 uStack_c1c;
  undefined4 uStack_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  undefined4 uStack_c08;
  undefined4 uStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  ulong uStack_b68;
  undefined4 local_b60;
  undefined4 uStack_b5c;
  undefined4 uStack_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  ulong uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined4 local_ac0;
  undefined4 uStack_abc;
  undefined4 uStack_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 uStack_aa8;
  undefined4 uStack_aa4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined4 local_a00;
  undefined4 uStack_9fc;
  undefined4 uStack_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined4 uStack_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 uStack_928;
  undefined4 uStack_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined4 local_640;
  undefined4 uStack_63c;
  undefined4 uStack_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined4 local_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined4 local_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined1 (*local_f0) [32];
  undefined4 local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  long local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  undefined8 *local_a0;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined1 (*local_80) [32];
  undefined4 local_74;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_4a04 = *(int *)((long)in_RDI + 0x2c);
  local_4a08 = (int)in_RDI[7];
  local_4a0c = *(int *)((long)in_RSI + 0x2c);
  local_4a10 = (int)in_RSI[6];
  local_4a14 = (int)in_RSI[7];
  local_4a18 = in_R8D * in_R9D;
  local_4a00 = in_R9D;
  local_49fc = in_R8D;
  local_49f8 = in_RCX;
  local_49f0 = in_RDX;
  local_49e8 = in_RSI;
  local_49e0 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x3a77ed);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffab08,in_stack_ffffffffffffab00,in_stack_ffffffffffffaaf8);
  std::allocator<int>::~allocator((allocator<int> *)0x3a7819);
  local_4a50 = std::vector<int,_std::allocator<int>_>::operator[](&local_4a30,0);
  local_4a54 = 0;
  local_4a58 = 0;
  local_4a5c = local_4a04 * dilation_w - local_49fc * in_stack_00000008;
  for (local_4a60 = 0; local_4a60 < local_4a00; local_4a60 = local_4a60 + 1) {
    for (local_4a64 = 0; local_4a64 < local_49fc; local_4a64 = local_4a64 + 1) {
      local_4a50[local_4a54] = local_4a58;
      local_4a54 = local_4a54 + 1;
      local_4a58 = in_stack_00000008 + local_4a58;
    }
    local_4a58 = local_4a5c + local_4a58;
  }
  local_4908 = local_49f8;
  local_4a70 = *local_49f8;
  for (local_4a74 = 0; local_4a74 < local_4a14; local_4a74 = local_4a74 + 1) {
    local_4938 = &local_4ac8;
    local_6c = *(int *)((long)local_49e8 + 0x2c);
    local_70 = (int)local_49e8[6];
    local_74 = *(undefined4 *)((long)local_49e8 + 0x34);
    local_80 = (undefined1 (*) [32])(*local_49e8 + local_49e8[8] * (long)local_4a74 * local_49e8[2])
    ;
    local_88 = local_49e8[2];
    local_8c = (undefined4)local_49e8[3];
    local_98 = local_49e8[4];
    local_68 = &local_4ac8;
    local_58 = (long)local_6c * (long)local_70 * local_88;
    local_4918 = &local_4ac8;
    local_49d8 = &local_4ac8;
    local_5c = 0x10;
    local_4944 = local_4a74;
    local_4945 = 1;
    local_4ac8 = 0;
    local_4ab8 = 0;
    local_4ab0 = 0;
    local_4aa0 = 0;
    local_4a9c = 0;
    local_4a98 = 0;
    local_4a94 = 0;
    local_4a90 = 0;
    local_4a88 = 0;
    local_4ac0 = 0;
    local_4a80 = local_80;
    for (local_4acc = 0; local_4acc < local_4a10; local_4acc = local_4acc + 1) {
      for (local_4ad0 = 0; uVar112 = uStack_36a8, uVar111 = uStack_36b0, uVar110 = uStack_36b8,
          uVar109 = local_36c0, local_4ad0 < local_4a0c; local_4ad0 = local_4ad0 + 1) {
        local_4b00 = ZEXT1632(ZEXT816(0));
        if (local_4a70 != 0) {
          local_47c8 = (undefined1 (*) [32])(local_4a70 + (long)(local_4a74 << 3) * 4);
          local_4b00 = *local_47c8;
        }
        local_48b0 = &local_4b50;
        local_dc = *(int *)((long)local_49f0 + 0x2c);
        local_e0 = (int)local_49f0[6];
        local_e4 = *(undefined4 *)((long)local_49f0 + 0x34);
        local_f0 = (undefined1 (*) [32])
                   (*local_49f0 + local_49f0[8] * (long)local_4a74 * local_49f0[2]);
        local_f8 = local_49f0[2];
        local_fc = (undefined4)local_49f0[3];
        local_108 = local_49f0[4];
        local_d8 = &local_4b50;
        local_38 = (long)local_dc * (long)local_e0 * local_f8;
        local_4910 = &local_4b50;
        local_49c8 = &local_4b50;
        local_3c = 0x10;
        uStack_3da8 = 0;
        uStack_3db0 = 0;
        uStack_3db8 = 0;
        local_3dc0 = 0;
        local_48bc = local_4a74;
        local_48bd = 1;
        local_4b50 = 0;
        local_4b40 = 0;
        local_4b38 = 0;
        local_4b28 = 0;
        local_4b24 = 0;
        local_4b20 = 0;
        local_4b1c = 0;
        local_4b18 = 0;
        local_4b10 = 0;
        local_4b48 = 0;
        local_4b08 = local_f0;
        for (local_4b54 = 0; local_4b54 < local_4a08; local_4b54 = local_4b54 + 1) {
          local_48e0 = &local_4ba0;
          local_a4 = *(int *)((long)local_49e0 + 0x2c);
          local_a8 = (int)local_49e0[6];
          local_ac = *(undefined4 *)((long)local_49e0 + 0x34);
          local_b8 = *local_49e0 + local_49e0[8] * (long)local_4b54 * local_49e0[2];
          local_c0 = local_49e0[2];
          local_c4 = (undefined4)local_49e0[3];
          local_d0 = local_49e0[4];
          local_a0 = &local_4ba0;
          local_48 = (long)local_a4 * (long)local_a8 * local_c0;
          local_48fc = local_4acc * stride_w;
          local_48f8 = &local_4ba0;
          for (local_4bac = 0; local_4bac < local_4a18; local_4bac = local_4bac + 1) {
            local_43c8 = (undefined4 *)
                         (local_b8 + (long)local_a4 * (long)local_48fc * local_c0 +
                          (long)(local_4ad0 * dilation_h * 0x10) * 4 +
                         (long)(local_4a50[local_4bac] << 4) * 4);
            local_4400 = *local_43c8;
            local_3de0 = CONCAT44(local_4400,local_4400);
            uStack_3dd8 = CONCAT44(local_4400,local_4400);
            uStack_3dd0 = CONCAT44(local_4400,local_4400);
            uStack_3dc8 = CONCAT44(local_4400,local_4400);
            local_4408 = local_43c8 + 1;
            local_4440 = *local_4408;
            local_3e40 = CONCAT44(local_4440,local_4440);
            uStack_3e38 = CONCAT44(local_4440,local_4440);
            uStack_3e30 = CONCAT44(local_4440,local_4440);
            uStack_3e28 = CONCAT44(local_4440,local_4440);
            local_4448 = local_43c8 + 2;
            local_4480 = *local_4448;
            local_3ea0 = CONCAT44(local_4480,local_4480);
            uStack_3e98 = CONCAT44(local_4480,local_4480);
            uStack_3e90 = CONCAT44(local_4480,local_4480);
            uStack_3e88 = CONCAT44(local_4480,local_4480);
            local_4488 = local_43c8 + 3;
            local_44c0 = *local_4488;
            local_3f00 = CONCAT44(local_44c0,local_44c0);
            uStack_3ef8 = CONCAT44(local_44c0,local_44c0);
            uStack_3ef0 = CONCAT44(local_44c0,local_44c0);
            uStack_3ee8 = CONCAT44(local_44c0,local_44c0);
            local_44c8 = local_43c8 + 4;
            local_4500 = *local_44c8;
            local_3f60 = CONCAT44(local_4500,local_4500);
            uStack_3f58 = CONCAT44(local_4500,local_4500);
            uStack_3f50 = CONCAT44(local_4500,local_4500);
            uStack_3f48 = CONCAT44(local_4500,local_4500);
            local_4508 = local_43c8 + 5;
            local_4540 = *local_4508;
            local_3fc0 = CONCAT44(local_4540,local_4540);
            uStack_3fb8 = CONCAT44(local_4540,local_4540);
            uStack_3fb0 = CONCAT44(local_4540,local_4540);
            uStack_3fa8 = CONCAT44(local_4540,local_4540);
            local_4548 = local_43c8 + 6;
            local_4580 = *local_4548;
            local_4020 = CONCAT44(local_4580,local_4580);
            uStack_4018 = CONCAT44(local_4580,local_4580);
            uStack_4010 = CONCAT44(local_4580,local_4580);
            uStack_4008 = CONCAT44(local_4580,local_4580);
            local_4588 = local_43c8 + 7;
            local_45c0 = *local_4588;
            local_4080 = CONCAT44(local_45c0,local_45c0);
            uStack_4078 = CONCAT44(local_45c0,local_45c0);
            uStack_4070 = CONCAT44(local_45c0,local_45c0);
            uStack_4068 = CONCAT44(local_45c0,local_45c0);
            local_45c8 = local_43c8 + 8;
            local_4600 = *local_45c8;
            local_40e0 = CONCAT44(local_4600,local_4600);
            uStack_40d8 = CONCAT44(local_4600,local_4600);
            uStack_40d0 = CONCAT44(local_4600,local_4600);
            uStack_40c8 = CONCAT44(local_4600,local_4600);
            local_4608 = local_43c8 + 9;
            local_4640 = *local_4608;
            local_4140 = CONCAT44(local_4640,local_4640);
            uStack_4138 = CONCAT44(local_4640,local_4640);
            uStack_4130 = CONCAT44(local_4640,local_4640);
            uStack_4128 = CONCAT44(local_4640,local_4640);
            local_4648 = local_43c8 + 10;
            local_4680 = *local_4648;
            local_41a0 = CONCAT44(local_4680,local_4680);
            uStack_4198 = CONCAT44(local_4680,local_4680);
            uStack_4190 = CONCAT44(local_4680,local_4680);
            uStack_4188 = CONCAT44(local_4680,local_4680);
            local_4688 = local_43c8 + 0xb;
            local_46c0 = *local_4688;
            local_4200 = CONCAT44(local_46c0,local_46c0);
            uStack_41f8 = CONCAT44(local_46c0,local_46c0);
            uStack_41f0 = CONCAT44(local_46c0,local_46c0);
            uStack_41e8 = CONCAT44(local_46c0,local_46c0);
            local_46c8 = local_43c8 + 0xc;
            local_4700 = *local_46c8;
            local_4260 = CONCAT44(local_4700,local_4700);
            uStack_4258 = CONCAT44(local_4700,local_4700);
            uStack_4250 = CONCAT44(local_4700,local_4700);
            uStack_4248 = CONCAT44(local_4700,local_4700);
            local_4708 = local_43c8 + 0xd;
            local_4740 = *local_4708;
            local_42c0 = CONCAT44(local_4740,local_4740);
            uStack_42b8 = CONCAT44(local_4740,local_4740);
            uStack_42b0 = CONCAT44(local_4740,local_4740);
            uStack_42a8 = CONCAT44(local_4740,local_4740);
            local_4748 = local_43c8 + 0xe;
            local_4780 = *local_4748;
            local_4320 = CONCAT44(local_4780,local_4780);
            uStack_4318 = CONCAT44(local_4780,local_4780);
            uStack_4310 = CONCAT44(local_4780,local_4780);
            uStack_4308 = CONCAT44(local_4780,local_4780);
            local_4788 = local_43c8 + 0xf;
            local_47c0 = *local_4788;
            local_4380 = CONCAT44(local_47c0,local_47c0);
            uStack_4378 = CONCAT44(local_47c0,local_47c0);
            uStack_4370 = CONCAT44(local_47c0,local_47c0);
            uStack_4368 = CONCAT44(local_47c0,local_47c0);
            local_47d0 = local_4b08;
            local_3e00 = *(undefined8 *)*local_4b08;
            uStack_3df8 = *(undefined8 *)(*local_4b08 + 8);
            uStack_3df0 = *(undefined8 *)(*local_4b08 + 0x10);
            uStack_3de8 = *(undefined8 *)(*local_4b08 + 0x18);
            local_47d8 = local_4b08 + 1;
            local_3e60 = *(undefined8 *)*local_47d8;
            uStack_3e58 = *(undefined8 *)(local_4b08[1] + 8);
            uStack_3e50 = *(undefined8 *)(local_4b08[1] + 0x10);
            uStack_3e48 = *(undefined8 *)(local_4b08[1] + 0x18);
            local_47e0 = local_4b08 + 2;
            local_3ec0 = *(undefined8 *)*local_47e0;
            uStack_3eb8 = *(undefined8 *)(local_4b08[2] + 8);
            uStack_3eb0 = *(undefined8 *)(local_4b08[2] + 0x10);
            uStack_3ea8 = *(undefined8 *)(local_4b08[2] + 0x18);
            local_47e8 = local_4b08 + 3;
            local_3f20 = *(undefined8 *)*local_47e8;
            uStack_3f18 = *(undefined8 *)(local_4b08[3] + 8);
            uStack_3f10 = *(undefined8 *)(local_4b08[3] + 0x10);
            uStack_3f08 = *(undefined8 *)(local_4b08[3] + 0x18);
            local_47f0 = local_4b08 + 4;
            local_3f80 = *(undefined8 *)*local_47f0;
            uStack_3f78 = *(undefined8 *)(local_4b08[4] + 8);
            uStack_3f70 = *(undefined8 *)(local_4b08[4] + 0x10);
            uStack_3f68 = *(undefined8 *)(local_4b08[4] + 0x18);
            local_47f8 = local_4b08 + 5;
            local_3fe0 = *(undefined8 *)*local_47f8;
            uStack_3fd8 = *(undefined8 *)(local_4b08[5] + 8);
            uStack_3fd0 = *(undefined8 *)(local_4b08[5] + 0x10);
            uStack_3fc8 = *(undefined8 *)(local_4b08[5] + 0x18);
            local_4800 = local_4b08 + 6;
            local_4040 = *(undefined8 *)*local_4800;
            uStack_4038 = *(undefined8 *)(local_4b08[6] + 8);
            uStack_4030 = *(undefined8 *)(local_4b08[6] + 0x10);
            uStack_4028 = *(undefined8 *)(local_4b08[6] + 0x18);
            local_4808 = local_4b08 + 7;
            local_40a0 = *(undefined8 *)*local_4808;
            uStack_4098 = *(undefined8 *)(local_4b08[7] + 8);
            uStack_4090 = *(undefined8 *)(local_4b08[7] + 0x10);
            uStack_4088 = *(undefined8 *)(local_4b08[7] + 0x18);
            local_4810 = local_4b08 + 8;
            local_4100 = *(undefined8 *)*local_4810;
            uStack_40f8 = *(undefined8 *)(local_4b08[8] + 8);
            uStack_40f0 = *(undefined8 *)(local_4b08[8] + 0x10);
            uStack_40e8 = *(undefined8 *)(local_4b08[8] + 0x18);
            local_4818 = local_4b08 + 9;
            local_4160 = *(undefined8 *)*local_4818;
            uStack_4158 = *(undefined8 *)(local_4b08[9] + 8);
            uStack_4150 = *(undefined8 *)(local_4b08[9] + 0x10);
            uStack_4148 = *(undefined8 *)(local_4b08[9] + 0x18);
            local_4820 = local_4b08 + 10;
            local_41c0 = *(undefined8 *)*local_4820;
            uStack_41b8 = *(undefined8 *)(local_4b08[10] + 8);
            uStack_41b0 = *(undefined8 *)(local_4b08[10] + 0x10);
            uStack_41a8 = *(undefined8 *)(local_4b08[10] + 0x18);
            local_4828 = local_4b08 + 0xb;
            local_4220 = *(undefined8 *)*local_4828;
            uStack_4218 = *(undefined8 *)(local_4b08[0xb] + 8);
            uStack_4210 = *(undefined8 *)(local_4b08[0xb] + 0x10);
            uStack_4208 = *(undefined8 *)(local_4b08[0xb] + 0x18);
            local_4830 = local_4b08 + 0xc;
            local_4280 = *(undefined8 *)*local_4830;
            uStack_4278 = *(undefined8 *)(local_4b08[0xc] + 8);
            uStack_4270 = *(undefined8 *)(local_4b08[0xc] + 0x10);
            uStack_4268 = *(undefined8 *)(local_4b08[0xc] + 0x18);
            local_4838 = local_4b08 + 0xd;
            local_42e0 = *(undefined8 *)*local_4838;
            uStack_42d8 = *(undefined8 *)(local_4b08[0xd] + 8);
            uStack_42d0 = *(undefined8 *)(local_4b08[0xd] + 0x10);
            uStack_42c8 = *(undefined8 *)(local_4b08[0xd] + 0x18);
            local_4840 = local_4b08 + 0xe;
            local_4340 = *(undefined8 *)*local_4840;
            uStack_4338 = *(undefined8 *)(local_4b08[0xe] + 8);
            uStack_4330 = *(undefined8 *)(local_4b08[0xe] + 0x10);
            uStack_4328 = *(undefined8 *)(local_4b08[0xe] + 0x18);
            local_4848 = local_4b08 + 0xf;
            local_43a0 = *(undefined8 *)*local_4848;
            uStack_4398 = *(undefined8 *)(local_4b08[0xf] + 8);
            uStack_4390 = *(undefined8 *)(local_4b08[0xf] + 0x10);
            uStack_4388 = *(undefined8 *)(local_4b08[0xf] + 0x18);
            local_3e20 = local_4b00._0_8_;
            uStack_3e18 = local_4b00._8_8_;
            uStack_3e10 = local_4b00._16_8_;
            uStack_3e08 = local_4b00._24_8_;
            auVar20._8_8_ = uStack_3dd8;
            auVar20._0_8_ = local_3de0;
            auVar20._16_8_ = uStack_3dd0;
            auVar20._24_8_ = uStack_3dc8;
            auVar6 = vfmadd213ps_fma(*local_4b08,auVar20,local_4b00);
            local_4b00._0_8_ = auVar6._0_8_;
            local_3e80 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_3e78 = local_4b00._8_8_;
            uStack_3e70 = 0;
            uStack_3e68 = 0;
            auVar19._8_8_ = uStack_3e38;
            auVar19._0_8_ = local_3e40;
            auVar19._16_8_ = uStack_3e30;
            auVar19._24_8_ = uStack_3e28;
            auVar6 = vfmadd213ps_fma(*local_47d8,auVar19,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_3ee0 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_3ed8 = local_4b00._8_8_;
            uStack_3ed0 = 0;
            uStack_3ec8 = 0;
            auVar18._8_8_ = uStack_3e98;
            auVar18._0_8_ = local_3ea0;
            auVar18._16_8_ = uStack_3e90;
            auVar18._24_8_ = uStack_3e88;
            auVar6 = vfmadd213ps_fma(*local_47e0,auVar18,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_3f40 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_3f38 = local_4b00._8_8_;
            uStack_3f30 = 0;
            uStack_3f28 = 0;
            auVar17._8_8_ = uStack_3ef8;
            auVar17._0_8_ = local_3f00;
            auVar17._16_8_ = uStack_3ef0;
            auVar17._24_8_ = uStack_3ee8;
            auVar6 = vfmadd213ps_fma(*local_47e8,auVar17,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_3fa0 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_3f98 = local_4b00._8_8_;
            uStack_3f90 = 0;
            uStack_3f88 = 0;
            auVar16._8_8_ = uStack_3f58;
            auVar16._0_8_ = local_3f60;
            auVar16._16_8_ = uStack_3f50;
            auVar16._24_8_ = uStack_3f48;
            auVar6 = vfmadd213ps_fma(*local_47f0,auVar16,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_4000 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_3ff8 = local_4b00._8_8_;
            uStack_3ff0 = 0;
            uStack_3fe8 = 0;
            auVar15._8_8_ = uStack_3fb8;
            auVar15._0_8_ = local_3fc0;
            auVar15._16_8_ = uStack_3fb0;
            auVar15._24_8_ = uStack_3fa8;
            auVar6 = vfmadd213ps_fma(*local_47f8,auVar15,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_4060 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_4058 = local_4b00._8_8_;
            uStack_4050 = 0;
            uStack_4048 = 0;
            auVar14._8_8_ = uStack_4018;
            auVar14._0_8_ = local_4020;
            auVar14._16_8_ = uStack_4010;
            auVar14._24_8_ = uStack_4008;
            auVar6 = vfmadd213ps_fma(*local_4800,auVar14,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_40c0 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_40b8 = local_4b00._8_8_;
            uStack_40b0 = 0;
            uStack_40a8 = 0;
            auVar13._8_8_ = uStack_4078;
            auVar13._0_8_ = local_4080;
            auVar13._16_8_ = uStack_4070;
            auVar13._24_8_ = uStack_4068;
            auVar6 = vfmadd213ps_fma(*local_4808,auVar13,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_4120 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_4118 = local_4b00._8_8_;
            uStack_4110 = 0;
            uStack_4108 = 0;
            auVar12._8_8_ = uStack_40d8;
            auVar12._0_8_ = local_40e0;
            auVar12._16_8_ = uStack_40d0;
            auVar12._24_8_ = uStack_40c8;
            auVar6 = vfmadd213ps_fma(*local_4810,auVar12,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_4180 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_4178 = local_4b00._8_8_;
            uStack_4170 = 0;
            uStack_4168 = 0;
            auVar11._8_8_ = uStack_4138;
            auVar11._0_8_ = local_4140;
            auVar11._16_8_ = uStack_4130;
            auVar11._24_8_ = uStack_4128;
            auVar6 = vfmadd213ps_fma(*local_4818,auVar11,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_41e0 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_41d8 = local_4b00._8_8_;
            uStack_41d0 = 0;
            uStack_41c8 = 0;
            auVar10._8_8_ = uStack_4198;
            auVar10._0_8_ = local_41a0;
            auVar10._16_8_ = uStack_4190;
            auVar10._24_8_ = uStack_4188;
            auVar6 = vfmadd213ps_fma(*local_4820,auVar10,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_4240 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_4238 = local_4b00._8_8_;
            uStack_4230 = 0;
            uStack_4228 = 0;
            auVar9._8_8_ = uStack_41f8;
            auVar9._0_8_ = local_4200;
            auVar9._16_8_ = uStack_41f0;
            auVar9._24_8_ = uStack_41e8;
            auVar6 = vfmadd213ps_fma(*local_4828,auVar9,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_42a0 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_4298 = local_4b00._8_8_;
            uStack_4290 = 0;
            uStack_4288 = 0;
            auVar8._8_8_ = uStack_4258;
            auVar8._0_8_ = local_4260;
            auVar8._16_8_ = uStack_4250;
            auVar8._24_8_ = uStack_4248;
            auVar6 = vfmadd213ps_fma(*local_4830,auVar8,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_4300 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_42f8 = local_4b00._8_8_;
            uStack_42f0 = 0;
            uStack_42e8 = 0;
            auVar5._8_8_ = uStack_42b8;
            auVar5._0_8_ = local_42c0;
            auVar5._16_8_ = uStack_42b0;
            auVar5._24_8_ = uStack_42a8;
            auVar6 = vfmadd213ps_fma(*local_4838,auVar5,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_4360 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_4358 = local_4b00._8_8_;
            uStack_4350 = 0;
            uStack_4348 = 0;
            auVar3._8_8_ = uStack_4318;
            auVar3._0_8_ = local_4320;
            auVar3._16_8_ = uStack_4310;
            auVar3._24_8_ = uStack_4308;
            auVar6 = vfmadd213ps_fma(*local_4840,auVar3,ZEXT1632(auVar6));
            local_4b00._0_8_ = auVar6._0_8_;
            local_43c0 = local_4b00._0_8_;
            local_4b00._8_8_ = auVar6._8_8_;
            uStack_43b8 = local_4b00._8_8_;
            uStack_43b0 = 0;
            uStack_43a8 = 0;
            auVar4._8_8_ = uStack_4378;
            auVar4._0_8_ = local_4380;
            auVar4._16_8_ = uStack_4370;
            auVar4._24_8_ = uStack_4368;
            auVar6 = vfmadd213ps_fma(*local_4848,auVar4,ZEXT1632(auVar6));
            local_4b00 = ZEXT1632(auVar6);
            local_4b08 = local_4b08 + 0x10;
            uStack_47bc = local_47c0;
            uStack_47b8 = local_47c0;
            uStack_47b4 = local_47c0;
            uStack_47b0 = local_47c0;
            uStack_47ac = local_47c0;
            uStack_47a8 = local_47c0;
            uStack_47a4 = local_47c0;
            local_478c = local_47c0;
            uStack_477c = local_4780;
            uStack_4778 = local_4780;
            uStack_4774 = local_4780;
            uStack_4770 = local_4780;
            uStack_476c = local_4780;
            uStack_4768 = local_4780;
            uStack_4764 = local_4780;
            local_474c = local_4780;
            uStack_473c = local_4740;
            uStack_4738 = local_4740;
            uStack_4734 = local_4740;
            uStack_4730 = local_4740;
            uStack_472c = local_4740;
            uStack_4728 = local_4740;
            uStack_4724 = local_4740;
            local_470c = local_4740;
            uStack_46fc = local_4700;
            uStack_46f8 = local_4700;
            uStack_46f4 = local_4700;
            uStack_46f0 = local_4700;
            uStack_46ec = local_4700;
            uStack_46e8 = local_4700;
            uStack_46e4 = local_4700;
            local_46cc = local_4700;
            uStack_46bc = local_46c0;
            uStack_46b8 = local_46c0;
            uStack_46b4 = local_46c0;
            uStack_46b0 = local_46c0;
            uStack_46ac = local_46c0;
            uStack_46a8 = local_46c0;
            uStack_46a4 = local_46c0;
            local_468c = local_46c0;
            uStack_467c = local_4680;
            uStack_4678 = local_4680;
            uStack_4674 = local_4680;
            uStack_4670 = local_4680;
            uStack_466c = local_4680;
            uStack_4668 = local_4680;
            uStack_4664 = local_4680;
            local_464c = local_4680;
            uStack_463c = local_4640;
            uStack_4638 = local_4640;
            uStack_4634 = local_4640;
            uStack_4630 = local_4640;
            uStack_462c = local_4640;
            uStack_4628 = local_4640;
            uStack_4624 = local_4640;
            local_460c = local_4640;
            uStack_45fc = local_4600;
            uStack_45f8 = local_4600;
            uStack_45f4 = local_4600;
            uStack_45f0 = local_4600;
            uStack_45ec = local_4600;
            uStack_45e8 = local_4600;
            uStack_45e4 = local_4600;
            local_45cc = local_4600;
            uStack_45bc = local_45c0;
            uStack_45b8 = local_45c0;
            uStack_45b4 = local_45c0;
            uStack_45b0 = local_45c0;
            uStack_45ac = local_45c0;
            uStack_45a8 = local_45c0;
            uStack_45a4 = local_45c0;
            local_458c = local_45c0;
            uStack_457c = local_4580;
            uStack_4578 = local_4580;
            uStack_4574 = local_4580;
            uStack_4570 = local_4580;
            uStack_456c = local_4580;
            uStack_4568 = local_4580;
            uStack_4564 = local_4580;
            local_454c = local_4580;
            uStack_453c = local_4540;
            uStack_4538 = local_4540;
            uStack_4534 = local_4540;
            uStack_4530 = local_4540;
            uStack_452c = local_4540;
            uStack_4528 = local_4540;
            uStack_4524 = local_4540;
            local_450c = local_4540;
            uStack_44fc = local_4500;
            uStack_44f8 = local_4500;
            uStack_44f4 = local_4500;
            uStack_44f0 = local_4500;
            uStack_44ec = local_4500;
            uStack_44e8 = local_4500;
            uStack_44e4 = local_4500;
            local_44cc = local_4500;
            uStack_44bc = local_44c0;
            uStack_44b8 = local_44c0;
            uStack_44b4 = local_44c0;
            uStack_44b0 = local_44c0;
            uStack_44ac = local_44c0;
            uStack_44a8 = local_44c0;
            uStack_44a4 = local_44c0;
            local_448c = local_44c0;
            uStack_447c = local_4480;
            uStack_4478 = local_4480;
            uStack_4474 = local_4480;
            uStack_4470 = local_4480;
            uStack_446c = local_4480;
            uStack_4468 = local_4480;
            uStack_4464 = local_4480;
            local_444c = local_4480;
            uStack_443c = local_4440;
            uStack_4438 = local_4440;
            uStack_4434 = local_4440;
            uStack_4430 = local_4440;
            uStack_442c = local_4440;
            uStack_4428 = local_4440;
            uStack_4424 = local_4440;
            local_440c = local_4440;
            uStack_43fc = local_4400;
            uStack_43f8 = local_4400;
            uStack_43f4 = local_4400;
            uStack_43f0 = local_4400;
            uStack_43ec = local_4400;
            uStack_43e8 = local_4400;
            uStack_43e4 = local_4400;
            local_43cc = local_4400;
          }
          local_49b8 = &local_4ba0;
          local_4c = 0x10;
          local_48ec = local_4b54;
          local_48ed = 1;
          local_4ba0 = 0;
          local_4b90 = 0;
          local_4b88 = 0;
          local_4b78 = 0;
          local_4b74 = 0;
          local_4b70 = 0;
          local_4b6c = 0;
          local_4b68 = 0;
          local_4b60 = 0;
          local_4b98 = 0;
          local_4990 = local_49b8;
          local_4b80 = local_d0;
        }
        local_3d00 = local_4b00._0_8_;
        uStack_3cf8 = local_4b00._8_8_;
        uStack_3cf0 = local_4b00._16_8_;
        uStack_3ce8 = local_4b00._24_8_;
        local_3d04 = stride_h;
        local_3d10 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_36c0._0_4_ = local_4b00._0_4_;
        fVar115 = (float)local_36c0;
        local_36c0._4_4_ = local_4b00._4_4_;
        fVar116 = local_36c0._4_4_;
        uStack_36b8._0_4_ = local_4b00._8_4_;
        fVar117 = (float)uStack_36b8;
        uStack_36b8._4_4_ = local_4b00._12_4_;
        fVar118 = uStack_36b8._4_4_;
        uStack_36b0._0_4_ = local_4b00._16_4_;
        fVar119 = (float)uStack_36b0;
        uStack_36b0._4_4_ = local_4b00._20_4_;
        fVar120 = uStack_36b0._4_4_;
        uStack_36a8._0_4_ = local_4b00._24_4_;
        fVar121 = (float)uStack_36a8;
        local_36c0 = uVar109;
        uStack_36b8 = uVar110;
        uStack_36b0 = uVar111;
        uStack_36a8 = uVar112;
        switch(stride_h) {
        case 1:
          local_3c60 = 0;
          uStack_3c58 = 0;
          uStack_3c50 = 0;
          uStack_3c48 = 0;
          local_3be0 = local_4b00._0_8_;
          uStack_3bd8 = local_4b00._8_8_;
          uStack_3bd0 = local_4b00._16_8_;
          uStack_3bc8 = local_4b00._24_8_;
          local_3c00 = 0;
          uStack_3bf8 = 0;
          uStack_3bf0 = 0;
          uStack_3be8 = 0;
          local_3ce0._0_32_ = vmaxps_avx(local_4b00,ZEXT1632(ZEXT816(0)));
          break;
        case 2:
          local_3c70 = 0;
          local_3b24 = *(uint *)*local_3d10;
          local_3b20 = local_4b00._0_8_;
          uStack_3b18 = local_4b00._8_8_;
          uStack_3b10 = local_4b00._16_8_;
          uStack_3b08 = local_4b00._24_8_;
          local_3ae0 = 0;
          uStack_3ad8 = 0;
          uStack_3ad0 = 0;
          uStack_3ac8 = 0;
          local_3aa0 = 0;
          uStack_3a98 = 0;
          uStack_3a90 = 0;
          uStack_3a88 = 0;
          local_3ac0 = local_4b00._0_8_;
          uStack_3ab8 = local_4b00._8_8_;
          uStack_3ab0 = local_4b00._16_8_;
          uStack_3aa8 = local_4b00._24_8_;
          local_3b60 = vmaxps_avx(ZEXT1632(ZEXT816(0)),local_4b00);
          local_3b00 = 0;
          uStack_3af8 = 0;
          uStack_3af0 = 0;
          uStack_3ae8 = 0;
          local_3a40 = 0;
          uStack_3a38 = 0;
          uStack_3a30 = 0;
          uStack_3a28 = 0;
          local_3a60 = local_4b00._0_8_;
          uStack_3a58 = local_4b00._8_8_;
          uStack_3a50 = local_4b00._16_8_;
          uStack_3a48 = local_4b00._24_8_;
          local_3b80 = vminps_avx(ZEXT1632(ZEXT816(0)),local_4b00);
          auVar6 = vinsertps_avx(ZEXT416(local_3b24),ZEXT416(local_3b24),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3b24),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3b24),0x30);
          auVar1 = vinsertps_avx(ZEXT416(local_3b24),ZEXT416(local_3b24),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_3b24),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_3b24),0x30);
          auVar178._16_16_ = auVar6;
          auVar178._0_16_ = auVar1;
          local_34a0._0_8_ = auVar1._0_8_;
          local_34a0._8_8_ = auVar1._8_8_;
          local_34a0._16_8_ = auVar6._0_8_;
          local_34a0._24_8_ = auVar6._8_8_;
          local_3680 = local_34a0._0_8_;
          uVar124 = local_3680;
          uStack_3678 = local_34a0._8_8_;
          uVar125 = uStack_3678;
          uStack_3670 = local_34a0._16_8_;
          uVar126 = uStack_3670;
          uStack_3668 = local_34a0._24_8_;
          uVar127 = uStack_3668;
          local_36a0 = local_3b80._0_8_;
          uVar113 = local_36a0;
          uStack_3698 = local_3b80._8_8_;
          uVar114 = uStack_3698;
          uStack_3690 = local_3b80._16_8_;
          uVar122 = uStack_3690;
          uStack_3688 = local_3b80._24_8_;
          uVar123 = uStack_3688;
          local_3680._0_4_ = auVar1._0_4_;
          local_3680._4_4_ = auVar1._4_4_;
          uStack_3678._0_4_ = auVar1._8_4_;
          uStack_3678._4_4_ = auVar1._12_4_;
          uStack_3670._0_4_ = auVar6._0_4_;
          uStack_3670._4_4_ = auVar6._4_4_;
          uStack_3668._0_4_ = auVar6._8_4_;
          uStack_3668._4_4_ = auVar6._12_4_;
          local_36a0._0_4_ = local_3b80._0_4_;
          local_36a0._4_4_ = local_3b80._4_4_;
          uStack_3698._0_4_ = local_3b80._8_4_;
          uStack_3698._4_4_ = local_3b80._12_4_;
          uStack_3690._0_4_ = local_3b80._16_4_;
          uStack_3690._4_4_ = local_3b80._20_4_;
          uStack_3688._0_4_ = local_3b80._24_4_;
          local_3760 = (float)local_3680 * (float)local_36a0;
          fStack_375c = local_3680._4_4_ * local_36a0._4_4_;
          fStack_3758 = (float)uStack_3678 * (float)uStack_3698;
          fStack_3754 = uStack_3678._4_4_ * uStack_3698._4_4_;
          fStack_3750 = (float)uStack_3670 * (float)uStack_3690;
          fStack_374c = uStack_3670._4_4_ * uStack_3690._4_4_;
          fStack_3748 = (float)uStack_3668 * (float)uStack_3688;
          local_3740 = local_3b60._0_8_;
          uVar109 = local_3740;
          uStack_3738 = local_3b60._8_8_;
          uVar110 = uStack_3738;
          uStack_3730 = local_3b60._16_8_;
          uVar111 = uStack_3730;
          uStack_3728 = local_3b60._24_8_;
          uVar112 = uStack_3728;
          fStack_3744 = uStack_3668._4_4_;
          local_3740._0_4_ = local_3b60._0_4_;
          local_3740._4_4_ = local_3b60._4_4_;
          uStack_3738._0_4_ = local_3b60._8_4_;
          uStack_3738._4_4_ = local_3b60._12_4_;
          uStack_3730._0_4_ = local_3b60._16_4_;
          uStack_3730._4_4_ = local_3b60._20_4_;
          uStack_3728._0_4_ = local_3b60._24_4_;
          uStack_3728._4_4_ = local_3b60._28_4_;
          local_3ce0._4_4_ = local_3740._4_4_ + fStack_375c;
          local_3ce0._0_4_ = (float)local_3740 + local_3760;
          local_3ce0._12_4_ = uStack_3738._4_4_ + fStack_3754;
          local_3ce0._8_4_ = (float)uStack_3738 + fStack_3758;
          local_3ce0._20_4_ = uStack_3730._4_4_ + fStack_374c;
          local_3ce0._16_4_ = (float)uStack_3730 + fStack_3750;
          local_3ce0._28_4_ = uStack_3728._4_4_ + uStack_3668._4_4_;
          local_3ce0._24_4_ = (float)uStack_3728 + fStack_3748;
          local_3c68 = local_3d10;
          local_3a74 = local_3b24;
          local_3740 = uVar109;
          uStack_3738 = uVar110;
          uStack_3730 = uVar111;
          uStack_3728 = uVar112;
          local_36a0 = uVar113;
          uStack_3698 = uVar114;
          uStack_3690 = uVar122;
          uStack_3688 = uVar123;
          local_3680 = uVar124;
          uStack_3678 = uVar125;
          uStack_3670 = uVar126;
          uStack_3668 = uVar127;
          local_34a0 = auVar178;
          local_3480 = local_3b24;
          local_347c = local_3b24;
          local_3478 = local_3b24;
          local_3474 = local_3b24;
          local_3470 = local_3b24;
          local_346c = local_3b24;
          local_3468 = local_3b24;
          local_3464 = local_3b24;
          break;
        case 3:
          local_3c80 = 0;
          local_3a64 = *(uint *)*local_3d10;
          auVar6 = vinsertps_avx(ZEXT416(local_3a64),ZEXT416(local_3a64),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3a64),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3a64),0x30);
          auVar1 = vinsertps_avx(ZEXT416(local_3a64),ZEXT416(local_3a64),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_3a64),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_3a64),0x30);
          auVar179._16_16_ = auVar6;
          auVar179._0_16_ = auVar1;
          local_35a0._0_8_ = auVar1._0_8_;
          local_35a0._8_8_ = auVar1._8_8_;
          local_35a0._16_8_ = auVar6._0_8_;
          local_35a0._24_8_ = auVar6._8_8_;
          local_3d40 = local_35a0._0_8_;
          uStack_3d38 = local_35a0._8_8_;
          uStack_3d30 = local_35a0._16_8_;
          uStack_3d28 = local_35a0._24_8_;
          local_3c90 = 1;
          local_3a68 = *(uint *)(*local_3d10 + 4);
          auVar6 = vinsertps_avx(ZEXT416(local_3a68),ZEXT416(local_3a68),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3a68),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3a68),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_3a68),ZEXT416(local_3a68),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_3a68),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_3a68),0x30);
          auVar180._16_16_ = auVar6;
          auVar180._0_16_ = auVar2;
          local_3560._0_8_ = auVar2._0_8_;
          local_3560._8_8_ = auVar2._8_8_;
          local_3560._16_8_ = auVar6._0_8_;
          local_3560._24_8_ = auVar6._8_8_;
          local_3d60 = local_3560._0_8_;
          uStack_3d58 = local_3560._8_8_;
          uStack_3d50 = local_3560._16_8_;
          uStack_3d48 = local_3560._24_8_;
          local_3ba0 = local_4b00._0_8_;
          uStack_3b98 = local_4b00._8_8_;
          uStack_3b90 = local_4b00._16_8_;
          uStack_3b88 = local_4b00._24_8_;
          local_3bc0 = local_35a0._0_8_;
          uStack_3bb8 = local_35a0._8_8_;
          uStack_3bb0 = local_35a0._16_8_;
          uStack_3ba8 = local_35a0._24_8_;
          auVar21._16_8_ = local_35a0._16_8_;
          auVar21._0_16_ = auVar1;
          auVar21._24_8_ = local_35a0._24_8_;
          local_3a00 = vmaxps_avx(local_4b00,auVar21);
          local_3a20 = local_3560._0_8_;
          uStack_3a18 = local_3560._8_8_;
          uStack_3a10 = local_3560._16_8_;
          uStack_3a08 = local_3560._24_8_;
          auVar22._16_8_ = local_3560._16_8_;
          auVar22._0_16_ = auVar2;
          auVar22._24_8_ = local_3560._24_8_;
          local_3ce0._0_32_ = vminps_avx(local_3a00,auVar22);
          local_3c88 = local_3d10;
          local_3c78 = local_3d10;
          local_35a0 = auVar179;
          local_3580 = local_3a64;
          local_357c = local_3a64;
          local_3578 = local_3a64;
          local_3574 = local_3a64;
          local_3570 = local_3a64;
          local_356c = local_3a64;
          local_3568 = local_3a64;
          local_3564 = local_3a64;
          local_3560 = auVar180;
          local_3540 = local_3a68;
          local_353c = local_3a68;
          local_3538 = local_3a68;
          local_3534 = local_3a68;
          local_3530 = local_3a68;
          local_352c = local_3a68;
          local_3528 = local_3a68;
          local_3524 = local_3a68;
          break;
        case 4:
          local_39c0 = local_4b00._0_8_;
          uStack_39b8 = local_4b00._8_8_;
          uStack_39b0 = local_4b00._16_8_;
          uStack_39a8 = local_4b00._24_8_;
          local_3964 = 0x3f800000;
          local_35a4 = 0x3f800000;
          local_35a8 = 0x3f800000;
          local_35ac = 0x3f800000;
          local_35b0 = 0x3f800000;
          local_35b4 = 0x3f800000;
          local_35b8 = 0x3f800000;
          local_35bc = 0x3f800000;
          local_35c0 = 0x3f800000;
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          local_35e0 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auStack_35d0 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          local_39e0 = local_35e0._0_8_;
          uStack_39d8 = local_35e0._8_8_;
          uStack_39d0 = auStack_35d0._0_8_;
          uStack_39c8 = auStack_35d0._8_8_;
          local_39a0 = 0;
          uStack_3998 = 0;
          uStack_3990 = 0;
          uStack_3988 = 0;
          local_2ec0 = 0;
          uStack_2eb8 = 0;
          uStack_2eb0 = 0;
          uStack_2ea8 = 0;
          local_2ee0 = local_4b00._0_8_;
          uStack_2ed8 = local_4b00._8_8_;
          uStack_2ed0 = local_4b00._16_8_;
          uStack_2ec8 = local_4b00._24_8_;
          auVar4 = vsubps_avx(ZEXT1632(ZEXT816(0)),local_4b00);
          local_30c0 = 0;
          uStack_30b8 = 0;
          uStack_30b0 = 0;
          uStack_30a8 = 0;
          local_3160 = 0x3f800000;
          uStack_315c = 0x3f800000;
          uStack_3158 = 0x3f800000;
          uStack_3154 = 0x3f800000;
          uStack_3150 = 0x3f800000;
          uStack_314c = 0x3f800000;
          uStack_3148 = 0x3f800000;
          uStack_3144 = 0x3f800000;
          local_30e0._0_8_ = auVar4._0_8_;
          local_30e0._8_8_ = auVar4._8_8_;
          local_30e0._16_8_ = auVar4._16_8_;
          local_30e0._24_8_ = auVar4._24_8_;
          local_3040 = local_30e0._0_8_;
          uStack_3038 = local_30e0._8_8_;
          uStack_3030 = local_30e0._16_8_;
          uStack_3028 = local_30e0._24_8_;
          local_3060 = 0x42b0c0a5;
          uStack_305c = 0x42b0c0a5;
          uStack_3058 = 0x42b0c0a5;
          uStack_3054 = 0x42b0c0a5;
          uStack_3050 = 0x42b0c0a5;
          uStack_304c = 0x42b0c0a5;
          uStack_3048 = 0x42b0c0a5;
          uStack_3044 = 0x42b0c0a5;
          auVar29._8_4_ = 0x42b0c0a5;
          auVar29._0_8_ = 0x42b0c0a542b0c0a5;
          auVar29._12_4_ = 0x42b0c0a5;
          auVar29._16_4_ = 0x42b0c0a5;
          auVar29._20_4_ = 0x42b0c0a5;
          auVar29._24_4_ = 0x42b0c0a5;
          auVar29._28_4_ = 0x42b0c0a5;
          auVar4 = vminps_avx(auVar4,auVar29);
          local_30e0._0_8_ = auVar4._0_8_;
          local_30e0._8_8_ = auVar4._8_8_;
          local_30e0._16_8_ = auVar4._16_8_;
          local_30e0._24_8_ = auVar4._24_8_;
          local_3080 = local_30e0._0_8_;
          uStack_3078 = local_30e0._8_8_;
          uStack_3070 = local_30e0._16_8_;
          uStack_3068 = local_30e0._24_8_;
          local_30a0 = 0xc2b0c0a5;
          uStack_309c = 0xc2b0c0a5;
          uStack_3098 = 0xc2b0c0a5;
          uStack_3094 = 0xc2b0c0a5;
          uStack_3090 = 0xc2b0c0a5;
          uStack_308c = 0xc2b0c0a5;
          uStack_3088 = 0xc2b0c0a5;
          uStack_3084 = 0xc2b0c0a5;
          auVar28._8_4_ = 0xc2b0c0a5;
          auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar28._12_4_ = 0xc2b0c0a5;
          auVar28._16_4_ = 0xc2b0c0a5;
          auVar28._20_4_ = 0xc2b0c0a5;
          auVar28._24_4_ = 0xc2b0c0a5;
          auVar28._28_4_ = 0xc2b0c0a5;
          auVar3 = vmaxps_avx(auVar4,auVar28);
          local_30e0._0_8_ = auVar3._0_8_;
          local_30e0._8_8_ = auVar3._8_8_;
          local_30e0._16_8_ = auVar3._16_8_;
          local_30e0._24_8_ = auVar3._24_8_;
          local_29e0 = local_30e0._0_8_;
          uStack_29d8 = local_30e0._8_8_;
          uStack_29d0 = local_30e0._16_8_;
          uStack_29c8 = local_30e0._24_8_;
          local_2a00 = 0x3fb8aa3b;
          uStack_29fc = 0x3fb8aa3b;
          uStack_29f8 = 0x3fb8aa3b;
          uStack_29f4 = 0x3fb8aa3b;
          uStack_29f0 = 0x3fb8aa3b;
          uStack_29ec = 0x3fb8aa3b;
          uStack_29e8 = 0x3fb8aa3b;
          uStack_29e4 = 0x3fb8aa3b;
          local_2a20 = 0x3f000000;
          uStack_2a1c = 0x3f000000;
          uStack_2a18 = 0x3f000000;
          uStack_2a14 = 0x3f000000;
          uStack_2a10 = 0x3f000000;
          uStack_2a0c = 0x3f000000;
          uStack_2a08 = 0x3f000000;
          uStack_2a04 = 0x3f000000;
          local_29a0 = 0x3fb8aa3b3fb8aa3b;
          uStack_2998 = 0x3fb8aa3b3fb8aa3b;
          uStack_2990 = 0x3fb8aa3b3fb8aa3b;
          uStack_2988 = 0x3fb8aa3b3fb8aa3b;
          local_29c0 = 0x3f0000003f000000;
          uStack_29b8 = 0x3f0000003f000000;
          uStack_29b0 = 0x3f0000003f000000;
          uStack_29a8 = 0x3f0000003f000000;
          local_2980 = local_30e0._0_8_;
          uStack_2978 = local_30e0._8_8_;
          uStack_2970 = local_30e0._16_8_;
          uStack_2968 = local_30e0._24_8_;
          auVar37._8_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar37._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar37._16_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar37._24_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar36._8_8_ = 0x3f0000003f000000;
          auVar36._0_8_ = 0x3f0000003f000000;
          auVar36._16_8_ = 0x3f0000003f000000;
          auVar36._24_8_ = 0x3f0000003f000000;
          auVar6 = vfmadd213ps_fma(auVar37,auVar3,auVar36);
          auVar5 = vroundps_avx(ZEXT1632(auVar6),1);
          auVar4 = vcmpps_avx(ZEXT1632(auVar6),auVar5,1);
          local_3180._0_8_ = auVar4._0_8_;
          local_3180._8_8_ = auVar4._8_8_;
          local_3180._16_8_ = auVar4._16_8_;
          local_3180._24_8_ = auVar4._24_8_;
          local_2360 = 0x3f8000003f800000;
          uStack_2358 = 0x3f8000003f800000;
          uStack_2350 = 0x3f8000003f800000;
          uStack_2348 = 0x3f8000003f800000;
          local_2340 = local_3180._0_8_;
          uStack_2338 = local_3180._8_8_;
          uStack_2330 = local_3180._16_8_;
          uStack_2328 = local_3180._24_8_;
          auVar48._8_8_ = 0x3f8000003f800000;
          auVar48._0_8_ = 0x3f8000003f800000;
          auVar48._16_8_ = 0x3f8000003f800000;
          auVar48._24_8_ = 0x3f8000003f800000;
          local_3180 = vpand_avx2(auVar4,auVar48);
          local_3100 = auVar5._0_8_;
          uStack_30f8 = auVar5._8_8_;
          uStack_30f0 = auVar5._16_8_;
          uStack_30e8 = auVar5._24_8_;
          local_2f40 = local_3100;
          uStack_2f38 = uStack_30f8;
          uStack_2f30 = uStack_30f0;
          uStack_2f28 = uStack_30e8;
          local_2f60 = local_3180._0_8_;
          uStack_2f58 = local_3180._8_8_;
          uStack_2f50 = local_3180._16_8_;
          uStack_2f48 = local_3180._24_8_;
          local_3120 = vsubps_avx(auVar5,local_3180);
          local_2240 = local_3120._0_8_;
          uStack_2238 = local_3120._8_8_;
          uStack_2230 = local_3120._16_8_;
          uStack_2228 = local_3120._24_8_;
          local_2260 = 0x3f318000;
          uStack_225c = 0x3f318000;
          uStack_2258 = 0x3f318000;
          uStack_2254 = 0x3f318000;
          uStack_2250 = 0x3f318000;
          uStack_224c = 0x3f318000;
          uStack_2248 = 0x3f318000;
          uStack_2244 = 0x3f318000;
          local_2280 = local_30e0._0_8_;
          uStack_2278 = local_30e0._8_8_;
          uStack_2270 = local_30e0._16_8_;
          uStack_2268 = local_30e0._24_8_;
          local_1f00 = 0x3f3180003f318000;
          uStack_1ef8 = 0x3f3180003f318000;
          uStack_1ef0 = 0x3f3180003f318000;
          uStack_1ee8 = 0x3f3180003f318000;
          local_1ee0 = local_3120._0_8_;
          uStack_1ed8 = local_3120._8_8_;
          uStack_1ed0 = local_3120._16_8_;
          uStack_1ec8 = local_3120._24_8_;
          local_1f20 = local_30e0._0_8_;
          uStack_1f18 = local_30e0._8_8_;
          uStack_1f10 = local_30e0._16_8_;
          uStack_1f08 = local_30e0._24_8_;
          auVar184._8_4_ = 0x80000000;
          auVar184._0_8_ = 0x8000000080000000;
          auVar184._12_4_ = 0x80000000;
          auVar184._16_4_ = 0x80000000;
          auVar184._20_4_ = 0x80000000;
          auVar184._24_4_ = 0x80000000;
          auVar184._28_4_ = 0x80000000;
          auVar52._8_8_ = 0x3f3180003f318000;
          auVar52._0_8_ = 0x3f3180003f318000;
          auVar52._16_8_ = 0x3f3180003f318000;
          auVar52._24_8_ = 0x3f3180003f318000;
          auVar6 = vfmadd213ps_fma(auVar52,local_3120 ^ auVar184,auVar3);
          local_51a0 = auVar6._0_8_;
          uStack_5198 = auVar6._8_8_;
          local_22a0 = local_3120._0_8_;
          uStack_2298 = local_3120._8_8_;
          uStack_2290 = local_3120._16_8_;
          uStack_2288 = local_3120._24_8_;
          local_22c0 = 0xb95e8083;
          uStack_22bc = 0xb95e8083;
          uStack_22b8 = 0xb95e8083;
          uStack_22b4 = 0xb95e8083;
          uStack_22b0 = 0xb95e8083;
          uStack_22ac = 0xb95e8083;
          uStack_22a8 = 0xb95e8083;
          uStack_22a4 = 0xb95e8083;
          local_22e0 = local_51a0;
          uStack_22d8 = uStack_5198;
          uStack_22d0 = 0;
          uStack_22c8 = 0;
          local_1ea0 = 0xb95e8083b95e8083;
          uStack_1e98 = 0xb95e8083b95e8083;
          uStack_1e90 = 0xb95e8083b95e8083;
          uStack_1e88 = 0xb95e8083b95e8083;
          local_1e80 = local_3120._0_8_;
          uStack_1e78 = local_3120._8_8_;
          uStack_1e70 = local_3120._16_8_;
          uStack_1e68 = local_3120._24_8_;
          local_1ec0 = local_51a0;
          uStack_1eb8 = uStack_5198;
          uStack_1eb0 = 0;
          uStack_1ea8 = 0;
          auVar185._8_4_ = 0x80000000;
          auVar185._0_8_ = 0x8000000080000000;
          auVar185._12_4_ = 0x80000000;
          auVar185._16_4_ = 0x80000000;
          auVar185._20_4_ = 0x80000000;
          auVar185._24_4_ = 0x80000000;
          auVar185._28_4_ = 0x80000000;
          auVar53._8_8_ = 0xb95e8083b95e8083;
          auVar53._0_8_ = 0xb95e8083b95e8083;
          auVar53._16_8_ = 0xb95e8083b95e8083;
          auVar53._24_8_ = 0xb95e8083b95e8083;
          auVar6 = vfmadd213ps_fma(auVar53,local_3120 ^ auVar185,ZEXT1632(auVar6));
          local_5220 = auVar6._0_8_;
          uStack_5218 = auVar6._8_8_;
          local_30e0 = ZEXT1632(auVar6);
          local_2f80 = local_5220;
          uVar126 = local_2f80;
          uStack_2f78 = uStack_5218;
          uVar127 = uStack_2f78;
          uStack_2f70 = 0;
          uStack_2f68 = 0;
          local_2fa0 = local_5220;
          uStack_2f98 = uStack_5218;
          uStack_2f90 = 0;
          uStack_2f88 = 0;
          local_2f80._0_4_ = auVar6._0_4_;
          local_2f80._4_4_ = auVar6._4_4_;
          uStack_2f78._0_4_ = auVar6._8_4_;
          uStack_2f78._4_4_ = auVar6._12_4_;
          local_3100._4_4_ = local_2f80._4_4_ * local_2f80._4_4_;
          local_3100._0_4_ = (float)local_2f80 * (float)local_2f80;
          local_2e80 = local_3100;
          uStack_30f8._0_4_ = (float)uStack_2f78 * (float)uStack_2f78;
          uStack_30f8._4_4_ = uStack_2f78._4_4_ * uStack_2f78._4_4_;
          auVar2 = _local_3100;
          _local_3100 = ZEXT1632(_local_3100);
          auVar5 = _local_3100;
          uStack_3198._0_4_ = 0x39506967;
          local_31a0 = (undefined1  [8])0x3950696739506967;
          uStack_3198._4_4_ = 0x39506967;
          uStack_3190._0_4_ = 0x39506967;
          uStack_3190._4_4_ = 0x39506967;
          auVar128 = _local_31a0;
          uStack_3188._0_4_ = 0x39506967;
          uStack_3188._4_4_ = 0x39506967;
          auVar4 = _local_31a0;
          uStack_3190 = auVar128._16_8_;
          uStack_3188 = auVar4._24_8_;
          local_2aa0 = 0x3950696739506967;
          uStack_2a98 = uStack_3198;
          uStack_2a90 = uStack_3190;
          uStack_2a88 = uStack_3188;
          local_2ac0 = local_5220;
          uStack_2ab8 = uStack_5218;
          uStack_2ab0 = 0;
          uStack_2aa8 = 0;
          local_2ae0 = 0x3ab743ce;
          uStack_2adc = 0x3ab743ce;
          uStack_2ad8 = 0x3ab743ce;
          uStack_2ad4 = 0x3ab743ce;
          uStack_2ad0 = 0x3ab743ce;
          uStack_2acc = 0x3ab743ce;
          uStack_2ac8 = 0x3ab743ce;
          uStack_2ac4 = 0x3ab743ce;
          local_2a80 = 0x3ab743ce3ab743ce;
          uStack_2a78 = 0x3ab743ce3ab743ce;
          uStack_2a70 = 0x3ab743ce3ab743ce;
          uStack_2a68 = 0x3ab743ce3ab743ce;
          local_2a40 = 0x3950696739506967;
          uStack_2a38 = uStack_3198;
          uStack_2a30 = uStack_3190;
          uStack_2a28 = uStack_3188;
          local_2a60 = local_5220;
          uStack_2a58 = uStack_5218;
          uStack_2a50 = 0;
          uStack_2a48 = 0;
          auVar35._16_8_ = uStack_3190;
          auVar35._0_16_ = _local_31a0;
          auVar35._24_8_ = uStack_3188;
          auVar34._8_8_ = 0x3ab743ce3ab743ce;
          auVar34._0_8_ = 0x3ab743ce3ab743ce;
          auVar34._16_8_ = 0x3ab743ce3ab743ce;
          auVar34._24_8_ = 0x3ab743ce3ab743ce;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar35,auVar34);
          local_31a0 = auVar1._0_8_;
          uStack_3198 = auVar1._8_8_;
          local_2b60 = local_31a0;
          uStack_2b58 = uStack_3198;
          uStack_2b50 = 0;
          uStack_2b48 = 0;
          local_2b80 = local_5220;
          uStack_2b78 = uStack_5218;
          uStack_2b70 = 0;
          uStack_2b68 = 0;
          local_2ba0 = 0x3c088908;
          uStack_2b9c = 0x3c088908;
          uStack_2b98 = 0x3c088908;
          uStack_2b94 = 0x3c088908;
          uStack_2b90 = 0x3c088908;
          uStack_2b8c = 0x3c088908;
          uStack_2b88 = 0x3c088908;
          uStack_2b84 = 0x3c088908;
          local_2b40 = 0x3c0889083c088908;
          uStack_2b38 = 0x3c0889083c088908;
          uStack_2b30 = 0x3c0889083c088908;
          uStack_2b28 = 0x3c0889083c088908;
          local_2b00 = local_31a0;
          uStack_2af8 = uStack_3198;
          uStack_2af0 = 0;
          uStack_2ae8 = 0;
          local_2b20 = local_5220;
          uStack_2b18 = uStack_5218;
          uStack_2b10 = 0;
          uStack_2b08 = 0;
          auVar33._8_8_ = 0x3c0889083c088908;
          auVar33._0_8_ = 0x3c0889083c088908;
          auVar33._16_8_ = 0x3c0889083c088908;
          auVar33._24_8_ = 0x3c0889083c088908;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar33);
          local_31a0 = auVar1._0_8_;
          uStack_3198 = auVar1._8_8_;
          local_2c20 = local_31a0;
          uStack_2c18 = uStack_3198;
          uStack_2c10 = 0;
          uStack_2c08 = 0;
          local_2c40 = local_5220;
          uStack_2c38 = uStack_5218;
          uStack_2c30 = 0;
          uStack_2c28 = 0;
          local_2c60 = 0x3d2aa9c1;
          uStack_2c5c = 0x3d2aa9c1;
          uStack_2c58 = 0x3d2aa9c1;
          uStack_2c54 = 0x3d2aa9c1;
          uStack_2c50 = 0x3d2aa9c1;
          uStack_2c4c = 0x3d2aa9c1;
          uStack_2c48 = 0x3d2aa9c1;
          uStack_2c44 = 0x3d2aa9c1;
          local_2c00 = 0x3d2aa9c13d2aa9c1;
          uStack_2bf8 = 0x3d2aa9c13d2aa9c1;
          uStack_2bf0 = 0x3d2aa9c13d2aa9c1;
          uStack_2be8 = 0x3d2aa9c13d2aa9c1;
          local_2bc0 = local_31a0;
          uStack_2bb8 = uStack_3198;
          uStack_2bb0 = 0;
          uStack_2ba8 = 0;
          local_2be0 = local_5220;
          uStack_2bd8 = uStack_5218;
          uStack_2bd0 = 0;
          uStack_2bc8 = 0;
          auVar32._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar32._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar32._16_8_ = 0x3d2aa9c13d2aa9c1;
          auVar32._24_8_ = 0x3d2aa9c13d2aa9c1;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar32);
          local_31a0 = auVar1._0_8_;
          uStack_3198 = auVar1._8_8_;
          local_2ce0 = local_31a0;
          uStack_2cd8 = uStack_3198;
          uStack_2cd0 = 0;
          uStack_2cc8 = 0;
          local_2d00 = local_5220;
          uStack_2cf8 = uStack_5218;
          uStack_2cf0 = 0;
          uStack_2ce8 = 0;
          local_2d20 = 0x3e2aaaaa;
          uStack_2d1c = 0x3e2aaaaa;
          uStack_2d18 = 0x3e2aaaaa;
          uStack_2d14 = 0x3e2aaaaa;
          uStack_2d10 = 0x3e2aaaaa;
          uStack_2d0c = 0x3e2aaaaa;
          uStack_2d08 = 0x3e2aaaaa;
          uStack_2d04 = 0x3e2aaaaa;
          local_2cc0 = 0x3e2aaaaa3e2aaaaa;
          uStack_2cb8 = 0x3e2aaaaa3e2aaaaa;
          uStack_2cb0 = 0x3e2aaaaa3e2aaaaa;
          uStack_2ca8 = 0x3e2aaaaa3e2aaaaa;
          local_2c80 = local_31a0;
          uStack_2c78 = uStack_3198;
          uStack_2c70 = 0;
          uStack_2c68 = 0;
          local_2ca0 = local_5220;
          uStack_2c98 = uStack_5218;
          uStack_2c90 = 0;
          uStack_2c88 = 0;
          auVar31._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar31._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar31._16_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar31._24_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar31);
          local_31a0 = auVar1._0_8_;
          uStack_3198 = auVar1._8_8_;
          local_2da0 = local_31a0;
          uStack_2d98 = uStack_3198;
          uStack_2d90 = 0;
          uStack_2d88 = 0;
          local_2dc0 = local_5220;
          uStack_2db8 = uStack_5218;
          uStack_2db0 = 0;
          uStack_2da8 = 0;
          local_2de0 = 0x3f000000;
          uStack_2ddc = 0x3f000000;
          uStack_2dd8 = 0x3f000000;
          uStack_2dd4 = 0x3f000000;
          uStack_2dd0 = 0x3f000000;
          uStack_2dcc = 0x3f000000;
          uStack_2dc8 = 0x3f000000;
          uStack_2dc4 = 0x3f000000;
          local_2d80 = 0x3f0000003f000000;
          uStack_2d78 = 0x3f0000003f000000;
          uStack_2d70 = 0x3f0000003f000000;
          uStack_2d68 = 0x3f0000003f000000;
          local_2d40 = local_31a0;
          uStack_2d38 = uStack_3198;
          uStack_2d30 = 0;
          uStack_2d28 = 0;
          local_2d60 = local_5220;
          uStack_2d58 = uStack_5218;
          uStack_2d50 = 0;
          uStack_2d48 = 0;
          auVar30._8_8_ = 0x3f0000003f000000;
          auVar30._0_8_ = 0x3f0000003f000000;
          auVar30._16_8_ = 0x3f0000003f000000;
          auVar30._24_8_ = 0x3f0000003f000000;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar30);
          local_31a0 = auVar1._0_8_;
          uStack_3198 = auVar1._8_8_;
          uStack_30f8 = auVar2._8_8_;
          local_2e60 = local_31a0;
          uStack_2e58 = uStack_3198;
          uStack_2e50 = 0;
          uStack_2e48 = 0;
          uStack_2e78 = uStack_30f8;
          uStack_2e70 = 0;
          uStack_2e68 = 0;
          local_2ea0 = local_5220;
          uStack_2e98 = uStack_5218;
          uStack_2e90 = 0;
          uStack_2e88 = 0;
          local_2e00 = local_31a0;
          uStack_2df8 = uStack_3198;
          uStack_2df0 = 0;
          uStack_2de8 = 0;
          local_2e20 = local_2e80;
          uStack_2e18 = uStack_30f8;
          uStack_2e10 = 0;
          uStack_2e08 = 0;
          local_2e40 = local_5220;
          uStack_2e38 = uStack_5218;
          uStack_2e30 = 0;
          uStack_2e28 = 0;
          auVar6 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar1),ZEXT1632(auVar6));
          local_31a0 = auVar6._0_8_;
          uStack_3198 = auVar6._8_8_;
          local_3020 = 0x3f8000003f800000;
          uStack_3018 = 0x3f8000003f800000;
          uStack_3010 = 0x3f8000003f800000;
          uStack_3008 = 0x3f8000003f800000;
          local_3000 = local_31a0;
          uVar113 = local_3000;
          uStack_2ff8 = uStack_3198;
          uVar114 = uStack_2ff8;
          uStack_2ff0 = 0;
          uStack_2fe8 = 0;
          local_3000._0_4_ = auVar6._0_4_;
          local_3000._4_4_ = auVar6._4_4_;
          uStack_2ff8._0_4_ = auVar6._8_4_;
          uStack_2ff8._4_4_ = auVar6._12_4_;
          local_31a0._4_4_ = local_3000._4_4_ + 1.0;
          local_31a0._0_4_ = (float)local_3000 + 1.0;
          uStack_3198._0_4_ = (float)uStack_2ff8 + 1.0;
          uStack_3198._4_4_ = uStack_2ff8._4_4_ + 1.0;
          uStack_3190._0_4_ = 0x3f800000;
          uStack_3190._4_4_ = 0x3f800000;
          auVar128 = _local_31a0;
          uStack_3188._0_4_ = 0x3f800000;
          uStack_3188._4_4_ = 0x3f800000;
          auVar3 = _local_31a0;
          local_2160 = local_3120._0_8_;
          uVar129 = local_2160;
          uStack_2158 = local_3120._8_8_;
          uVar130 = uStack_2158;
          uStack_2150 = local_3120._16_8_;
          uVar131 = uStack_2150;
          uStack_2148 = local_3120._24_8_;
          uVar132 = uStack_2148;
          local_2160._0_4_ = local_3120._0_4_;
          local_2160._4_4_ = local_3120._4_4_;
          uStack_2158._0_4_ = local_3120._8_4_;
          uStack_2158._4_4_ = local_3120._12_4_;
          uStack_2150._0_4_ = local_3120._16_4_;
          uStack_2150._4_4_ = local_3120._20_4_;
          uStack_2148._0_4_ = local_3120._24_4_;
          uStack_2148._4_4_ = local_3120._28_4_;
          local_3140 = CONCAT44((int)local_2160._4_4_,(int)(float)local_2160);
          uStack_3138 = CONCAT44((int)uStack_2158._4_4_,(int)(float)uStack_2158);
          uStack_3130 = CONCAT44((int)uStack_2150._4_4_,(int)(float)uStack_2150);
          uStack_3128 = CONCAT44((int)uStack_2148._4_4_,(int)(float)uStack_2148);
          local_2100 = local_3140;
          uStack_20f8 = uStack_3138;
          uStack_20f0 = uStack_3130;
          uStack_20e8 = uStack_3128;
          local_2120 = 0x7f0000007f;
          uStack_2118 = 0x7f0000007f;
          uStack_2110 = 0x7f0000007f;
          uStack_2108 = 0x7f0000007f;
          local_1e00 = local_3140;
          uStack_1df8 = uStack_3138;
          uStack_1df0 = uStack_3130;
          uStack_1de8 = uStack_3128;
          local_1e20 = 0x7f0000007f;
          uStack_1e18 = 0x7f0000007f;
          uStack_1e10 = 0x7f0000007f;
          uStack_1e08 = 0x7f0000007f;
          auVar57._8_8_ = uStack_3138;
          auVar57._0_8_ = local_3140;
          auVar57._16_8_ = uStack_3130;
          auVar57._24_8_ = uStack_3128;
          auVar56._8_8_ = 0x7f0000007f;
          auVar56._0_8_ = 0x7f0000007f;
          auVar56._16_8_ = 0x7f0000007f;
          auVar56._24_8_ = 0x7f0000007f;
          auVar4 = vpaddd_avx2(auVar57,auVar56);
          local_5240 = auVar4._0_8_;
          uStack_5238 = auVar4._8_8_;
          uStack_5230 = auVar4._16_8_;
          uStack_5228 = auVar4._24_8_;
          local_2080 = local_5240;
          uStack_2078 = uStack_5238;
          uStack_2070 = uStack_5230;
          uStack_2068 = uStack_5228;
          local_2084 = 0x17;
          local_1d80 = local_5240;
          uStack_1d78 = uStack_5238;
          uStack_1d70 = uStack_5230;
          uStack_1d68 = uStack_5228;
          local_1d84 = 0x17;
          auVar4 = vpslld_avx2(auVar4,ZEXT416(0x17));
          local_5260 = auVar4._0_8_;
          uStack_5258 = auVar4._8_8_;
          uStack_5250 = auVar4._16_8_;
          uStack_5248 = auVar4._24_8_;
          local_3140 = local_5260;
          uStack_3138 = uStack_5258;
          uStack_3130 = uStack_5250;
          uStack_3128 = uStack_5248;
          local_2020 = local_5260;
          uStack_2018 = uStack_5258;
          uStack_2010 = uStack_5250;
          uStack_2008 = uStack_5248;
          local_31c0 = local_5260;
          uStack_31b8 = uStack_5258;
          uStack_31b0 = uStack_5250;
          uStack_31a8 = uStack_5248;
          uStack_3190 = auVar128._16_8_;
          uStack_3188 = auVar3._24_8_;
          local_2fc0 = local_31a0;
          uStack_2fb8 = uStack_3198;
          uStack_2fb0 = uStack_3190;
          uStack_2fa8 = uStack_3188;
          local_2fe0 = local_5260;
          uVar122 = local_2fe0;
          uStack_2fd8 = uStack_5258;
          uVar123 = uStack_2fd8;
          uStack_2fd0 = uStack_5250;
          uVar124 = uStack_2fd0;
          uStack_2fc8 = uStack_5248;
          uVar125 = uStack_2fc8;
          local_2fe0._0_4_ = auVar4._0_4_;
          local_2fe0._4_4_ = auVar4._4_4_;
          uStack_2fd8._0_4_ = auVar4._8_4_;
          uStack_2fd8._4_4_ = auVar4._12_4_;
          uStack_2fd0._0_4_ = auVar4._16_4_;
          uStack_2fd0._4_4_ = auVar4._20_4_;
          uStack_2fc8._0_4_ = auVar4._24_4_;
          local_31a0._0_4_ = ((float)local_3000 + 1.0) * (float)local_2fe0;
          local_31a0._4_4_ = (local_3000._4_4_ + 1.0) * local_2fe0._4_4_;
          uStack_2fd8._0_4_ = ((float)uStack_2ff8 + 1.0) * (float)uStack_2fd8;
          uStack_2fd8._4_4_ = (uStack_2ff8._4_4_ + 1.0) * uStack_2fd8._4_4_;
          uStack_3198._0_4_ = (float)uStack_2fd8;
          uStack_3198._4_4_ = uStack_2fd8._4_4_;
          uStack_3190._0_4_ = (float)uStack_2fd0 * 1.0;
          uStack_3190._4_4_ = uStack_2fd0._4_4_ * 1.0;
          auVar128 = _local_31a0;
          uStack_3188._0_4_ = (float)uStack_2fc8 * 1.0;
          uStack_3188._4_4_ = 0x3f800000;
          auVar4 = _local_31a0;
          uStack_3190 = auVar128._16_8_;
          uStack_3188 = auVar4._24_8_;
          local_3780 = local_35e0._0_8_;
          uVar109 = local_3780;
          uStack_3778 = local_35e0._8_8_;
          uVar110 = uStack_3778;
          uStack_3770 = auStack_35d0._0_8_;
          uVar111 = uStack_3770;
          uStack_3768 = auStack_35d0._8_8_;
          uVar112 = uStack_3768;
          local_37a0 = local_31a0;
          uStack_3798 = uStack_3198;
          uStack_3790 = uStack_3190;
          uStack_3788 = uStack_3188;
          local_3780._0_4_ = local_35e0._0_4_;
          local_3780._4_4_ = local_35e0._4_4_;
          uStack_3778._0_4_ = local_35e0._8_4_;
          uStack_3778._4_4_ = local_35e0._12_4_;
          uStack_3770._0_4_ = auStack_35d0._0_4_;
          uStack_3770._4_4_ = auStack_35d0._4_4_;
          uStack_3768._0_4_ = auStack_35d0._8_4_;
          uStack_3768._4_4_ = auStack_35d0._12_4_;
          local_3460 = (float)local_3780 + (float)local_31a0._0_4_;
          fStack_345c = local_3780._4_4_ + (float)local_31a0._4_4_;
          fStack_3458 = (float)uStack_3778 + (float)uStack_2fd8;
          fStack_3454 = uStack_3778._4_4_ + uStack_2fd8._4_4_;
          fStack_3450 = (float)uStack_3770 + (float)uStack_2fd0 * 1.0;
          fStack_344c = uStack_3770._4_4_ + uStack_2fd0._4_4_ * 1.0;
          fStack_3448 = (float)uStack_3768 + (float)uStack_2fc8 * 1.0;
          fStack_3444 = uStack_3768._4_4_ + 1.0;
          local_3440 = local_35e0._0_8_;
          uStack_3438 = local_35e0._8_8_;
          uStack_3430 = auStack_35d0._0_8_;
          uStack_3428 = auStack_35d0._8_8_;
          auVar25._16_8_ = auStack_35d0._0_8_;
          auVar25._0_16_ = local_35e0;
          auVar25._24_8_ = auStack_35d0._8_8_;
          auVar24._4_4_ = fStack_345c;
          auVar24._0_4_ = local_3460;
          auVar24._8_4_ = fStack_3458;
          auVar24._12_4_ = fStack_3454;
          auVar24._16_4_ = fStack_3450;
          auVar24._20_4_ = fStack_344c;
          auVar24._24_4_ = fStack_3448;
          auVar24._28_4_ = fStack_3444;
          local_3ce0._0_32_ = vdivps_avx(auVar25,auVar24);
          local_3780 = uVar109;
          uStack_3778 = uVar110;
          uStack_3770 = uVar111;
          uStack_3768 = uVar112;
          _local_31a0 = auVar4;
          _local_3100 = auVar5;
          local_3000 = uVar113;
          uStack_2ff8 = uVar114;
          local_2fe0 = uVar122;
          uStack_2fd8 = uVar123;
          uStack_2fd0 = uVar124;
          uStack_2fc8 = uVar125;
          local_2f80 = uVar126;
          uStack_2f78 = uVar127;
          local_2160 = uVar129;
          uStack_2158 = uVar130;
          uStack_2150 = uVar131;
          uStack_2148 = uVar132;
          break;
        case 5:
          local_3960 = local_4b00._0_8_;
          uStack_3958 = local_4b00._8_8_;
          uStack_3950 = local_4b00._16_8_;
          uStack_3948 = local_4b00._24_8_;
          local_3320 = 0;
          uStack_3318 = 0;
          uStack_3310 = 0;
          uStack_3308 = 0;
          local_33c0 = 0x3f800000;
          uStack_33bc = 0x3f800000;
          uStack_33b8 = 0x3f800000;
          uStack_33b4 = 0x3f800000;
          uStack_33b0 = 0x3f800000;
          uStack_33ac = 0x3f800000;
          uStack_33a8 = 0x3f800000;
          uStack_33a4 = 0x3f800000;
          local_32a0 = local_4b00._0_8_;
          uStack_3298 = local_4b00._8_8_;
          uStack_3290 = local_4b00._16_8_;
          uStack_3288 = local_4b00._24_8_;
          local_32c0 = 0x42b0c0a5;
          uStack_32bc = 0x42b0c0a5;
          uStack_32b8 = 0x42b0c0a5;
          uStack_32b4 = 0x42b0c0a5;
          uStack_32b0 = 0x42b0c0a5;
          uStack_32ac = 0x42b0c0a5;
          uStack_32a8 = 0x42b0c0a5;
          uStack_32a4 = 0x42b0c0a5;
          auVar27._8_4_ = 0x42b0c0a5;
          auVar27._0_8_ = 0x42b0c0a542b0c0a5;
          auVar27._12_4_ = 0x42b0c0a5;
          auVar27._16_4_ = 0x42b0c0a5;
          auVar27._20_4_ = 0x42b0c0a5;
          auVar27._24_4_ = 0x42b0c0a5;
          auVar27._28_4_ = 0x42b0c0a5;
          auVar4 = vminps_avx(local_4b00,auVar27);
          local_3340._0_8_ = auVar4._0_8_;
          local_3340._8_8_ = auVar4._8_8_;
          local_3340._16_8_ = auVar4._16_8_;
          local_3340._24_8_ = auVar4._24_8_;
          local_32e0 = local_3340._0_8_;
          uStack_32d8 = local_3340._8_8_;
          uStack_32d0 = local_3340._16_8_;
          uStack_32c8 = local_3340._24_8_;
          local_3300 = 0xc2b0c0a5;
          uStack_32fc = 0xc2b0c0a5;
          uStack_32f8 = 0xc2b0c0a5;
          uStack_32f4 = 0xc2b0c0a5;
          uStack_32f0 = 0xc2b0c0a5;
          uStack_32ec = 0xc2b0c0a5;
          uStack_32e8 = 0xc2b0c0a5;
          uStack_32e4 = 0xc2b0c0a5;
          auVar26._8_4_ = 0xc2b0c0a5;
          auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar26._12_4_ = 0xc2b0c0a5;
          auVar26._16_4_ = 0xc2b0c0a5;
          auVar26._20_4_ = 0xc2b0c0a5;
          auVar26._24_4_ = 0xc2b0c0a5;
          auVar26._28_4_ = 0xc2b0c0a5;
          auVar3 = vmaxps_avx(auVar4,auVar26);
          local_3340._0_8_ = auVar3._0_8_;
          local_3340._8_8_ = auVar3._8_8_;
          local_3340._16_8_ = auVar3._16_8_;
          local_3340._24_8_ = auVar3._24_8_;
          local_24a0 = local_3340._0_8_;
          uStack_2498 = local_3340._8_8_;
          uStack_2490 = local_3340._16_8_;
          uStack_2488 = local_3340._24_8_;
          local_24c0 = 0x3fb8aa3b;
          uStack_24bc = 0x3fb8aa3b;
          uStack_24b8 = 0x3fb8aa3b;
          uStack_24b4 = 0x3fb8aa3b;
          uStack_24b0 = 0x3fb8aa3b;
          uStack_24ac = 0x3fb8aa3b;
          uStack_24a8 = 0x3fb8aa3b;
          uStack_24a4 = 0x3fb8aa3b;
          local_24e0 = 0x3f000000;
          uStack_24dc = 0x3f000000;
          uStack_24d8 = 0x3f000000;
          uStack_24d4 = 0x3f000000;
          uStack_24d0 = 0x3f000000;
          uStack_24cc = 0x3f000000;
          uStack_24c8 = 0x3f000000;
          uStack_24c4 = 0x3f000000;
          local_2460 = 0x3fb8aa3b3fb8aa3b;
          uStack_2458 = 0x3fb8aa3b3fb8aa3b;
          uStack_2450 = 0x3fb8aa3b3fb8aa3b;
          uStack_2448 = 0x3fb8aa3b3fb8aa3b;
          local_2480 = 0x3f0000003f000000;
          uStack_2478 = 0x3f0000003f000000;
          uStack_2470 = 0x3f0000003f000000;
          uStack_2468 = 0x3f0000003f000000;
          local_2440 = local_3340._0_8_;
          uStack_2438 = local_3340._8_8_;
          uStack_2430 = local_3340._16_8_;
          uStack_2428 = local_3340._24_8_;
          auVar45._8_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar45._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar45._16_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar45._24_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar44._8_8_ = 0x3f0000003f000000;
          auVar44._0_8_ = 0x3f0000003f000000;
          auVar44._16_8_ = 0x3f0000003f000000;
          auVar44._24_8_ = 0x3f0000003f000000;
          auVar6 = vfmadd213ps_fma(auVar45,auVar3,auVar44);
          auVar5 = vroundps_avx(ZEXT1632(auVar6),1);
          auVar4 = vcmpps_avx(ZEXT1632(auVar6),auVar5,1);
          local_33e0._0_8_ = auVar4._0_8_;
          local_33e0._8_8_ = auVar4._8_8_;
          local_33e0._16_8_ = auVar4._16_8_;
          local_33e0._24_8_ = auVar4._24_8_;
          local_2320 = 0x3f8000003f800000;
          uStack_2318 = 0x3f8000003f800000;
          uStack_2310 = 0x3f8000003f800000;
          uStack_2308 = 0x3f8000003f800000;
          local_2300 = local_33e0._0_8_;
          uStack_22f8 = local_33e0._8_8_;
          uStack_22f0 = local_33e0._16_8_;
          uStack_22e8 = local_33e0._24_8_;
          auVar49._8_8_ = 0x3f8000003f800000;
          auVar49._0_8_ = 0x3f8000003f800000;
          auVar49._16_8_ = 0x3f8000003f800000;
          auVar49._24_8_ = 0x3f8000003f800000;
          local_33e0 = vpand_avx2(auVar4,auVar49);
          local_3360 = auVar5._0_8_;
          uStack_3358 = auVar5._8_8_;
          uStack_3350 = auVar5._16_8_;
          uStack_3348 = auVar5._24_8_;
          local_2f00 = local_3360;
          uStack_2ef8 = uStack_3358;
          uStack_2ef0 = uStack_3350;
          uStack_2ee8 = uStack_3348;
          local_2f20 = local_33e0._0_8_;
          uStack_2f18 = local_33e0._8_8_;
          uStack_2f10 = local_33e0._16_8_;
          uStack_2f08 = local_33e0._24_8_;
          local_3380 = vsubps_avx(auVar5,local_33e0);
          local_2180 = local_3380._0_8_;
          uStack_2178 = local_3380._8_8_;
          uStack_2170 = local_3380._16_8_;
          uStack_2168 = local_3380._24_8_;
          local_21a0 = 0x3f318000;
          uStack_219c = 0x3f318000;
          uStack_2198 = 0x3f318000;
          uStack_2194 = 0x3f318000;
          uStack_2190 = 0x3f318000;
          uStack_218c = 0x3f318000;
          uStack_2188 = 0x3f318000;
          uStack_2184 = 0x3f318000;
          local_21c0 = local_3340._0_8_;
          uStack_21b8 = local_3340._8_8_;
          uStack_21b0 = local_3340._16_8_;
          uStack_21a8 = local_3340._24_8_;
          local_1fc0 = 0x3f3180003f318000;
          uStack_1fb8 = 0x3f3180003f318000;
          uStack_1fb0 = 0x3f3180003f318000;
          uStack_1fa8 = 0x3f3180003f318000;
          local_1fa0 = local_3380._0_8_;
          uStack_1f98 = local_3380._8_8_;
          uStack_1f90 = local_3380._16_8_;
          uStack_1f88 = local_3380._24_8_;
          local_1fe0 = local_3340._0_8_;
          uStack_1fd8 = local_3340._8_8_;
          uStack_1fd0 = local_3340._16_8_;
          uStack_1fc8 = local_3340._24_8_;
          auVar186._8_4_ = 0x80000000;
          auVar186._0_8_ = 0x8000000080000000;
          auVar186._12_4_ = 0x80000000;
          auVar186._16_4_ = 0x80000000;
          auVar186._20_4_ = 0x80000000;
          auVar186._24_4_ = 0x80000000;
          auVar186._28_4_ = 0x80000000;
          auVar50._8_8_ = 0x3f3180003f318000;
          auVar50._0_8_ = 0x3f3180003f318000;
          auVar50._16_8_ = 0x3f3180003f318000;
          auVar50._24_8_ = 0x3f3180003f318000;
          auVar6 = vfmadd213ps_fma(auVar50,local_3380 ^ auVar186,auVar3);
          local_52c0 = auVar6._0_8_;
          uStack_52b8 = auVar6._8_8_;
          local_21e0 = local_3380._0_8_;
          uStack_21d8 = local_3380._8_8_;
          uStack_21d0 = local_3380._16_8_;
          uStack_21c8 = local_3380._24_8_;
          local_2200 = 0xb95e8083;
          uStack_21fc = 0xb95e8083;
          uStack_21f8 = 0xb95e8083;
          uStack_21f4 = 0xb95e8083;
          uStack_21f0 = 0xb95e8083;
          uStack_21ec = 0xb95e8083;
          uStack_21e8 = 0xb95e8083;
          uStack_21e4 = 0xb95e8083;
          local_2220 = local_52c0;
          uStack_2218 = uStack_52b8;
          uStack_2210 = 0;
          uStack_2208 = 0;
          local_1f60 = 0xb95e8083b95e8083;
          uStack_1f58 = 0xb95e8083b95e8083;
          uStack_1f50 = 0xb95e8083b95e8083;
          uStack_1f48 = 0xb95e8083b95e8083;
          local_1f40 = local_3380._0_8_;
          uStack_1f38 = local_3380._8_8_;
          uStack_1f30 = local_3380._16_8_;
          uStack_1f28 = local_3380._24_8_;
          local_1f80 = local_52c0;
          uStack_1f78 = uStack_52b8;
          uStack_1f70 = 0;
          uStack_1f68 = 0;
          auVar187._8_4_ = 0x80000000;
          auVar187._0_8_ = 0x8000000080000000;
          auVar187._12_4_ = 0x80000000;
          auVar187._16_4_ = 0x80000000;
          auVar187._20_4_ = 0x80000000;
          auVar187._24_4_ = 0x80000000;
          auVar187._28_4_ = 0x80000000;
          auVar51._8_8_ = 0xb95e8083b95e8083;
          auVar51._0_8_ = 0xb95e8083b95e8083;
          auVar51._16_8_ = 0xb95e8083b95e8083;
          auVar51._24_8_ = 0xb95e8083b95e8083;
          auVar6 = vfmadd213ps_fma(auVar51,local_3380 ^ auVar187,ZEXT1632(auVar6));
          local_5300 = auVar6._0_8_;
          uStack_52f8 = auVar6._8_8_;
          local_3340 = ZEXT1632(auVar6);
          local_31e0 = local_5300;
          uVar130 = local_31e0;
          uStack_31d8 = uStack_52f8;
          uVar131 = uStack_31d8;
          uStack_31d0 = 0;
          uStack_31c8 = 0;
          local_3200 = local_5300;
          uStack_31f8 = uStack_52f8;
          uStack_31f0 = 0;
          uStack_31e8 = 0;
          local_31e0._0_4_ = auVar6._0_4_;
          local_31e0._4_4_ = auVar6._4_4_;
          uStack_31d8._0_4_ = auVar6._8_4_;
          uStack_31d8._4_4_ = auVar6._12_4_;
          local_3360._4_4_ = local_31e0._4_4_ * local_31e0._4_4_;
          local_3360._0_4_ = (float)local_31e0 * (float)local_31e0;
          local_2940 = local_3360;
          uStack_3358._0_4_ = (float)uStack_31d8 * (float)uStack_31d8;
          uStack_3358._4_4_ = uStack_31d8._4_4_ * uStack_31d8._4_4_;
          auVar2 = _local_3360;
          _local_3360 = ZEXT1632(_local_3360);
          auVar9 = _local_3360;
          uStack_33f8._0_4_ = 0x39506967;
          local_3400 = (undefined1  [8])0x3950696739506967;
          uStack_33f8._4_4_ = 0x39506967;
          uStack_33f0._0_4_ = 0x39506967;
          uStack_33f0._4_4_ = 0x39506967;
          auVar128 = _local_3400;
          uStack_33e8._0_4_ = 0x39506967;
          uStack_33e8._4_4_ = 0x39506967;
          auVar4 = _local_3400;
          uStack_33f0 = auVar128._16_8_;
          uStack_33e8 = auVar4._24_8_;
          local_2560 = 0x3950696739506967;
          uStack_2558 = uStack_33f8;
          uStack_2550 = uStack_33f0;
          uStack_2548 = uStack_33e8;
          local_2580 = local_5300;
          uStack_2578 = uStack_52f8;
          uStack_2570 = 0;
          uStack_2568 = 0;
          local_25a0 = 0x3ab743ce;
          uStack_259c = 0x3ab743ce;
          uStack_2598 = 0x3ab743ce;
          uStack_2594 = 0x3ab743ce;
          uStack_2590 = 0x3ab743ce;
          uStack_258c = 0x3ab743ce;
          uStack_2588 = 0x3ab743ce;
          uStack_2584 = 0x3ab743ce;
          local_2540 = 0x3ab743ce3ab743ce;
          uStack_2538 = 0x3ab743ce3ab743ce;
          uStack_2530 = 0x3ab743ce3ab743ce;
          uStack_2528 = 0x3ab743ce3ab743ce;
          local_2500 = 0x3950696739506967;
          uStack_24f8 = uStack_33f8;
          uStack_24f0 = uStack_33f0;
          uStack_24e8 = uStack_33e8;
          local_2520 = local_5300;
          uStack_2518 = uStack_52f8;
          uStack_2510 = 0;
          uStack_2508 = 0;
          auVar43._16_8_ = uStack_33f0;
          auVar43._0_16_ = _local_3400;
          auVar43._24_8_ = uStack_33e8;
          auVar42._8_8_ = 0x3ab743ce3ab743ce;
          auVar42._0_8_ = 0x3ab743ce3ab743ce;
          auVar42._16_8_ = 0x3ab743ce3ab743ce;
          auVar42._24_8_ = 0x3ab743ce3ab743ce;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar43,auVar42);
          local_3400 = auVar1._0_8_;
          uStack_33f8 = auVar1._8_8_;
          local_2620 = local_3400;
          uStack_2618 = uStack_33f8;
          uStack_2610 = 0;
          uStack_2608 = 0;
          local_2640 = local_5300;
          uStack_2638 = uStack_52f8;
          uStack_2630 = 0;
          uStack_2628 = 0;
          local_2660 = 0x3c088908;
          uStack_265c = 0x3c088908;
          uStack_2658 = 0x3c088908;
          uStack_2654 = 0x3c088908;
          uStack_2650 = 0x3c088908;
          uStack_264c = 0x3c088908;
          uStack_2648 = 0x3c088908;
          uStack_2644 = 0x3c088908;
          local_2600 = 0x3c0889083c088908;
          uStack_25f8 = 0x3c0889083c088908;
          uStack_25f0 = 0x3c0889083c088908;
          uStack_25e8 = 0x3c0889083c088908;
          local_25c0 = local_3400;
          uStack_25b8 = uStack_33f8;
          uStack_25b0 = 0;
          uStack_25a8 = 0;
          local_25e0 = local_5300;
          uStack_25d8 = uStack_52f8;
          uStack_25d0 = 0;
          uStack_25c8 = 0;
          auVar41._8_8_ = 0x3c0889083c088908;
          auVar41._0_8_ = 0x3c0889083c088908;
          auVar41._16_8_ = 0x3c0889083c088908;
          auVar41._24_8_ = 0x3c0889083c088908;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar41);
          local_3400 = auVar1._0_8_;
          uStack_33f8 = auVar1._8_8_;
          local_26e0 = local_3400;
          uStack_26d8 = uStack_33f8;
          uStack_26d0 = 0;
          uStack_26c8 = 0;
          local_2700 = local_5300;
          uStack_26f8 = uStack_52f8;
          uStack_26f0 = 0;
          uStack_26e8 = 0;
          local_2720 = 0x3d2aa9c1;
          uStack_271c = 0x3d2aa9c1;
          uStack_2718 = 0x3d2aa9c1;
          uStack_2714 = 0x3d2aa9c1;
          uStack_2710 = 0x3d2aa9c1;
          uStack_270c = 0x3d2aa9c1;
          uStack_2708 = 0x3d2aa9c1;
          uStack_2704 = 0x3d2aa9c1;
          local_26c0 = 0x3d2aa9c13d2aa9c1;
          uStack_26b8 = 0x3d2aa9c13d2aa9c1;
          uStack_26b0 = 0x3d2aa9c13d2aa9c1;
          uStack_26a8 = 0x3d2aa9c13d2aa9c1;
          local_2680 = local_3400;
          uStack_2678 = uStack_33f8;
          uStack_2670 = 0;
          uStack_2668 = 0;
          local_26a0 = local_5300;
          uStack_2698 = uStack_52f8;
          uStack_2690 = 0;
          uStack_2688 = 0;
          auVar40._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar40._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar40._16_8_ = 0x3d2aa9c13d2aa9c1;
          auVar40._24_8_ = 0x3d2aa9c13d2aa9c1;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar40);
          local_3400 = auVar1._0_8_;
          uStack_33f8 = auVar1._8_8_;
          local_27a0 = local_3400;
          uStack_2798 = uStack_33f8;
          uStack_2790 = 0;
          uStack_2788 = 0;
          local_27c0 = local_5300;
          uStack_27b8 = uStack_52f8;
          uStack_27b0 = 0;
          uStack_27a8 = 0;
          local_27e0 = 0x3e2aaaaa;
          uStack_27dc = 0x3e2aaaaa;
          uStack_27d8 = 0x3e2aaaaa;
          uStack_27d4 = 0x3e2aaaaa;
          uStack_27d0 = 0x3e2aaaaa;
          uStack_27cc = 0x3e2aaaaa;
          uStack_27c8 = 0x3e2aaaaa;
          uStack_27c4 = 0x3e2aaaaa;
          local_2780 = 0x3e2aaaaa3e2aaaaa;
          uStack_2778 = 0x3e2aaaaa3e2aaaaa;
          uStack_2770 = 0x3e2aaaaa3e2aaaaa;
          uStack_2768 = 0x3e2aaaaa3e2aaaaa;
          local_2740 = local_3400;
          uStack_2738 = uStack_33f8;
          uStack_2730 = 0;
          uStack_2728 = 0;
          local_2760 = local_5300;
          uStack_2758 = uStack_52f8;
          uStack_2750 = 0;
          uStack_2748 = 0;
          auVar39._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar39._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar39._16_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar39._24_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar39);
          local_3400 = auVar1._0_8_;
          uStack_33f8 = auVar1._8_8_;
          local_2860 = local_3400;
          uStack_2858 = uStack_33f8;
          uStack_2850 = 0;
          uStack_2848 = 0;
          local_2880 = local_5300;
          uStack_2878 = uStack_52f8;
          uStack_2870 = 0;
          uStack_2868 = 0;
          local_28a0 = 0x3f000000;
          uStack_289c = 0x3f000000;
          uStack_2898 = 0x3f000000;
          uStack_2894 = 0x3f000000;
          uStack_2890 = 0x3f000000;
          uStack_288c = 0x3f000000;
          uStack_2888 = 0x3f000000;
          uStack_2884 = 0x3f000000;
          local_2840 = 0x3f0000003f000000;
          uStack_2838 = 0x3f0000003f000000;
          uStack_2830 = 0x3f0000003f000000;
          uStack_2828 = 0x3f0000003f000000;
          local_2800 = local_3400;
          uStack_27f8 = uStack_33f8;
          uStack_27f0 = 0;
          uStack_27e8 = 0;
          local_2820 = local_5300;
          uStack_2818 = uStack_52f8;
          uStack_2810 = 0;
          uStack_2808 = 0;
          auVar38._8_8_ = 0x3f0000003f000000;
          auVar38._0_8_ = 0x3f0000003f000000;
          auVar38._16_8_ = 0x3f0000003f000000;
          auVar38._24_8_ = 0x3f0000003f000000;
          auVar1 = vfmadd213ps_fma(ZEXT1632(auVar6),ZEXT1632(auVar1),auVar38);
          local_3400 = auVar1._0_8_;
          uStack_33f8 = auVar1._8_8_;
          uStack_3358 = auVar2._8_8_;
          local_2920 = local_3400;
          uStack_2918 = uStack_33f8;
          uStack_2910 = 0;
          uStack_2908 = 0;
          uStack_2938 = uStack_3358;
          uStack_2930 = 0;
          uStack_2928 = 0;
          local_2960 = local_5300;
          uStack_2958 = uStack_52f8;
          uStack_2950 = 0;
          uStack_2948 = 0;
          local_28c0 = local_3400;
          uStack_28b8 = uStack_33f8;
          uStack_28b0 = 0;
          uStack_28a8 = 0;
          local_28e0 = local_2940;
          uStack_28d8 = uStack_3358;
          uStack_28d0 = 0;
          uStack_28c8 = 0;
          local_2900 = local_5300;
          uStack_28f8 = uStack_52f8;
          uStack_28f0 = 0;
          uStack_28e8 = 0;
          auVar6 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar1),ZEXT1632(auVar6));
          local_3400 = auVar6._0_8_;
          uStack_33f8 = auVar6._8_8_;
          local_3280 = 0x3f8000003f800000;
          uStack_3278 = 0x3f8000003f800000;
          uStack_3270 = 0x3f8000003f800000;
          uStack_3268 = 0x3f8000003f800000;
          local_3260 = local_3400;
          uVar123 = local_3260;
          uStack_3258 = uStack_33f8;
          uVar124 = uStack_3258;
          uStack_3250 = 0;
          uStack_3248 = 0;
          local_3260._0_4_ = auVar6._0_4_;
          local_3260._4_4_ = auVar6._4_4_;
          uStack_3258._0_4_ = auVar6._8_4_;
          uStack_3258._4_4_ = auVar6._12_4_;
          local_3400._4_4_ = local_3260._4_4_ + 1.0;
          local_3400._0_4_ = (float)local_3260 + 1.0;
          uStack_33f8._0_4_ = (float)uStack_3258 + 1.0;
          uStack_33f8._4_4_ = uStack_3258._4_4_ + 1.0;
          uStack_33f0._0_4_ = 0x3f800000;
          uStack_33f0._4_4_ = 0x3f800000;
          auVar128 = _local_3400;
          uStack_33e8._0_4_ = 0x3f800000;
          uStack_33e8._4_4_ = 0x3f800000;
          auVar3 = _local_3400;
          local_2140 = local_3380._0_8_;
          uVar132 = local_2140;
          uStack_2138 = local_3380._8_8_;
          uVar133 = uStack_2138;
          uStack_2130 = local_3380._16_8_;
          uVar134 = uStack_2130;
          uStack_2128 = local_3380._24_8_;
          uVar135 = uStack_2128;
          local_2140._0_4_ = local_3380._0_4_;
          local_2140._4_4_ = local_3380._4_4_;
          uStack_2138._0_4_ = local_3380._8_4_;
          uStack_2138._4_4_ = local_3380._12_4_;
          uStack_2130._0_4_ = local_3380._16_4_;
          uStack_2130._4_4_ = local_3380._20_4_;
          uStack_2128._0_4_ = local_3380._24_4_;
          uStack_2128._4_4_ = local_3380._28_4_;
          local_33a0 = CONCAT44((int)local_2140._4_4_,(int)(float)local_2140);
          uStack_3398 = CONCAT44((int)uStack_2138._4_4_,(int)(float)uStack_2138);
          uStack_3390 = CONCAT44((int)uStack_2130._4_4_,(int)(float)uStack_2130);
          uStack_3388 = CONCAT44((int)uStack_2128._4_4_,(int)(float)uStack_2128);
          local_20c0 = local_33a0;
          uStack_20b8 = uStack_3398;
          uStack_20b0 = uStack_3390;
          uStack_20a8 = uStack_3388;
          local_20e0 = 0x7f0000007f;
          uStack_20d8 = 0x7f0000007f;
          uStack_20d0 = 0x7f0000007f;
          uStack_20c8 = 0x7f0000007f;
          local_1e40 = local_33a0;
          uStack_1e38 = uStack_3398;
          uStack_1e30 = uStack_3390;
          uStack_1e28 = uStack_3388;
          local_1e60 = 0x7f0000007f;
          uStack_1e58 = 0x7f0000007f;
          uStack_1e50 = 0x7f0000007f;
          uStack_1e48 = 0x7f0000007f;
          auVar55._8_8_ = uStack_3398;
          auVar55._0_8_ = local_33a0;
          auVar55._16_8_ = uStack_3390;
          auVar55._24_8_ = uStack_3388;
          auVar54._8_8_ = 0x7f0000007f;
          auVar54._0_8_ = 0x7f0000007f;
          auVar54._16_8_ = 0x7f0000007f;
          auVar54._24_8_ = 0x7f0000007f;
          auVar4 = vpaddd_avx2(auVar55,auVar54);
          local_5320 = auVar4._0_8_;
          uStack_5318 = auVar4._8_8_;
          uStack_5310 = auVar4._16_8_;
          uStack_5308 = auVar4._24_8_;
          local_2040 = local_5320;
          uStack_2038 = uStack_5318;
          uStack_2030 = uStack_5310;
          uStack_2028 = uStack_5308;
          local_2044 = 0x17;
          local_1dc0 = local_5320;
          uStack_1db8 = uStack_5318;
          uStack_1db0 = uStack_5310;
          uStack_1da8 = uStack_5308;
          local_1dc4 = 0x17;
          auVar4 = vpslld_avx2(auVar4,ZEXT416(0x17));
          local_5340 = auVar4._0_8_;
          uStack_5338 = auVar4._8_8_;
          uStack_5330 = auVar4._16_8_;
          uStack_5328 = auVar4._24_8_;
          local_33a0 = local_5340;
          uStack_3398 = uStack_5338;
          uStack_3390 = uStack_5330;
          uStack_3388 = uStack_5328;
          local_2000 = local_5340;
          uStack_1ff8 = uStack_5338;
          uStack_1ff0 = uStack_5330;
          uStack_1fe8 = uStack_5328;
          local_3420 = local_5340;
          uStack_3418 = uStack_5338;
          uStack_3410 = uStack_5330;
          uStack_3408 = uStack_5328;
          uStack_33f0 = auVar128._16_8_;
          uStack_33e8 = auVar3._24_8_;
          local_3220 = local_3400;
          uStack_3218 = uStack_33f8;
          uStack_3210 = uStack_33f0;
          uStack_3208 = uStack_33e8;
          local_3240 = local_5340;
          uVar125 = local_3240;
          uStack_3238 = uStack_5338;
          uVar126 = uStack_3238;
          uStack_3230 = uStack_5330;
          uVar127 = uStack_3230;
          uStack_3228 = uStack_5328;
          uVar129 = uStack_3228;
          local_3240._0_4_ = auVar4._0_4_;
          local_3240._4_4_ = auVar4._4_4_;
          uStack_3238._0_4_ = auVar4._8_4_;
          uStack_3238._4_4_ = auVar4._12_4_;
          uStack_3230._0_4_ = auVar4._16_4_;
          uStack_3230._4_4_ = auVar4._20_4_;
          uStack_3228._0_4_ = auVar4._24_4_;
          local_3400._0_4_ = ((float)local_3260 + 1.0) * (float)local_3240;
          local_3400._4_4_ = (local_3260._4_4_ + 1.0) * local_3240._4_4_;
          uStack_3238._0_4_ = ((float)uStack_3258 + 1.0) * (float)uStack_3238;
          uStack_3238._4_4_ = (uStack_3258._4_4_ + 1.0) * uStack_3238._4_4_;
          uStack_33f8._0_4_ = (float)uStack_3238;
          uStack_33f8._4_4_ = uStack_3238._4_4_;
          uStack_33f0._0_4_ = (float)uStack_3230 * 1.0;
          uStack_33f0._4_4_ = uStack_3230._4_4_ * 1.0;
          auVar128 = _local_3400;
          uStack_33e8._0_4_ = (float)uStack_3228 * 1.0;
          uStack_33e8._4_4_ = 0x3f800000;
          auVar8 = _local_3400;
          uStack_33f0 = auVar128._16_8_;
          uStack_33e8 = auVar8._24_8_;
          local_3924 = 0x3f800000;
          local_35e4 = 0x3f800000;
          local_35e8 = 0x3f800000;
          local_35ec = 0x3f800000;
          local_35f0 = 0x3f800000;
          local_35f4 = 0x3f800000;
          local_35f8 = 0x3f800000;
          local_35fc = 0x3f800000;
          local_3600 = 0x3f800000;
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          local_3620 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auStack_3610 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          local_37c0 = local_3400;
          uStack_37b8 = uStack_33f8;
          uStack_37b0 = uStack_33f0;
          uStack_37a8 = uStack_33e8;
          local_37e0 = local_3620._0_8_;
          uVar109 = local_37e0;
          uStack_37d8 = local_3620._8_8_;
          uVar110 = uStack_37d8;
          uStack_37d0 = auStack_3610._0_8_;
          uVar111 = uStack_37d0;
          uStack_37c8 = auStack_3610._8_8_;
          uVar112 = uStack_37c8;
          local_37e0._0_4_ = local_3620._0_4_;
          local_37e0._4_4_ = local_3620._4_4_;
          uStack_37d8._0_4_ = local_3620._8_4_;
          uStack_37d8._4_4_ = local_3620._12_4_;
          uStack_37d0._0_4_ = auStack_3610._0_4_;
          uStack_37d0._4_4_ = auStack_3610._4_4_;
          uStack_37c8._0_4_ = auStack_3610._8_4_;
          uStack_37c8._4_4_ = auStack_3610._12_4_;
          local_ec0._4_4_ = (float)local_3400._4_4_ + local_37e0._4_4_;
          local_ec0._0_4_ = (float)local_3400._0_4_ + (float)local_37e0;
          uStack_eb8._0_4_ = (float)uStack_3238 + (float)uStack_37d8;
          uStack_eb8._4_4_ = uStack_3238._4_4_ + uStack_37d8._4_4_;
          uStack_eb0._0_4_ = (float)uStack_3230 * 1.0 + (float)uStack_37d0;
          uStack_eb0._4_4_ = uStack_3230._4_4_ * 1.0 + uStack_37d0._4_4_;
          auVar128 = _local_ec0;
          uStack_ea8._0_4_ = (float)uStack_3228 * 1.0 + (float)uStack_37c8;
          uStack_ea8._4_4_ = uStack_37c8._4_4_ + 1.0;
          auVar4 = _local_ec0;
          local_f00 = 0x3f800000;
          uStack_efc = 0x3f800000;
          uStack_ef8 = 0x3f800000;
          uStack_ef4 = 0x3f800000;
          uStack_ef0 = 0x3f800000;
          uStack_eec = 0x3f800000;
          uStack_ee8 = 0x3f800000;
          uStack_ee4 = 0x3f800000;
          local_ea0 = 0;
          uStack_e98 = 0;
          uStack_e90 = 0;
          uStack_e88 = 0;
          local_f20 = vcmpps_avx(_local_ec0,ZEXT1632(ZEXT816(0)),2);
          uStack_eb0 = auVar128._16_8_;
          uStack_ea8 = auVar4._24_8_;
          local_e60 = local_ec0;
          uStack_e58 = uStack_eb8;
          uStack_e50 = uStack_eb0;
          uStack_e48 = uStack_ea8;
          local_e80 = 0x800000;
          uStack_e7c = 0x800000;
          uStack_e78 = 0x800000;
          uStack_e74 = 0x800000;
          uStack_e70 = 0x800000;
          uStack_e6c = 0x800000;
          uStack_e68 = 0x800000;
          uStack_e64 = 0x800000;
          auVar77._16_8_ = uStack_eb0;
          auVar77._0_16_ = _local_ec0;
          auVar77._24_8_ = uStack_ea8;
          auVar76._8_4_ = 0x800000;
          auVar76._0_8_ = 0x80000000800000;
          auVar76._12_4_ = 0x800000;
          auVar76._16_4_ = 0x800000;
          auVar76._20_4_ = 0x800000;
          auVar76._24_4_ = 0x800000;
          auVar76._28_4_ = 0x800000;
          auVar4 = vmaxps_avx(auVar77,auVar76);
          local_ec0 = auVar4._0_8_;
          uStack_eb8 = auVar4._8_8_;
          uStack_eb0 = auVar4._16_8_;
          uStack_ea8 = auVar4._24_8_;
          local_2a0 = local_ec0;
          uStack_298 = uStack_eb8;
          uStack_290 = uStack_eb0;
          uStack_288 = uStack_ea8;
          local_2c0 = local_ec0;
          uStack_2b8 = uStack_eb8;
          uStack_2b0 = uStack_eb0;
          uStack_2a8 = uStack_ea8;
          local_2c4 = 0x17;
          local_180 = local_ec0;
          uStack_178 = uStack_eb8;
          uStack_170 = uStack_eb0;
          uStack_168 = uStack_ea8;
          local_184 = 0x17;
          auVar5 = vpsrld_avx2(auVar4,ZEXT416(0x17));
          local_5380 = auVar5._0_8_;
          uStack_5378 = auVar5._8_8_;
          uStack_5370 = auVar5._16_8_;
          uStack_5368 = auVar5._24_8_;
          local_420 = local_ec0;
          uStack_418 = uStack_eb8;
          uStack_410 = uStack_eb0;
          uStack_408 = uStack_ea8;
          local_440 = 0x807fffff;
          uStack_43c = 0x807fffff;
          uStack_438 = 0x807fffff;
          uStack_434 = 0x807fffff;
          uStack_430 = 0x807fffff;
          uStack_42c = 0x807fffff;
          uStack_428 = 0x807fffff;
          uStack_424 = 0x807fffff;
          auVar102._8_4_ = 0x807fffff;
          auVar102._0_8_ = 0x807fffff807fffff;
          auVar102._12_4_ = 0x807fffff;
          auVar102._16_4_ = 0x807fffff;
          auVar102._20_4_ = 0x807fffff;
          auVar102._24_4_ = 0x807fffff;
          auVar102._28_4_ = 0x807fffff;
          auVar4 = vpand_avx2(auVar4,auVar102);
          local_ec0 = auVar4._0_8_;
          uStack_eb8 = auVar4._8_8_;
          uStack_eb0 = auVar4._16_8_;
          uStack_ea8 = auVar4._24_8_;
          local_220 = local_ec0;
          uStack_218 = uStack_eb8;
          uStack_210 = uStack_eb0;
          uStack_208 = uStack_ea8;
          local_240 = 0x3f000000;
          uStack_23c = 0x3f000000;
          uStack_238 = 0x3f000000;
          uStack_234 = 0x3f000000;
          uStack_230 = 0x3f000000;
          uStack_22c = 0x3f000000;
          uStack_228 = 0x3f000000;
          uStack_224 = 0x3f000000;
          auVar107._8_4_ = 0x3f000000;
          auVar107._0_8_ = 0x3f0000003f000000;
          auVar107._12_4_ = 0x3f000000;
          auVar107._16_4_ = 0x3f000000;
          auVar107._20_4_ = 0x3f000000;
          auVar107._24_4_ = 0x3f000000;
          auVar107._28_4_ = 0x3f000000;
          auVar3 = vpor_avx2(auVar4,auVar107);
          local_1e0 = local_5380;
          uStack_1d8 = uStack_5378;
          uStack_1d0 = uStack_5370;
          uStack_1c8 = uStack_5368;
          local_200 = 0x7f0000007f;
          uStack_1f8 = 0x7f0000007f;
          uStack_1f0 = 0x7f0000007f;
          uStack_1e8 = 0x7f0000007f;
          local_140 = local_5380;
          uStack_138 = uStack_5378;
          uStack_130 = uStack_5370;
          uStack_128 = uStack_5368;
          local_160 = 0x7f0000007f;
          uStack_158 = 0x7f0000007f;
          uStack_150 = 0x7f0000007f;
          uStack_148 = 0x7f0000007f;
          auVar108._8_8_ = 0x7f0000007f;
          auVar108._0_8_ = 0x7f0000007f;
          auVar108._16_8_ = 0x7f0000007f;
          auVar108._24_8_ = 0x7f0000007f;
          auVar4 = vpsubd_avx2(auVar5,auVar108);
          local_53c0 = auVar4._0_8_;
          uStack_53b8 = auVar4._8_8_;
          uStack_53b0 = auVar4._16_8_;
          uStack_53a8 = auVar4._24_8_;
          local_ee0 = local_53c0;
          uStack_ed8 = uStack_53b8;
          uStack_ed0 = uStack_53b0;
          uStack_ec8 = uStack_53a8;
          local_1c0 = local_53c0;
          uStack_1b8 = uStack_53b8;
          uStack_1b0 = uStack_53b0;
          uStack_1a8 = uStack_53a8;
          auVar4 = vcvtdq2ps_avx(auVar4);
          local_f40 = auVar4._0_8_;
          uStack_f38 = auVar4._8_8_;
          uStack_f30 = auVar4._16_8_;
          uStack_f28 = auVar4._24_8_;
          local_dc0 = 0x3f8000003f800000;
          uStack_db8 = 0x3f8000003f800000;
          uStack_db0 = 0x3f8000003f800000;
          uStack_da8 = 0x3f8000003f800000;
          local_da0 = local_f40;
          uVar172 = local_da0;
          uStack_d98 = uStack_f38;
          uVar173 = uStack_d98;
          uStack_d90 = uStack_f30;
          uVar174 = uStack_d90;
          uStack_d88 = uStack_f28;
          uVar175 = uStack_d88;
          local_da0._0_4_ = auVar4._0_4_;
          local_da0._4_4_ = auVar4._4_4_;
          uStack_d98._0_4_ = auVar4._8_4_;
          uStack_d98._4_4_ = auVar4._12_4_;
          uStack_d90._0_4_ = auVar4._16_4_;
          uStack_d90._4_4_ = auVar4._20_4_;
          uStack_d88._0_4_ = auVar4._24_4_;
          uStack_d88._4_4_ = auVar4._28_4_;
          local_f40._4_4_ = local_da0._4_4_ + 1.0;
          local_f40._0_4_ = (float)local_da0 + 1.0;
          uStack_f38._0_4_ = (float)uStack_d98 + 1.0;
          uStack_f38._4_4_ = uStack_d98._4_4_ + 1.0;
          uStack_f30._0_4_ = (float)uStack_d90 + 1.0;
          uStack_f30._4_4_ = uStack_d90._4_4_ + 1.0;
          auVar128 = _local_f40;
          uStack_f28._0_4_ = (float)uStack_d88 + 1.0;
          uStack_f28._4_4_ = uStack_d88._4_4_ + 1.0;
          auVar5 = _local_f40;
          auVar188._8_4_ = 0x3f3504f3;
          auVar188._0_8_ = 0x3f3504f33f3504f3;
          auVar188._12_4_ = 0x3f3504f3;
          auVar188._16_4_ = 0x3f3504f3;
          auVar188._20_4_ = 0x3f3504f3;
          auVar188._24_4_ = 0x3f3504f3;
          auVar188._28_4_ = 0x3f3504f3;
          local_f60 = vcmpps_avx(auVar3,auVar188,1);
          local_ec0 = auVar3._0_8_;
          uStack_eb8 = auVar3._8_8_;
          uStack_eb0 = auVar3._16_8_;
          uStack_ea8 = auVar3._24_8_;
          local_460 = local_ec0;
          uStack_458 = uStack_eb8;
          uStack_450 = uStack_eb0;
          uStack_448 = uStack_ea8;
          local_480 = local_f60._0_8_;
          uStack_478 = local_f60._8_8_;
          uStack_470 = local_f60._16_8_;
          uStack_468 = local_f60._24_8_;
          local_f80 = vpand_avx2(auVar3,local_f60);
          local_c80 = 0x3f8000003f800000;
          uStack_c78 = 0x3f8000003f800000;
          uStack_c70 = 0x3f8000003f800000;
          uStack_c68 = 0x3f8000003f800000;
          local_c60 = local_ec0;
          uStack_c58 = uStack_eb8;
          uStack_c50 = uStack_eb0;
          uStack_c48 = uStack_ea8;
          auVar79._8_8_ = 0x3f8000003f800000;
          auVar79._0_8_ = 0x3f8000003f800000;
          auVar79._16_8_ = 0x3f8000003f800000;
          auVar79._24_8_ = 0x3f8000003f800000;
          auVar4 = vsubps_avx(auVar3,auVar79);
          uStack_f30 = auVar128._16_8_;
          uStack_f28 = auVar5._24_8_;
          local_4a0 = 0x3f8000003f800000;
          uStack_498 = 0x3f8000003f800000;
          uStack_490 = 0x3f8000003f800000;
          uStack_488 = 0x3f8000003f800000;
          local_4c0 = local_f60._0_8_;
          uStack_4b8 = local_f60._8_8_;
          uStack_4b0 = local_f60._16_8_;
          uStack_4a8 = local_f60._24_8_;
          auVar101._8_8_ = 0x3f8000003f800000;
          auVar101._0_8_ = 0x3f8000003f800000;
          auVar101._16_8_ = 0x3f8000003f800000;
          auVar101._24_8_ = 0x3f8000003f800000;
          local_cc0 = vpand_avx2(auVar101,local_f60);
          local_ca0 = local_f40;
          uStack_c98 = uStack_f38;
          uStack_c90 = uStack_f30;
          uStack_c88 = uStack_f28;
          auVar78._16_8_ = uStack_f30;
          auVar78._0_16_ = _local_f40;
          auVar78._24_8_ = uStack_f28;
          _local_f40 = vsubps_avx(auVar78,local_cc0);
          local_ec0 = auVar4._0_8_;
          uStack_eb8 = auVar4._8_8_;
          uStack_eb0 = auVar4._16_8_;
          uStack_ea8 = auVar4._24_8_;
          local_de0 = local_ec0;
          uVar168 = local_de0;
          uStack_dd8 = uStack_eb8;
          uVar169 = uStack_dd8;
          uStack_dd0 = uStack_eb0;
          uVar170 = uStack_dd0;
          uStack_dc8 = uStack_ea8;
          uVar171 = uStack_dc8;
          local_e00 = local_f80._0_8_;
          uVar164 = local_e00;
          uStack_df8 = local_f80._8_8_;
          uVar165 = uStack_df8;
          uStack_df0 = local_f80._16_8_;
          uVar166 = uStack_df0;
          uStack_de8 = local_f80._24_8_;
          uVar167 = uStack_de8;
          local_de0._0_4_ = auVar4._0_4_;
          local_de0._4_4_ = auVar4._4_4_;
          uStack_dd8._0_4_ = auVar4._8_4_;
          uStack_dd8._4_4_ = auVar4._12_4_;
          uStack_dd0._0_4_ = auVar4._16_4_;
          uStack_dd0._4_4_ = auVar4._20_4_;
          uStack_dc8._0_4_ = auVar4._24_4_;
          uStack_dc8._4_4_ = auVar4._28_4_;
          local_e00._0_4_ = local_f80._0_4_;
          local_e00._4_4_ = local_f80._4_4_;
          uStack_df8._0_4_ = local_f80._8_4_;
          uStack_df8._4_4_ = local_f80._12_4_;
          uStack_df0._0_4_ = local_f80._16_4_;
          uStack_df0._4_4_ = local_f80._20_4_;
          uStack_de8._0_4_ = local_f80._24_4_;
          uStack_de8._4_4_ = local_f80._28_4_;
          local_ec0._0_4_ = (float)local_de0 + (float)local_e00;
          local_ec0._4_4_ = local_de0._4_4_ + local_e00._4_4_;
          uStack_dd8._0_4_ = (float)uStack_dd8 + (float)uStack_df8;
          uStack_dd8._4_4_ = uStack_dd8._4_4_ + uStack_df8._4_4_;
          uStack_dd0._0_4_ = (float)uStack_dd0 + (float)uStack_df0;
          uStack_dd0._4_4_ = uStack_dd0._4_4_ + uStack_df0._4_4_;
          uStack_dc8._0_4_ = (float)uStack_dc8 + (float)uStack_de8;
          fStack_f84 = uStack_dc8._4_4_ + uStack_de8._4_4_;
          uStack_eb8._0_4_ = (float)uStack_dd8;
          uStack_eb8._4_4_ = uStack_dd8._4_4_;
          uStack_eb0._0_4_ = (float)uStack_dd0;
          uStack_eb0._4_4_ = uStack_dd0._4_4_;
          auVar128 = _local_ec0;
          uStack_ea8._0_4_ = (float)uStack_dc8;
          uStack_ea8._4_4_ = fStack_f84;
          auVar4 = _local_ec0;
          uStack_eb0 = auVar128._16_8_;
          uStack_ea8 = auVar4._24_8_;
          local_ce0 = local_ec0;
          uStack_cd8 = uStack_eb8;
          uStack_cd0 = uStack_eb0;
          uStack_cc8 = uStack_ea8;
          local_d00 = local_ec0;
          uStack_cf8 = uStack_eb8;
          uStack_cf0 = uStack_eb0;
          uStack_ce8 = uStack_ea8;
          local_fa0 = (float)local_ec0._0_4_ * (float)local_ec0._0_4_;
          fStack_f9c = (float)local_ec0._4_4_ * (float)local_ec0._4_4_;
          fStack_f98 = (float)uStack_dd8 * (float)uStack_dd8;
          fStack_f94 = uStack_dd8._4_4_ * uStack_dd8._4_4_;
          fStack_f90 = (float)uStack_dd0 * (float)uStack_dd0;
          fStack_f8c = uStack_dd0._4_4_ * uStack_dd0._4_4_;
          fStack_f88 = (float)uStack_dc8 * (float)uStack_dc8;
          uStack_fb8._0_4_ = 0x3d9021bb;
          local_fc0 = (undefined1  [8])0x3d9021bb3d9021bb;
          uStack_fb8._4_4_ = 0x3d9021bb;
          uStack_fb0._0_4_ = 0x3d9021bb;
          uStack_fb0._4_4_ = 0x3d9021bb;
          auVar128 = _local_fc0;
          uStack_fa8._0_4_ = 0x3d9021bb;
          uStack_fa8._4_4_ = 0x3d9021bb;
          auVar4 = _local_fc0;
          uStack_fb0 = auVar128._16_8_;
          uStack_fa8 = auVar4._24_8_;
          local_540 = 0x3d9021bb3d9021bb;
          uStack_538 = uStack_fb8;
          uStack_530 = uStack_fb0;
          uStack_528 = uStack_fa8;
          local_560 = local_ec0;
          uStack_558 = uStack_eb8;
          uStack_550 = uStack_eb0;
          uStack_548 = uStack_ea8;
          local_580 = 0xbdebd1b8;
          uStack_57c = 0xbdebd1b8;
          uStack_578 = 0xbdebd1b8;
          uStack_574 = 0xbdebd1b8;
          uStack_570 = 0xbdebd1b8;
          uStack_56c = 0xbdebd1b8;
          uStack_568 = 0xbdebd1b8;
          uStack_564 = 0xbdebd1b8;
          local_520 = 0xbdebd1b8bdebd1b8;
          uStack_518 = 0xbdebd1b8bdebd1b8;
          uStack_510 = 0xbdebd1b8bdebd1b8;
          uStack_508 = 0xbdebd1b8bdebd1b8;
          local_4e0 = 0x3d9021bb3d9021bb;
          uStack_4d8 = uStack_fb8;
          uStack_4d0 = uStack_fb0;
          uStack_4c8 = uStack_fa8;
          local_500 = local_ec0;
          uStack_4f8 = uStack_eb8;
          uStack_4f0 = uStack_eb0;
          uStack_4e8 = uStack_ea8;
          auVar100._16_8_ = uStack_fb0;
          auVar100._0_16_ = _local_fc0;
          auVar100._24_8_ = uStack_fa8;
          auVar99._16_8_ = uStack_eb0;
          auVar99._0_16_ = _local_ec0;
          auVar99._24_8_ = uStack_ea8;
          auVar98._8_8_ = 0xbdebd1b8bdebd1b8;
          auVar98._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar98._16_8_ = 0xbdebd1b8bdebd1b8;
          auVar98._24_8_ = 0xbdebd1b8bdebd1b8;
          auVar6 = vfmadd213ps_fma(auVar99,auVar100,auVar98);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_600 = local_fc0;
          uStack_5f8 = uStack_fb8;
          uStack_5f0 = 0;
          uStack_5e8 = 0;
          local_620 = local_ec0;
          uStack_618 = uStack_eb8;
          uStack_610 = uStack_eb0;
          uStack_608 = uStack_ea8;
          local_640 = 0x3def251a;
          uStack_63c = 0x3def251a;
          uStack_638 = 0x3def251a;
          uStack_634 = 0x3def251a;
          uStack_630 = 0x3def251a;
          uStack_62c = 0x3def251a;
          uStack_628 = 0x3def251a;
          uStack_624 = 0x3def251a;
          local_5e0 = 0x3def251a3def251a;
          uStack_5d8 = 0x3def251a3def251a;
          uStack_5d0 = 0x3def251a3def251a;
          uStack_5c8 = 0x3def251a3def251a;
          local_5a0 = local_fc0;
          uStack_598 = uStack_fb8;
          uStack_590 = 0;
          uStack_588 = 0;
          local_5c0 = local_ec0;
          uStack_5b8 = uStack_eb8;
          uStack_5b0 = uStack_eb0;
          uStack_5a8 = uStack_ea8;
          auVar97._16_8_ = uStack_eb0;
          auVar97._0_16_ = _local_ec0;
          auVar97._24_8_ = uStack_ea8;
          auVar96._8_8_ = 0x3def251a3def251a;
          auVar96._0_8_ = 0x3def251a3def251a;
          auVar96._16_8_ = 0x3def251a3def251a;
          auVar96._24_8_ = 0x3def251a3def251a;
          auVar6 = vfmadd213ps_fma(auVar97,ZEXT1632(auVar6),auVar96);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_6c0 = local_fc0;
          uStack_6b8 = uStack_fb8;
          uStack_6b0 = 0;
          uStack_6a8 = 0;
          local_6e0 = local_ec0;
          uStack_6d8 = uStack_eb8;
          uStack_6d0 = uStack_eb0;
          uStack_6c8 = uStack_ea8;
          local_700 = 0xbdfe5d4f;
          uStack_6fc = 0xbdfe5d4f;
          uStack_6f8 = 0xbdfe5d4f;
          uStack_6f4 = 0xbdfe5d4f;
          uStack_6f0 = 0xbdfe5d4f;
          uStack_6ec = 0xbdfe5d4f;
          uStack_6e8 = 0xbdfe5d4f;
          uStack_6e4 = 0xbdfe5d4f;
          local_6a0 = 0xbdfe5d4fbdfe5d4f;
          uStack_698 = 0xbdfe5d4fbdfe5d4f;
          uStack_690 = 0xbdfe5d4fbdfe5d4f;
          uStack_688 = 0xbdfe5d4fbdfe5d4f;
          local_660 = local_fc0;
          uStack_658 = uStack_fb8;
          uStack_650 = 0;
          uStack_648 = 0;
          local_680 = local_ec0;
          uStack_678 = uStack_eb8;
          uStack_670 = uStack_eb0;
          uStack_668 = uStack_ea8;
          auVar95._16_8_ = uStack_eb0;
          auVar95._0_16_ = _local_ec0;
          auVar95._24_8_ = uStack_ea8;
          auVar94._8_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar94._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar94._16_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar94._24_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar6 = vfmadd213ps_fma(auVar95,ZEXT1632(auVar6),auVar94);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_780 = local_fc0;
          uStack_778 = uStack_fb8;
          uStack_770 = 0;
          uStack_768 = 0;
          local_7a0 = local_ec0;
          uStack_798 = uStack_eb8;
          uStack_790 = uStack_eb0;
          uStack_788 = uStack_ea8;
          local_7c0 = 0x3e11e9bf;
          uStack_7bc = 0x3e11e9bf;
          uStack_7b8 = 0x3e11e9bf;
          uStack_7b4 = 0x3e11e9bf;
          uStack_7b0 = 0x3e11e9bf;
          uStack_7ac = 0x3e11e9bf;
          uStack_7a8 = 0x3e11e9bf;
          uStack_7a4 = 0x3e11e9bf;
          local_760 = 0x3e11e9bf3e11e9bf;
          uStack_758 = 0x3e11e9bf3e11e9bf;
          uStack_750 = 0x3e11e9bf3e11e9bf;
          uStack_748 = 0x3e11e9bf3e11e9bf;
          local_720 = local_fc0;
          uStack_718 = uStack_fb8;
          uStack_710 = 0;
          uStack_708 = 0;
          local_740 = local_ec0;
          uStack_738 = uStack_eb8;
          uStack_730 = uStack_eb0;
          uStack_728 = uStack_ea8;
          auVar93._16_8_ = uStack_eb0;
          auVar93._0_16_ = _local_ec0;
          auVar93._24_8_ = uStack_ea8;
          auVar92._8_8_ = 0x3e11e9bf3e11e9bf;
          auVar92._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar92._16_8_ = 0x3e11e9bf3e11e9bf;
          auVar92._24_8_ = 0x3e11e9bf3e11e9bf;
          auVar6 = vfmadd213ps_fma(auVar93,ZEXT1632(auVar6),auVar92);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_840 = local_fc0;
          uStack_838 = uStack_fb8;
          uStack_830 = 0;
          uStack_828 = 0;
          local_860 = local_ec0;
          uStack_858 = uStack_eb8;
          uStack_850 = uStack_eb0;
          uStack_848 = uStack_ea8;
          local_880 = 0xbe2aae50;
          uStack_87c = 0xbe2aae50;
          uStack_878 = 0xbe2aae50;
          uStack_874 = 0xbe2aae50;
          uStack_870 = 0xbe2aae50;
          uStack_86c = 0xbe2aae50;
          uStack_868 = 0xbe2aae50;
          uStack_864 = 0xbe2aae50;
          local_820 = 0xbe2aae50be2aae50;
          uStack_818 = 0xbe2aae50be2aae50;
          uStack_810 = 0xbe2aae50be2aae50;
          uStack_808 = 0xbe2aae50be2aae50;
          local_7e0 = local_fc0;
          uStack_7d8 = uStack_fb8;
          uStack_7d0 = 0;
          uStack_7c8 = 0;
          local_800 = local_ec0;
          uStack_7f8 = uStack_eb8;
          uStack_7f0 = uStack_eb0;
          uStack_7e8 = uStack_ea8;
          auVar91._16_8_ = uStack_eb0;
          auVar91._0_16_ = _local_ec0;
          auVar91._24_8_ = uStack_ea8;
          auVar90._8_8_ = 0xbe2aae50be2aae50;
          auVar90._0_8_ = 0xbe2aae50be2aae50;
          auVar90._16_8_ = 0xbe2aae50be2aae50;
          auVar90._24_8_ = 0xbe2aae50be2aae50;
          auVar6 = vfmadd213ps_fma(auVar91,ZEXT1632(auVar6),auVar90);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_900 = local_fc0;
          uStack_8f8 = uStack_fb8;
          uStack_8f0 = 0;
          uStack_8e8 = 0;
          local_920 = local_ec0;
          uStack_918 = uStack_eb8;
          uStack_910 = uStack_eb0;
          uStack_908 = uStack_ea8;
          local_940 = 0x3e4cceac;
          uStack_93c = 0x3e4cceac;
          uStack_938 = 0x3e4cceac;
          uStack_934 = 0x3e4cceac;
          uStack_930 = 0x3e4cceac;
          uStack_92c = 0x3e4cceac;
          uStack_928 = 0x3e4cceac;
          uStack_924 = 0x3e4cceac;
          local_8e0 = 0x3e4cceac3e4cceac;
          uStack_8d8 = 0x3e4cceac3e4cceac;
          uStack_8d0 = 0x3e4cceac3e4cceac;
          uStack_8c8 = 0x3e4cceac3e4cceac;
          local_8a0 = local_fc0;
          uStack_898 = uStack_fb8;
          uStack_890 = 0;
          uStack_888 = 0;
          local_8c0 = local_ec0;
          uStack_8b8 = uStack_eb8;
          uStack_8b0 = uStack_eb0;
          uStack_8a8 = uStack_ea8;
          auVar89._16_8_ = uStack_eb0;
          auVar89._0_16_ = _local_ec0;
          auVar89._24_8_ = uStack_ea8;
          auVar88._8_8_ = 0x3e4cceac3e4cceac;
          auVar88._0_8_ = 0x3e4cceac3e4cceac;
          auVar88._16_8_ = 0x3e4cceac3e4cceac;
          auVar88._24_8_ = 0x3e4cceac3e4cceac;
          auVar6 = vfmadd213ps_fma(auVar89,ZEXT1632(auVar6),auVar88);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_9c0 = local_fc0;
          uStack_9b8 = uStack_fb8;
          uStack_9b0 = 0;
          uStack_9a8 = 0;
          local_9e0 = local_ec0;
          uStack_9d8 = uStack_eb8;
          uStack_9d0 = uStack_eb0;
          uStack_9c8 = uStack_ea8;
          local_a00 = 0xbe7ffffc;
          uStack_9fc = 0xbe7ffffc;
          uStack_9f8 = 0xbe7ffffc;
          uStack_9f4 = 0xbe7ffffc;
          uStack_9f0 = 0xbe7ffffc;
          uStack_9ec = 0xbe7ffffc;
          uStack_9e8 = 0xbe7ffffc;
          uStack_9e4 = 0xbe7ffffc;
          local_9a0 = 0xbe7ffffcbe7ffffc;
          uStack_998 = 0xbe7ffffcbe7ffffc;
          uStack_990 = 0xbe7ffffcbe7ffffc;
          uStack_988 = 0xbe7ffffcbe7ffffc;
          local_960 = local_fc0;
          uStack_958 = uStack_fb8;
          uStack_950 = 0;
          uStack_948 = 0;
          local_980 = local_ec0;
          uStack_978 = uStack_eb8;
          uStack_970 = uStack_eb0;
          uStack_968 = uStack_ea8;
          auVar87._16_8_ = uStack_eb0;
          auVar87._0_16_ = _local_ec0;
          auVar87._24_8_ = uStack_ea8;
          auVar86._8_8_ = 0xbe7ffffcbe7ffffc;
          auVar86._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar86._16_8_ = 0xbe7ffffcbe7ffffc;
          auVar86._24_8_ = 0xbe7ffffcbe7ffffc;
          auVar6 = vfmadd213ps_fma(auVar87,ZEXT1632(auVar6),auVar86);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_a80 = local_fc0;
          uStack_a78 = uStack_fb8;
          uStack_a70 = 0;
          uStack_a68 = 0;
          local_aa0 = local_ec0;
          uStack_a98 = uStack_eb8;
          uStack_a90 = uStack_eb0;
          uStack_a88 = uStack_ea8;
          local_ac0 = 0x3eaaaaaa;
          uStack_abc = 0x3eaaaaaa;
          uStack_ab8 = 0x3eaaaaaa;
          uStack_ab4 = 0x3eaaaaaa;
          uStack_ab0 = 0x3eaaaaaa;
          uStack_aac = 0x3eaaaaaa;
          uStack_aa8 = 0x3eaaaaaa;
          uStack_aa4 = 0x3eaaaaaa;
          local_a60 = 0x3eaaaaaa3eaaaaaa;
          uStack_a58 = 0x3eaaaaaa3eaaaaaa;
          uStack_a50 = 0x3eaaaaaa3eaaaaaa;
          uStack_a48 = 0x3eaaaaaa3eaaaaaa;
          local_a20 = local_fc0;
          uStack_a18 = uStack_fb8;
          uStack_a10 = 0;
          uStack_a08 = 0;
          local_a40 = local_ec0;
          uStack_a38 = uStack_eb8;
          uStack_a30 = uStack_eb0;
          uStack_a28 = uStack_ea8;
          auVar85._16_8_ = uStack_eb0;
          auVar85._0_16_ = _local_ec0;
          auVar85._24_8_ = uStack_ea8;
          auVar84._8_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar84._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar84._16_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar84._24_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar6 = vfmadd213ps_fma(auVar85,ZEXT1632(auVar6),auVar84);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_d20 = local_fc0;
          uVar176 = local_d20;
          uStack_d18 = uStack_fb8;
          uVar177 = uStack_d18;
          uStack_d10 = 0;
          uStack_d08 = 0;
          local_d40 = local_ec0;
          uStack_d38 = uStack_eb8;
          uStack_d30 = uStack_eb0;
          uStack_d28 = uStack_ea8;
          local_d20._0_4_ = auVar6._0_4_;
          local_d20._4_4_ = auVar6._4_4_;
          uStack_d18._0_4_ = auVar6._8_4_;
          uStack_d18._4_4_ = auVar6._12_4_;
          local_fc0._4_4_ = local_d20._4_4_ * (float)local_ec0._4_4_;
          local_fc0._0_4_ = (float)local_d20 * (float)local_ec0._0_4_;
          uStack_fb8._0_4_ = (float)uStack_d18 * (float)uStack_dd8;
          uStack_fb8._4_4_ = uStack_d18._4_4_ * uStack_dd8._4_4_;
          uStack_fb0._0_4_ = (float)uStack_dd0 * 0.0;
          uStack_fb0._4_4_ = uStack_dd0._4_4_ * 0.0;
          auVar128 = _local_fc0;
          uStack_fb0 = auVar128._16_8_;
          uStack_fa8 = (ulong)(uint)((float)uStack_dc8 * 0.0);
          local_d80 = CONCAT44(fStack_f9c,local_fa0);
          uStack_d78 = CONCAT44(fStack_f94,fStack_f98);
          uStack_d70 = CONCAT44(fStack_f8c,fStack_f90);
          uStack_d68 = CONCAT44(fStack_f84,fStack_f88);
          local_d60 = local_fc0;
          uStack_d58 = uStack_fb8;
          uStack_d50 = uStack_fb0;
          uStack_d48 = uStack_fa8;
          fVar183 = (float)uStack_dc8 * 0.0 * fStack_f88;
          local_fc0._4_4_ = local_d20._4_4_ * (float)local_ec0._4_4_ * fStack_f9c;
          local_fc0._0_4_ = (float)local_d20 * (float)local_ec0._0_4_ * local_fa0;
          uStack_fb8._0_4_ = (float)uStack_d18 * (float)uStack_dd8 * fStack_f98;
          uStack_fb8._4_4_ = uStack_d18._4_4_ * uStack_dd8._4_4_ * fStack_f94;
          uStack_fb0._0_4_ = (float)uStack_dd0 * 0.0 * fStack_f90;
          uStack_fb0._4_4_ = uStack_dd0._4_4_ * 0.0 * fStack_f8c;
          auVar128 = _local_fc0;
          uStack_fb0 = auVar128._16_8_;
          uStack_fa8 = (ulong)(uint)fVar183;
          local_b40 = local_f40;
          uStack_b38 = uStack_f38;
          uStack_b30 = uStack_f30;
          uStack_b28 = uStack_f28;
          local_b60 = 0xb95e8083;
          uStack_b5c = 0xb95e8083;
          uStack_b58 = 0xb95e8083;
          uStack_b54 = 0xb95e8083;
          uStack_b50 = 0xb95e8083;
          uStack_b4c = 0xb95e8083;
          uStack_b48 = 0xb95e8083;
          uStack_b44 = 0xb95e8083;
          local_b80 = local_fc0;
          uStack_b78 = uStack_fb8;
          uStack_b70 = uStack_fb0;
          uStack_b68 = uStack_fa8;
          local_b00 = 0xb95e8083b95e8083;
          uStack_af8 = 0xb95e8083b95e8083;
          uStack_af0 = 0xb95e8083b95e8083;
          uStack_ae8 = 0xb95e8083b95e8083;
          local_ae0 = local_f40;
          uStack_ad8 = uStack_f38;
          uStack_ad0 = uStack_f30;
          uStack_ac8 = uStack_f28;
          local_b20 = local_fc0;
          uStack_b18 = uStack_fb8;
          uStack_b10 = uStack_fb0;
          uStack_b08 = uStack_fa8;
          auVar83._8_8_ = 0xb95e8083b95e8083;
          auVar83._0_8_ = 0xb95e8083b95e8083;
          auVar83._16_8_ = 0xb95e8083b95e8083;
          auVar83._24_8_ = 0xb95e8083b95e8083;
          auVar82._16_8_ = uStack_fb0;
          auVar82._0_16_ = _local_fc0;
          auVar82._24_4_ = fVar183;
          auVar82._28_4_ = 0;
          auVar6 = vfmadd213ps_fma(auVar83,_local_f40,auVar82);
          local_3c0 = CONCAT44(fStack_f9c,local_fa0);
          uStack_3b8 = CONCAT44(fStack_f94,fStack_f98);
          uStack_3b0 = CONCAT44(fStack_f8c,fStack_f90);
          uStack_3a8 = CONCAT44(fStack_f84,fStack_f88);
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_3e0 = 0x3f000000;
          uStack_3dc = 0x3f000000;
          uStack_3d8 = 0x3f000000;
          uStack_3d4 = 0x3f000000;
          uStack_3d0 = 0x3f000000;
          uStack_3cc = 0x3f000000;
          uStack_3c8 = 0x3f000000;
          uStack_3c4 = 0x3f000000;
          local_400 = local_fc0;
          uStack_3f8 = uStack_fb8;
          uStack_3f0 = 0;
          uStack_3e8 = 0;
          local_380 = 0x3f0000003f000000;
          uStack_378 = 0x3f0000003f000000;
          uStack_370 = 0x3f0000003f000000;
          uStack_368 = 0x3f0000003f000000;
          local_3a0 = local_fc0;
          uStack_398 = uStack_fb8;
          uStack_390 = 0;
          uStack_388 = 0;
          auVar104._8_8_ = uStack_3b8;
          auVar104._0_8_ = local_3c0;
          auVar104._16_8_ = uStack_3b0;
          auVar104._24_8_ = uStack_3a8;
          auVar103._8_8_ = 0x3f0000003f000000;
          auVar103._0_8_ = 0x3f0000003f000000;
          auVar103._16_8_ = 0x3f0000003f000000;
          auVar103._24_8_ = 0x3f0000003f000000;
          auVar6 = vfnmadd213ps_fma(auVar103,auVar104,ZEXT1632(auVar6));
          local_fc0 = auVar6._0_8_;
          uStack_fb8 = auVar6._8_8_;
          local_e20 = local_ec0;
          uStack_e18 = uStack_eb8;
          uStack_e10 = uStack_eb0;
          uStack_e08 = uStack_ea8;
          local_e40 = local_fc0;
          uVar162 = local_e40;
          uStack_e38 = uStack_fb8;
          uVar163 = uStack_e38;
          uStack_e30 = 0;
          uStack_e28 = 0;
          local_e40._0_4_ = auVar6._0_4_;
          local_e40._4_4_ = auVar6._4_4_;
          uStack_e38._0_4_ = auVar6._8_4_;
          uStack_e38._4_4_ = auVar6._12_4_;
          local_ec0._4_4_ = (float)local_ec0._4_4_ + local_e40._4_4_;
          local_ec0._0_4_ = (float)local_ec0._0_4_ + (float)local_e40;
          uStack_eb8._0_4_ = (float)uStack_dd8 + (float)uStack_e38;
          uStack_eb8._4_4_ = uStack_dd8._4_4_ + uStack_e38._4_4_;
          uStack_eb0._0_4_ = (float)uStack_dd0 + 0.0;
          uStack_eb0._4_4_ = uStack_dd0._4_4_ + 0.0;
          auVar128 = _local_ec0;
          uStack_ea8._0_4_ = (float)uStack_dc8 + 0.0;
          uStack_ea8._4_4_ = fStack_f84 + 0.0;
          auVar4 = _local_ec0;
          uStack_eb0 = auVar128._16_8_;
          uStack_ea8 = auVar4._24_8_;
          local_c00 = local_f40;
          uStack_bf8 = uStack_f38;
          uStack_bf0 = uStack_f30;
          uStack_be8 = uStack_f28;
          local_c20 = 0x3f318000;
          uStack_c1c = 0x3f318000;
          uStack_c18 = 0x3f318000;
          uStack_c14 = 0x3f318000;
          uStack_c10 = 0x3f318000;
          uStack_c0c = 0x3f318000;
          uStack_c08 = 0x3f318000;
          uStack_c04 = 0x3f318000;
          local_c40 = local_ec0;
          uStack_c38 = uStack_eb8;
          uStack_c30 = uStack_eb0;
          uStack_c28 = uStack_ea8;
          local_bc0 = 0x3f3180003f318000;
          uStack_bb8 = 0x3f3180003f318000;
          uStack_bb0 = 0x3f3180003f318000;
          uStack_ba8 = 0x3f3180003f318000;
          local_ba0 = local_f40;
          uStack_b98 = uStack_f38;
          uStack_b90 = uStack_f30;
          uStack_b88 = uStack_f28;
          local_be0 = local_ec0;
          uStack_bd8 = uStack_eb8;
          uStack_bd0 = uStack_eb0;
          uStack_bc8 = uStack_ea8;
          auVar81._8_8_ = 0x3f3180003f318000;
          auVar81._0_8_ = 0x3f3180003f318000;
          auVar81._16_8_ = 0x3f3180003f318000;
          auVar81._24_8_ = 0x3f3180003f318000;
          auVar80._16_8_ = uStack_eb0;
          auVar80._0_16_ = _local_ec0;
          auVar80._24_8_ = uStack_ea8;
          auVar1 = vfmadd213ps_fma(auVar81,_local_f40,auVar80);
          local_ec0 = auVar1._0_8_;
          uStack_eb8 = auVar1._8_8_;
          local_260 = local_ec0;
          uStack_258 = uStack_eb8;
          uStack_250 = 0;
          uStack_248 = 0;
          local_280 = local_f20._0_8_;
          uStack_278 = local_f20._8_8_;
          uStack_270 = local_f20._16_8_;
          uStack_268 = local_f20._24_8_;
          _local_fc0 = vpor_avx2(ZEXT1632(auVar1),local_f20);
          local_1d20 = local_fc0;
          uStack_1d18 = uStack_fb8;
          uStack_1d10 = uStack_fb0;
          uStack_1d08 = uStack_fa8;
          local_1ce4 = 0x3f800000;
          local_1b64 = 0x3f800000;
          local_1b68 = 0x3f800000;
          local_1b6c = 0x3f800000;
          local_1b70 = 0x3f800000;
          local_1b74 = 0x3f800000;
          local_1b78 = 0x3f800000;
          local_1b7c = 0x3f800000;
          local_1b80 = 0x3f800000;
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          local_1ba0 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auStack_1b90 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          local_1d40 = local_1ba0._0_8_;
          uStack_1d38 = local_1ba0._8_8_;
          uStack_1d30 = auStack_1b90._0_8_;
          uStack_1d28 = auStack_1b90._8_8_;
          local_1ce8 = 0x40000000;
          local_1b24 = 0x40000000;
          local_1b28 = 0x40000000;
          local_1b2c = 0x40000000;
          local_1b30 = 0x40000000;
          local_1b34 = 0x40000000;
          local_1b38 = 0x40000000;
          local_1b3c = 0x40000000;
          local_1b40 = 0x40000000;
          auVar6 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x20);
          local_1b60 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x20);
          auStack_1b50 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x30);
          local_1d60 = local_1b60._0_8_;
          uStack_1d58 = local_1b60._8_8_;
          uStack_1d50 = auStack_1b50._0_8_;
          uStack_1d48 = auStack_1b50._8_8_;
          local_1c00 = local_fc0;
          uVar144 = local_1c00;
          uStack_1bf8 = uStack_fb8;
          uVar145 = uStack_1bf8;
          uStack_1bf0 = uStack_fb0;
          uVar146 = uStack_1bf0;
          uStack_1be8 = uStack_fa8;
          uVar147 = uStack_1be8;
          local_1c20 = local_1b60._0_8_;
          uVar140 = local_1c20;
          uStack_1c18 = local_1b60._8_8_;
          uVar141 = uStack_1c18;
          uStack_1c10 = auStack_1b50._0_8_;
          uVar142 = uStack_1c10;
          uStack_1c08 = auStack_1b50._8_8_;
          uVar143 = uStack_1c08;
          local_1c00._0_4_ = local_fc0._0_4_;
          local_1c00._4_4_ = local_fc0._4_4_;
          uStack_1bf8._0_4_ = local_fc0._8_4_;
          uStack_1bf8._4_4_ = local_fc0._12_4_;
          uStack_1bf0._0_4_ = local_fc0._16_4_;
          uStack_1bf0._4_4_ = local_fc0._20_4_;
          uStack_1be8._0_4_ = local_fc0._24_4_;
          uStack_1be8._4_4_ = local_fc0._28_4_;
          local_1c20._0_4_ = local_1b60._0_4_;
          local_1c20._4_4_ = local_1b60._4_4_;
          uStack_1c18._0_4_ = local_1b60._8_4_;
          uStack_1c18._4_4_ = local_1b60._12_4_;
          uStack_1c10._0_4_ = auStack_1b50._0_4_;
          uStack_1c10._4_4_ = auStack_1b50._4_4_;
          uStack_1c08._0_4_ = auStack_1b50._8_4_;
          local_1cc0 = (float)local_1c00 * (float)local_1c20;
          fStack_1cbc = local_1c00._4_4_ * local_1c20._4_4_;
          fStack_1cb8 = (float)uStack_1bf8 * (float)uStack_1c18;
          fStack_1cb4 = uStack_1bf8._4_4_ * uStack_1c18._4_4_;
          fStack_1cb0 = (float)uStack_1bf0 * (float)uStack_1c10;
          fStack_1cac = uStack_1bf0._4_4_ * uStack_1c10._4_4_;
          fStack_1ca8 = (float)uStack_1be8 * (float)uStack_1c08;
          uStack_1ca4 = uStack_1be8._4_4_;
          local_1c64 = 0x3f800000;
          local_1ba4 = 0x3f800000;
          local_1ba8 = 0x3f800000;
          local_1bac = 0x3f800000;
          local_1bb0 = 0x3f800000;
          local_1bb4 = 0x3f800000;
          local_1bb8 = 0x3f800000;
          local_1bbc = 0x3f800000;
          local_1bc0 = 0x3f800000;
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          local_1be0 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auStack_1bd0 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          local_1ce0 = local_1be0._0_8_;
          uVar136 = local_1ce0;
          uStack_1cd8 = local_1be0._8_8_;
          uVar137 = uStack_1cd8;
          uStack_1cd0 = auStack_1bd0._0_8_;
          uVar138 = uStack_1cd0;
          uStack_1cc8 = auStack_1bd0._8_8_;
          uVar139 = uStack_1cc8;
          local_1ce0._0_4_ = local_1be0._0_4_;
          local_1ce0._4_4_ = local_1be0._4_4_;
          uStack_1cd8._0_4_ = local_1be0._8_4_;
          uStack_1cd8._4_4_ = local_1be0._12_4_;
          uStack_1cd0._0_4_ = auStack_1bd0._0_4_;
          uStack_1cd0._4_4_ = auStack_1bd0._4_4_;
          uStack_1cc8._0_4_ = auStack_1bd0._8_4_;
          uStack_1cc8._4_4_ = auStack_1bd0._12_4_;
          local_1ca0 = 0;
          uStack_1c98 = 0;
          uStack_1c90 = 0;
          uStack_1c88 = 0;
          local_1840 = CONCAT44(fStack_1cbc,local_1cc0);
          uStack_1838 = CONCAT44(fStack_1cb4,fStack_1cb8);
          uStack_1830 = CONCAT44(fStack_1cac,fStack_1cb0);
          uStack_1828 = CONCAT44(uStack_1be8._4_4_,fStack_1ca8);
          local_1820 = 0;
          uStack_1818 = 0;
          uStack_1810 = 0;
          uStack_1808 = 0;
          auVar62._8_8_ = uStack_1838;
          auVar62._0_8_ = local_1840;
          auVar62._16_8_ = uStack_1830;
          auVar62._24_8_ = uStack_1828;
          auVar4 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar62);
          local_19e0 = 0;
          uStack_19d8 = 0;
          uStack_19d0 = 0;
          uStack_19c8 = 0;
          local_1a80 = 0x3f800000;
          uStack_1a7c = 0x3f800000;
          uStack_1a78 = 0x3f800000;
          uStack_1a74 = 0x3f800000;
          uStack_1a70 = 0x3f800000;
          uStack_1a6c = 0x3f800000;
          uStack_1a68 = 0x3f800000;
          uStack_1a64 = 0x3f800000;
          local_1a00._0_8_ = auVar4._0_8_;
          local_1a00._8_8_ = auVar4._8_8_;
          local_1a00._16_8_ = auVar4._16_8_;
          local_1a00._24_8_ = auVar4._24_8_;
          local_1960 = local_1a00._0_8_;
          uStack_1958 = local_1a00._8_8_;
          uStack_1950 = local_1a00._16_8_;
          uStack_1948 = local_1a00._24_8_;
          local_1980 = 0x42b0c0a5;
          uStack_197c = 0x42b0c0a5;
          uStack_1978 = 0x42b0c0a5;
          uStack_1974 = 0x42b0c0a5;
          uStack_1970 = 0x42b0c0a5;
          uStack_196c = 0x42b0c0a5;
          uStack_1968 = 0x42b0c0a5;
          uStack_1964 = 0x42b0c0a5;
          auVar61._8_4_ = 0x42b0c0a5;
          auVar61._0_8_ = 0x42b0c0a542b0c0a5;
          auVar61._12_4_ = 0x42b0c0a5;
          auVar61._16_4_ = 0x42b0c0a5;
          auVar61._20_4_ = 0x42b0c0a5;
          auVar61._24_4_ = 0x42b0c0a5;
          auVar61._28_4_ = 0x42b0c0a5;
          auVar4 = vminps_avx(auVar4,auVar61);
          local_1a00._0_8_ = auVar4._0_8_;
          local_1a00._8_8_ = auVar4._8_8_;
          local_1a00._16_8_ = auVar4._16_8_;
          local_1a00._24_8_ = auVar4._24_8_;
          local_19a0 = local_1a00._0_8_;
          uStack_1998 = local_1a00._8_8_;
          uStack_1990 = local_1a00._16_8_;
          uStack_1988 = local_1a00._24_8_;
          local_19c0 = 0xc2b0c0a5;
          uStack_19bc = 0xc2b0c0a5;
          uStack_19b8 = 0xc2b0c0a5;
          uStack_19b4 = 0xc2b0c0a5;
          uStack_19b0 = 0xc2b0c0a5;
          uStack_19ac = 0xc2b0c0a5;
          uStack_19a8 = 0xc2b0c0a5;
          uStack_19a4 = 0xc2b0c0a5;
          auVar60._8_4_ = 0xc2b0c0a5;
          auVar60._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar60._12_4_ = 0xc2b0c0a5;
          auVar60._16_4_ = 0xc2b0c0a5;
          auVar60._20_4_ = 0xc2b0c0a5;
          auVar60._24_4_ = 0xc2b0c0a5;
          auVar60._28_4_ = 0xc2b0c0a5;
          auVar3 = vmaxps_avx(auVar4,auVar60);
          local_1a00._0_8_ = auVar3._0_8_;
          local_1a00._8_8_ = auVar3._8_8_;
          local_1a00._16_8_ = auVar3._16_8_;
          local_1a00._24_8_ = auVar3._24_8_;
          local_1340 = local_1a00._0_8_;
          uStack_1338 = local_1a00._8_8_;
          uStack_1330 = local_1a00._16_8_;
          uStack_1328 = local_1a00._24_8_;
          local_1360 = 0x3fb8aa3b;
          uStack_135c = 0x3fb8aa3b;
          uStack_1358 = 0x3fb8aa3b;
          uStack_1354 = 0x3fb8aa3b;
          uStack_1350 = 0x3fb8aa3b;
          uStack_134c = 0x3fb8aa3b;
          uStack_1348 = 0x3fb8aa3b;
          uStack_1344 = 0x3fb8aa3b;
          local_1380 = 0x3f000000;
          uStack_137c = 0x3f000000;
          uStack_1378 = 0x3f000000;
          uStack_1374 = 0x3f000000;
          uStack_1370 = 0x3f000000;
          uStack_136c = 0x3f000000;
          uStack_1368 = 0x3f000000;
          uStack_1364 = 0x3f000000;
          local_1300 = 0x3fb8aa3b3fb8aa3b;
          uStack_12f8 = 0x3fb8aa3b3fb8aa3b;
          uStack_12f0 = 0x3fb8aa3b3fb8aa3b;
          uStack_12e8 = 0x3fb8aa3b3fb8aa3b;
          local_1320 = 0x3f0000003f000000;
          uStack_1318 = 0x3f0000003f000000;
          uStack_1310 = 0x3f0000003f000000;
          uStack_1308 = 0x3f0000003f000000;
          local_12e0 = local_1a00._0_8_;
          uStack_12d8 = local_1a00._8_8_;
          uStack_12d0 = local_1a00._16_8_;
          uStack_12c8 = local_1a00._24_8_;
          auVar70._8_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar70._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar70._16_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar70._24_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar69._8_8_ = 0x3f0000003f000000;
          auVar69._0_8_ = 0x3f0000003f000000;
          auVar69._16_8_ = 0x3f0000003f000000;
          auVar69._24_8_ = 0x3f0000003f000000;
          auVar6 = vfmadd213ps_fma(auVar70,auVar3,auVar69);
          auVar5 = vroundps_avx(ZEXT1632(auVar6),1);
          auVar4 = vcmpps_avx(ZEXT1632(auVar6),auVar5,1);
          local_1aa0._0_8_ = auVar4._0_8_;
          local_1aa0._8_8_ = auVar4._8_8_;
          local_1aa0._16_8_ = auVar4._16_8_;
          local_1aa0._24_8_ = auVar4._24_8_;
          local_12c0 = 0x3f8000003f800000;
          uStack_12b8 = 0x3f8000003f800000;
          uStack_12b0 = 0x3f8000003f800000;
          uStack_12a8 = 0x3f8000003f800000;
          local_12a0 = local_1aa0._0_8_;
          uStack_1298 = local_1aa0._8_8_;
          uStack_1290 = local_1aa0._16_8_;
          uStack_1288 = local_1aa0._24_8_;
          auVar71._8_8_ = 0x3f8000003f800000;
          auVar71._0_8_ = 0x3f8000003f800000;
          auVar71._16_8_ = 0x3f8000003f800000;
          auVar71._24_8_ = 0x3f8000003f800000;
          local_1aa0 = vpand_avx2(auVar4,auVar71);
          local_1a20 = auVar5._0_8_;
          uStack_1a18 = auVar5._8_8_;
          uStack_1a10 = auVar5._16_8_;
          uStack_1a08 = auVar5._24_8_;
          local_1860 = local_1a20;
          uStack_1858 = uStack_1a18;
          uStack_1850 = uStack_1a10;
          uStack_1848 = uStack_1a08;
          local_1880 = local_1aa0._0_8_;
          uStack_1878 = local_1aa0._8_8_;
          uStack_1870 = local_1aa0._16_8_;
          uStack_1868 = local_1aa0._24_8_;
          local_1a40 = vsubps_avx(auVar5,local_1aa0);
          local_11e0 = local_1a40._0_8_;
          uStack_11d8 = local_1a40._8_8_;
          uStack_11d0 = local_1a40._16_8_;
          uStack_11c8 = local_1a40._24_8_;
          local_1200 = 0x3f318000;
          uStack_11fc = 0x3f318000;
          uStack_11f8 = 0x3f318000;
          uStack_11f4 = 0x3f318000;
          uStack_11f0 = 0x3f318000;
          uStack_11ec = 0x3f318000;
          uStack_11e8 = 0x3f318000;
          uStack_11e4 = 0x3f318000;
          local_1220 = local_1a00._0_8_;
          uStack_1218 = local_1a00._8_8_;
          uStack_1210 = local_1a00._16_8_;
          uStack_1208 = local_1a00._24_8_;
          local_10e0 = 0x3f3180003f318000;
          uStack_10d8 = 0x3f3180003f318000;
          uStack_10d0 = 0x3f3180003f318000;
          uStack_10c8 = 0x3f3180003f318000;
          local_10c0 = local_1a40._0_8_;
          uStack_10b8 = local_1a40._8_8_;
          uStack_10b0 = local_1a40._16_8_;
          uStack_10a8 = local_1a40._24_8_;
          local_1100 = local_1a00._0_8_;
          uStack_10f8 = local_1a00._8_8_;
          uStack_10f0 = local_1a00._16_8_;
          uStack_10e8 = local_1a00._24_8_;
          auVar72._8_8_ = 0x3f3180003f318000;
          auVar72._0_8_ = 0x3f3180003f318000;
          auVar72._16_8_ = 0x3f3180003f318000;
          auVar72._24_8_ = 0x3f3180003f318000;
          auVar6 = vfnmadd213ps_fma(auVar72,local_1a40,auVar3);
          local_1a00._0_8_ = auVar6._0_8_;
          local_1a00._8_8_ = auVar6._8_8_;
          local_1240 = local_1a40._0_8_;
          uStack_1238 = local_1a40._8_8_;
          uStack_1230 = local_1a40._16_8_;
          uStack_1228 = local_1a40._24_8_;
          local_1260 = 0xb95e8083;
          uStack_125c = 0xb95e8083;
          uStack_1258 = 0xb95e8083;
          uStack_1254 = 0xb95e8083;
          uStack_1250 = 0xb95e8083;
          uStack_124c = 0xb95e8083;
          uStack_1248 = 0xb95e8083;
          uStack_1244 = 0xb95e8083;
          local_1280 = local_1a00._0_8_;
          uStack_1278 = local_1a00._8_8_;
          uStack_1270 = 0;
          uStack_1268 = 0;
          local_1080 = 0xb95e8083b95e8083;
          uStack_1078 = 0xb95e8083b95e8083;
          uStack_1070 = 0xb95e8083b95e8083;
          uStack_1068 = 0xb95e8083b95e8083;
          local_1060 = local_1a40._0_8_;
          uStack_1058 = local_1a40._8_8_;
          uStack_1050 = local_1a40._16_8_;
          uStack_1048 = local_1a40._24_8_;
          local_10a0 = local_1a00._0_8_;
          uStack_1098 = local_1a00._8_8_;
          uStack_1090 = 0;
          uStack_1088 = 0;
          auVar73._8_8_ = 0xb95e8083b95e8083;
          auVar73._0_8_ = 0xb95e8083b95e8083;
          auVar73._16_8_ = 0xb95e8083b95e8083;
          auVar73._24_8_ = 0xb95e8083b95e8083;
          auVar2 = vfnmadd213ps_fma(auVar73,local_1a40,ZEXT1632(auVar6));
          local_1a00._0_8_ = auVar2._0_8_;
          local_1a00._8_8_ = auVar2._8_8_;
          local_18a0 = local_1a00._0_8_;
          uVar156 = local_18a0;
          uStack_1898 = local_1a00._8_8_;
          uVar157 = uStack_1898;
          uStack_1890 = 0;
          uStack_1888 = 0;
          local_18c0 = local_1a00._0_8_;
          uStack_18b8 = local_1a00._8_8_;
          uStack_18b0 = 0;
          uStack_18a8 = 0;
          local_18a0._0_4_ = auVar2._0_4_;
          local_18a0._4_4_ = auVar2._4_4_;
          uStack_1898._0_4_ = auVar2._8_4_;
          uStack_1898._4_4_ = auVar2._12_4_;
          local_1a20._4_4_ = local_18a0._4_4_ * local_18a0._4_4_;
          local_1a20._0_4_ = (float)local_18a0 * (float)local_18a0;
          local_17e0 = local_1a20;
          uStack_1a18._0_4_ = (float)uStack_1898 * (float)uStack_1898;
          uStack_1a18._4_4_ = uStack_1898._4_4_ * uStack_1898._4_4_;
          auVar149 = _local_1a20;
          _local_1a20 = ZEXT1632(_local_1a20);
          auVar5 = _local_1a20;
          uStack_1ab8._0_4_ = 0x39506967;
          local_1ac0 = (undefined1  [8])0x3950696739506967;
          uStack_1ab8._4_4_ = 0x39506967;
          uStack_1ab0._0_4_ = 0x39506967;
          uStack_1ab0._4_4_ = 0x39506967;
          auVar128 = _local_1ac0;
          uStack_1aa8._0_4_ = 0x39506967;
          uStack_1aa8._4_4_ = 0x39506967;
          auVar4 = _local_1ac0;
          uStack_1ab0 = auVar128._16_8_;
          uStack_1aa8 = auVar4._24_8_;
          local_1400 = 0x3950696739506967;
          uStack_13f8 = uStack_1ab8;
          uStack_13f0 = uStack_1ab0;
          uStack_13e8 = uStack_1aa8;
          local_1420 = local_1a00._0_8_;
          uStack_1418 = local_1a00._8_8_;
          uStack_1410 = 0;
          uStack_1408 = 0;
          local_1440 = 0x3ab743ce;
          uStack_143c = 0x3ab743ce;
          uStack_1438 = 0x3ab743ce;
          uStack_1434 = 0x3ab743ce;
          uStack_1430 = 0x3ab743ce;
          uStack_142c = 0x3ab743ce;
          uStack_1428 = 0x3ab743ce;
          uStack_1424 = 0x3ab743ce;
          local_13e0 = 0x3ab743ce3ab743ce;
          uStack_13d8 = 0x3ab743ce3ab743ce;
          uStack_13d0 = 0x3ab743ce3ab743ce;
          uStack_13c8 = 0x3ab743ce3ab743ce;
          local_13a0 = 0x3950696739506967;
          uStack_1398 = uStack_1ab8;
          uStack_1390 = uStack_1ab0;
          uStack_1388 = uStack_1aa8;
          local_13c0 = local_1a00._0_8_;
          uStack_13b8 = local_1a00._8_8_;
          uStack_13b0 = 0;
          uStack_13a8 = 0;
          auVar68._16_8_ = uStack_1ab0;
          auVar68._0_16_ = _local_1ac0;
          auVar68._24_8_ = uStack_1aa8;
          auVar67._8_8_ = 0x3ab743ce3ab743ce;
          auVar67._0_8_ = 0x3ab743ce3ab743ce;
          auVar67._16_8_ = 0x3ab743ce3ab743ce;
          auVar67._24_8_ = 0x3ab743ce3ab743ce;
          auVar6 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar68,auVar67);
          local_1ac0 = auVar6._0_8_;
          uStack_1ab8 = auVar6._8_8_;
          local_14c0 = local_1ac0;
          uStack_14b8 = uStack_1ab8;
          uStack_14b0 = 0;
          uStack_14a8 = 0;
          local_14e0 = local_1a00._0_8_;
          uStack_14d8 = local_1a00._8_8_;
          uStack_14d0 = 0;
          uStack_14c8 = 0;
          local_1500 = 0x3c088908;
          uStack_14fc = 0x3c088908;
          uStack_14f8 = 0x3c088908;
          uStack_14f4 = 0x3c088908;
          uStack_14f0 = 0x3c088908;
          uStack_14ec = 0x3c088908;
          uStack_14e8 = 0x3c088908;
          uStack_14e4 = 0x3c088908;
          local_14a0 = 0x3c0889083c088908;
          uStack_1498 = 0x3c0889083c088908;
          uStack_1490 = 0x3c0889083c088908;
          uStack_1488 = 0x3c0889083c088908;
          local_1460 = local_1ac0;
          uStack_1458 = uStack_1ab8;
          uStack_1450 = 0;
          uStack_1448 = 0;
          local_1480 = local_1a00._0_8_;
          uStack_1478 = local_1a00._8_8_;
          uStack_1470 = 0;
          uStack_1468 = 0;
          auVar66._8_8_ = 0x3c0889083c088908;
          auVar66._0_8_ = 0x3c0889083c088908;
          auVar66._16_8_ = 0x3c0889083c088908;
          auVar66._24_8_ = 0x3c0889083c088908;
          auVar6 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar6),auVar66);
          local_1ac0 = auVar6._0_8_;
          uStack_1ab8 = auVar6._8_8_;
          local_1580 = local_1ac0;
          uStack_1578 = uStack_1ab8;
          uStack_1570 = 0;
          uStack_1568 = 0;
          local_15a0 = local_1a00._0_8_;
          uStack_1598 = local_1a00._8_8_;
          uStack_1590 = 0;
          uStack_1588 = 0;
          local_15c0 = 0x3d2aa9c1;
          uStack_15bc = 0x3d2aa9c1;
          uStack_15b8 = 0x3d2aa9c1;
          uStack_15b4 = 0x3d2aa9c1;
          uStack_15b0 = 0x3d2aa9c1;
          uStack_15ac = 0x3d2aa9c1;
          uStack_15a8 = 0x3d2aa9c1;
          uStack_15a4 = 0x3d2aa9c1;
          local_1560 = 0x3d2aa9c13d2aa9c1;
          uStack_1558 = 0x3d2aa9c13d2aa9c1;
          uStack_1550 = 0x3d2aa9c13d2aa9c1;
          uStack_1548 = 0x3d2aa9c13d2aa9c1;
          local_1520 = local_1ac0;
          uStack_1518 = uStack_1ab8;
          uStack_1510 = 0;
          uStack_1508 = 0;
          local_1540 = local_1a00._0_8_;
          uStack_1538 = local_1a00._8_8_;
          uStack_1530 = 0;
          uStack_1528 = 0;
          auVar65._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar65._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar65._16_8_ = 0x3d2aa9c13d2aa9c1;
          auVar65._24_8_ = 0x3d2aa9c13d2aa9c1;
          auVar6 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar6),auVar65);
          local_1ac0 = auVar6._0_8_;
          uStack_1ab8 = auVar6._8_8_;
          local_1640 = local_1ac0;
          uStack_1638 = uStack_1ab8;
          uStack_1630 = 0;
          uStack_1628 = 0;
          local_1660 = local_1a00._0_8_;
          uStack_1658 = local_1a00._8_8_;
          uStack_1650 = 0;
          uStack_1648 = 0;
          local_1680 = 0x3e2aaaaa;
          uStack_167c = 0x3e2aaaaa;
          uStack_1678 = 0x3e2aaaaa;
          uStack_1674 = 0x3e2aaaaa;
          uStack_1670 = 0x3e2aaaaa;
          uStack_166c = 0x3e2aaaaa;
          uStack_1668 = 0x3e2aaaaa;
          uStack_1664 = 0x3e2aaaaa;
          local_1620 = 0x3e2aaaaa3e2aaaaa;
          uStack_1618 = 0x3e2aaaaa3e2aaaaa;
          uStack_1610 = 0x3e2aaaaa3e2aaaaa;
          uStack_1608 = 0x3e2aaaaa3e2aaaaa;
          local_15e0 = local_1ac0;
          uStack_15d8 = uStack_1ab8;
          uStack_15d0 = 0;
          uStack_15c8 = 0;
          local_1600 = local_1a00._0_8_;
          uStack_15f8 = local_1a00._8_8_;
          uStack_15f0 = 0;
          uStack_15e8 = 0;
          auVar64._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar64._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar64._16_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar64._24_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar6 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar6),auVar64);
          local_1ac0 = auVar6._0_8_;
          uStack_1ab8 = auVar6._8_8_;
          local_1700 = local_1ac0;
          uStack_16f8 = uStack_1ab8;
          uStack_16f0 = 0;
          uStack_16e8 = 0;
          local_1720 = local_1a00._0_8_;
          uStack_1718 = local_1a00._8_8_;
          uStack_1710 = 0;
          uStack_1708 = 0;
          local_1740 = 0x3f000000;
          uStack_173c = 0x3f000000;
          uStack_1738 = 0x3f000000;
          uStack_1734 = 0x3f000000;
          uStack_1730 = 0x3f000000;
          uStack_172c = 0x3f000000;
          uStack_1728 = 0x3f000000;
          uStack_1724 = 0x3f000000;
          local_16e0 = 0x3f0000003f000000;
          uStack_16d8 = 0x3f0000003f000000;
          uStack_16d0 = 0x3f0000003f000000;
          uStack_16c8 = 0x3f0000003f000000;
          local_16a0 = local_1ac0;
          uStack_1698 = uStack_1ab8;
          uStack_1690 = 0;
          uStack_1688 = 0;
          local_16c0 = local_1a00._0_8_;
          uStack_16b8 = local_1a00._8_8_;
          uStack_16b0 = 0;
          uStack_16a8 = 0;
          auVar63._8_8_ = 0x3f0000003f000000;
          auVar63._0_8_ = 0x3f0000003f000000;
          auVar63._16_8_ = 0x3f0000003f000000;
          auVar63._24_8_ = 0x3f0000003f000000;
          auVar6 = vfmadd213ps_fma(ZEXT1632(auVar2),ZEXT1632(auVar6),auVar63);
          local_1ac0 = auVar6._0_8_;
          uStack_1ab8 = auVar6._8_8_;
          uStack_1a18 = auVar149._8_8_;
          local_17c0 = local_1ac0;
          uStack_17b8 = uStack_1ab8;
          uStack_17b0 = 0;
          uStack_17a8 = 0;
          uStack_17d8 = uStack_1a18;
          uStack_17d0 = 0;
          uStack_17c8 = 0;
          local_1800 = local_1a00._0_8_;
          uStack_17f8 = local_1a00._8_8_;
          uStack_17f0 = 0;
          uStack_17e8 = 0;
          local_1760 = local_1ac0;
          uStack_1758 = uStack_1ab8;
          uStack_1750 = 0;
          uStack_1748 = 0;
          local_1780 = local_17e0;
          uStack_1778 = uStack_1a18;
          uStack_1770 = 0;
          uStack_1768 = 0;
          local_17a0 = local_1a00._0_8_;
          uStack_1798 = local_1a00._8_8_;
          uStack_1790 = 0;
          uStack_1788 = 0;
          auVar6 = vfmadd213ps_fma(ZEXT1632(auVar149),ZEXT1632(auVar6),ZEXT1632(auVar2));
          local_1ac0 = auVar6._0_8_;
          uStack_1ab8 = auVar6._8_8_;
          local_1940 = 0x3f8000003f800000;
          uStack_1938 = 0x3f8000003f800000;
          uStack_1930 = 0x3f8000003f800000;
          uStack_1928 = 0x3f8000003f800000;
          local_1920 = local_1ac0;
          uVar150 = local_1920;
          uStack_1918 = uStack_1ab8;
          uVar151 = uStack_1918;
          uStack_1910 = 0;
          uStack_1908 = 0;
          local_1920._0_4_ = auVar6._0_4_;
          local_1920._4_4_ = auVar6._4_4_;
          uStack_1918._0_4_ = auVar6._8_4_;
          uStack_1918._4_4_ = auVar6._12_4_;
          local_1ac0._4_4_ = local_1920._4_4_ + 1.0;
          local_1ac0._0_4_ = (float)local_1920 + 1.0;
          uStack_1ab8._0_4_ = (float)uStack_1918 + 1.0;
          uStack_1ab8._4_4_ = uStack_1918._4_4_ + 1.0;
          uStack_1ab0._0_4_ = 0x3f800000;
          uStack_1ab0._4_4_ = 0x3f800000;
          auVar128 = _local_1ac0;
          uStack_1aa8._0_4_ = 0x3f800000;
          uStack_1aa8._4_4_ = 0x3f800000;
          auVar3 = _local_1ac0;
          local_11c0 = local_1a40._0_8_;
          uVar158 = local_11c0;
          uStack_11b8 = local_1a40._8_8_;
          uVar159 = uStack_11b8;
          uStack_11b0 = local_1a40._16_8_;
          uVar160 = uStack_11b0;
          uStack_11a8 = local_1a40._24_8_;
          uVar161 = uStack_11a8;
          local_11c0._0_4_ = local_1a40._0_4_;
          local_11c0._4_4_ = local_1a40._4_4_;
          uStack_11b8._0_4_ = local_1a40._8_4_;
          uStack_11b8._4_4_ = local_1a40._12_4_;
          uStack_11b0._0_4_ = local_1a40._16_4_;
          uStack_11b0._4_4_ = local_1a40._20_4_;
          uStack_11a8._0_4_ = local_1a40._24_4_;
          uStack_11a8._4_4_ = local_1a40._28_4_;
          local_1a60._4_4_ = (int)local_11c0._4_4_;
          local_1a60._0_4_ = (int)(float)local_11c0;
          local_1a60._8_4_ = (int)(float)uStack_11b8;
          local_1a60._12_4_ = (int)uStack_11b8._4_4_;
          local_1a60._16_4_ = (int)(float)uStack_11b0;
          local_1a60._20_4_ = (int)uStack_11b0._4_4_;
          auVar148 = local_1a60._0_24_;
          local_1a60._24_4_ = (int)(float)uStack_11a8;
          local_1a60._28_4_ = (int)uStack_11a8._4_4_;
          auVar4 = local_1a60;
          local_1a60._16_8_ = auVar148._16_8_;
          local_1a60._24_8_ = auVar4._24_8_;
          local_1180 = local_1a60._0_8_;
          uStack_1178 = local_1a60._8_8_;
          uStack_1170 = local_1a60._16_8_;
          uStack_1168 = local_1a60._24_8_;
          local_11a0 = 0x7f0000007f;
          uStack_1198 = 0x7f0000007f;
          uStack_1190 = 0x7f0000007f;
          uStack_1188 = 0x7f0000007f;
          local_1020 = local_1a60._0_8_;
          uStack_1018 = local_1a60._8_8_;
          uStack_1010 = local_1a60._16_8_;
          uStack_1008 = local_1a60._24_8_;
          local_1040 = 0x7f0000007f;
          uStack_1038 = 0x7f0000007f;
          uStack_1030 = 0x7f0000007f;
          uStack_1028 = 0x7f0000007f;
          auVar75._16_8_ = local_1a60._16_8_;
          auVar75._0_16_ = local_1a60._0_16_;
          auVar75._24_8_ = local_1a60._24_8_;
          auVar74._8_8_ = 0x7f0000007f;
          auVar74._0_8_ = 0x7f0000007f;
          auVar74._16_8_ = 0x7f0000007f;
          auVar74._24_8_ = 0x7f0000007f;
          auVar4 = vpaddd_avx2(auVar75,auVar74);
          local_1a60._0_8_ = auVar4._0_8_;
          local_1a60._8_8_ = auVar4._8_8_;
          local_1a60._16_8_ = auVar4._16_8_;
          local_1a60._24_8_ = auVar4._24_8_;
          local_1140 = local_1a60._0_8_;
          uStack_1138 = local_1a60._8_8_;
          uStack_1130 = local_1a60._16_8_;
          uStack_1128 = local_1a60._24_8_;
          local_1144 = 0x17;
          local_fe0 = local_1a60._0_8_;
          uStack_fd8 = local_1a60._8_8_;
          uStack_fd0 = local_1a60._16_8_;
          uStack_fc8 = local_1a60._24_8_;
          local_fe4 = 0x17;
          local_1a60 = vpslld_avx2(auVar4,ZEXT416(0x17));
          local_1120 = local_1a60._0_8_;
          uStack_1118 = local_1a60._8_8_;
          uStack_1110 = local_1a60._16_8_;
          uStack_1108 = local_1a60._24_8_;
          local_1ae0 = local_1a60._0_8_;
          uStack_1ad8 = local_1a60._8_8_;
          uStack_1ad0 = local_1a60._16_8_;
          uStack_1ac8 = local_1a60._24_8_;
          uStack_1ab0 = auVar128._16_8_;
          uStack_1aa8 = auVar3._24_8_;
          local_18e0 = local_1ac0;
          uStack_18d8 = uStack_1ab8;
          uStack_18d0 = uStack_1ab0;
          uStack_18c8 = uStack_1aa8;
          local_1900 = local_1a60._0_8_;
          uVar152 = local_1900;
          uStack_18f8 = local_1a60._8_8_;
          uVar153 = uStack_18f8;
          uStack_18f0 = local_1a60._16_8_;
          uVar154 = uStack_18f0;
          uStack_18e8 = local_1a60._24_8_;
          uVar155 = uStack_18e8;
          local_1900._0_4_ = local_1a60._0_4_;
          local_1900._4_4_ = local_1a60._4_4_;
          uStack_18f8._0_4_ = local_1a60._8_4_;
          uStack_18f8._4_4_ = local_1a60._12_4_;
          uStack_18f0._0_4_ = local_1a60._16_4_;
          uStack_18f0._4_4_ = local_1a60._20_4_;
          uStack_18e8._0_4_ = local_1a60._24_4_;
          local_1ac0._0_4_ = ((float)local_1920 + 1.0) * (float)local_1900;
          local_1ac0._4_4_ = (local_1920._4_4_ + 1.0) * local_1900._4_4_;
          uStack_18f8._0_4_ = ((float)uStack_1918 + 1.0) * (float)uStack_18f8;
          uStack_18f8._4_4_ = (uStack_1918._4_4_ + 1.0) * uStack_18f8._4_4_;
          uStack_1ab8._0_4_ = (float)uStack_18f8;
          uStack_1ab8._4_4_ = uStack_18f8._4_4_;
          uStack_1ab0._0_4_ = (float)uStack_18f0 * 1.0;
          uStack_1ab0._4_4_ = uStack_18f0._4_4_ * 1.0;
          auVar128 = _local_1ac0;
          uStack_1aa8._0_4_ = (float)uStack_18e8 * 1.0;
          uStack_1aa8._4_4_ = 0x3f800000;
          auVar3 = _local_1ac0;
          uStack_1ab0 = auVar128._16_8_;
          uStack_1aa8 = auVar3._24_8_;
          local_1c40 = (float)local_1ce0;
          fStack_1c3c = local_1ce0._4_4_;
          fStack_1c38 = (float)uStack_1cd8;
          fStack_1c34 = uStack_1cd8._4_4_;
          fStack_1c30 = (float)uStack_1cd0;
          fStack_1c2c = uStack_1cd0._4_4_;
          fStack_1c28 = (float)uStack_1cc8;
          fStack_1c24 = uStack_1cc8._4_4_;
          local_1c60 = local_1ac0;
          uStack_1c58 = uStack_1ab8;
          uStack_1c50 = uStack_1ab0;
          uStack_1c48 = uStack_1aa8;
          local_1b20 = (float)local_1ce0 + (float)local_1ac0._0_4_;
          fStack_1b1c = local_1ce0._4_4_ + (float)local_1ac0._4_4_;
          fStack_1b18 = (float)uStack_1cd8 + (float)uStack_18f8;
          fStack_1b14 = uStack_1cd8._4_4_ + uStack_18f8._4_4_;
          fStack_1b10 = (float)uStack_1cd0 + (float)uStack_18f0 * 1.0;
          fStack_1b0c = uStack_1cd0._4_4_ + uStack_18f0._4_4_ * 1.0;
          fStack_1b08 = (float)uStack_1cc8 + (float)uStack_18e8 * 1.0;
          fStack_1b04 = uStack_1cc8._4_4_ + 1.0;
          local_1b00 = (float)local_1ce0;
          fStack_1afc = local_1ce0._4_4_;
          fStack_1af8 = (float)uStack_1cd8;
          fStack_1af4 = uStack_1cd8._4_4_;
          fStack_1af0 = (float)uStack_1cd0;
          fStack_1aec = uStack_1cd0._4_4_;
          fStack_1ae8 = (float)uStack_1cc8;
          fStack_1ae4 = uStack_1cc8._4_4_;
          auVar59._16_4_ = (float)uStack_1cd0;
          auVar59._0_16_ = local_1be0;
          auVar59._20_4_ = uStack_1cd0._4_4_;
          auVar59._24_4_ = (float)uStack_1cc8;
          auVar59._28_4_ = uStack_1cc8._4_4_;
          auVar58._4_4_ = fStack_1b1c;
          auVar58._0_4_ = local_1b20;
          auVar58._8_4_ = fStack_1b18;
          auVar58._12_4_ = fStack_1b14;
          auVar58._16_4_ = fStack_1b10;
          auVar58._20_4_ = fStack_1b0c;
          auVar58._24_4_ = fStack_1b08;
          auVar58._28_4_ = fStack_1b04;
          auVar4 = vrcpps_avx(auVar58);
          auVar7._4_4_ = local_1ce0._4_4_ * auVar4._4_4_;
          auVar7._0_4_ = (float)local_1ce0 * auVar4._0_4_;
          auVar7._8_4_ = (float)uStack_1cd8 * auVar4._8_4_;
          auVar7._12_4_ = uStack_1cd8._4_4_ * auVar4._12_4_;
          auVar7._16_4_ = (float)uStack_1cd0 * auVar4._16_4_;
          auVar7._20_4_ = uStack_1cd0._4_4_ * auVar4._20_4_;
          auVar7._24_4_ = (float)uStack_1cc8 * auVar4._24_4_;
          auVar7._28_4_ = uStack_1cc8._4_4_;
          auVar6 = vfmsub213ps_fma(auVar7,auVar58,auVar59);
          auVar6 = vfnmadd213ps_fma(ZEXT1632(auVar6),auVar4,auVar7);
          local_300 = ZEXT1632(auVar6);
          local_320 = local_1b60._0_8_;
          uStack_318 = local_1b60._8_8_;
          uStack_310 = auStack_1b50._0_8_;
          uStack_308 = auStack_1b50._8_8_;
          local_340 = local_1ba0._0_8_;
          uStack_338 = local_1ba0._8_8_;
          uStack_330 = auStack_1b90._0_8_;
          uStack_328 = auStack_1b90._8_8_;
          auVar106._16_8_ = auStack_1b50._0_8_;
          auVar106._0_16_ = local_1b60;
          auVar106._24_8_ = auStack_1b50._8_8_;
          auVar105._16_8_ = auStack_1b90._0_8_;
          auVar105._0_16_ = local_1ba0;
          auVar105._24_8_ = auStack_1b90._8_8_;
          auVar189._8_4_ = 0x80000000;
          auVar189._0_8_ = 0x8000000080000000;
          auVar189._12_4_ = 0x80000000;
          auVar189._16_4_ = 0x80000000;
          auVar189._20_4_ = 0x80000000;
          auVar189._24_4_ = 0x80000000;
          auVar189._28_4_ = 0x80000000;
          auVar6 = vfmadd213ps_fma(auVar106,local_300,auVar105 ^ auVar189);
          local_5400 = auVar6._0_8_;
          uStack_53f8 = auVar6._8_8_;
          local_36c0 = local_4b00._0_8_;
          uStack_36b8 = local_4b00._8_8_;
          uStack_36b0 = local_4b00._16_8_;
          uStack_36a8 = local_4b00._24_8_;
          uVar122 = uStack_36a8;
          local_36e0 = local_5400;
          uVar113 = local_36e0;
          uStack_36d8 = uStack_53f8;
          uVar114 = uStack_36d8;
          uStack_36d0 = 0;
          uStack_36c8 = 0;
          uStack_36a8._4_4_ = local_4b00._28_4_;
          local_36e0._0_4_ = auVar6._0_4_;
          local_36e0._4_4_ = auVar6._4_4_;
          uStack_36d8._0_4_ = auVar6._8_4_;
          uStack_36d8._4_4_ = auVar6._12_4_;
          local_3ce0._4_4_ = fVar116 * local_36e0._4_4_;
          local_3ce0._0_4_ = fVar115 * (float)local_36e0;
          local_3ce0._12_4_ = fVar118 * uStack_36d8._4_4_;
          local_3ce0._8_4_ = fVar117 * (float)uStack_36d8;
          local_3ce0._20_4_ = fVar120 * 0.0;
          local_3ce0._16_4_ = fVar119 * 0.0;
          local_3ce0._28_4_ = uStack_36a8._4_4_;
          local_3ce0._24_4_ = fVar121 * 0.0;
          local_37e0 = uVar109;
          uStack_37d8 = uVar110;
          uStack_37d0 = uVar111;
          uStack_37c8 = uVar112;
          local_36e0 = uVar113;
          uStack_36d8 = uVar114;
          uStack_36a8 = uVar122;
          _local_3400 = auVar8;
          _local_3360 = auVar9;
          local_3260 = uVar123;
          uStack_3258 = uVar124;
          local_3240 = uVar125;
          uStack_3238 = uVar126;
          uStack_3230 = uVar127;
          uStack_3228 = uVar129;
          local_31e0 = uVar130;
          uStack_31d8 = uVar131;
          local_2140 = uVar132;
          uStack_2138 = uVar133;
          uStack_2130 = uVar134;
          uStack_2128 = uVar135;
          local_1ce0 = uVar136;
          uStack_1cd8 = uVar137;
          uStack_1cd0 = uVar138;
          uStack_1cc8 = uVar139;
          local_1c20 = uVar140;
          uStack_1c18 = uVar141;
          uStack_1c10 = uVar142;
          uStack_1c08 = uVar143;
          local_1c00 = uVar144;
          uStack_1bf8 = uVar145;
          uStack_1bf0 = uVar146;
          uStack_1be8 = uVar147;
          _local_1ac0 = auVar3;
          _local_1a20 = auVar5;
          local_1a00 = ZEXT1632(auVar2);
          local_1920 = uVar150;
          uStack_1918 = uVar151;
          local_1900 = uVar152;
          uStack_18f8 = uVar153;
          uStack_18f0 = uVar154;
          uStack_18e8 = uVar155;
          local_18a0 = uVar156;
          uStack_1898 = uVar157;
          local_11c0 = uVar158;
          uStack_11b8 = uVar159;
          uStack_11b0 = uVar160;
          uStack_11a8 = uVar161;
          _local_ec0 = ZEXT1632(auVar1);
          local_e40 = uVar162;
          uStack_e38 = uVar163;
          local_e00 = uVar164;
          uStack_df8 = uVar165;
          uStack_df0 = uVar166;
          uStack_de8 = uVar167;
          local_de0 = uVar168;
          uStack_dd8 = uVar169;
          uStack_dd0 = uVar170;
          uStack_dc8 = uVar171;
          local_da0 = uVar172;
          uStack_d98 = uVar173;
          uStack_d90 = uVar174;
          uStack_d88 = uVar175;
          local_d20 = uVar176;
          uStack_d18 = uVar177;
          local_360 = local_3c0;
          uStack_358 = uStack_3b8;
          uStack_350 = uStack_3b0;
          uStack_348 = uStack_3a8;
          break;
        case 6:
          local_3ca0 = 0;
          local_3a6c = *(uint *)*local_3d10;
          auVar6 = vinsertps_avx(ZEXT416(local_3a6c),ZEXT416(local_3a6c),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3a6c),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3a6c),0x30);
          auVar1 = vinsertps_avx(ZEXT416(local_3a6c),ZEXT416(local_3a6c),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_3a6c),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_3a6c),0x30);
          auVar181._16_16_ = auVar6;
          auVar181._0_16_ = auVar1;
          local_3520._0_8_ = auVar1._0_8_;
          local_3520._8_8_ = auVar1._8_8_;
          local_3520._16_8_ = auVar6._0_8_;
          local_3520._24_8_ = auVar6._8_8_;
          local_3d80 = local_3520._0_8_;
          uStack_3d78 = local_3520._8_8_;
          uStack_3d70 = local_3520._16_8_;
          uStack_3d68 = local_3520._24_8_;
          local_3cb0 = 1;
          local_3a70 = *(uint *)(*local_3d10 + 4);
          auVar6 = vinsertps_avx(ZEXT416(local_3a70),ZEXT416(local_3a70),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3a70),0x20);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(local_3a70),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_3a70),ZEXT416(local_3a70),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_3a70),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_3a70),0x30);
          auVar182._16_16_ = auVar6;
          auVar182._0_16_ = auVar2;
          local_34e0._0_8_ = auVar2._0_8_;
          local_34e0._8_8_ = auVar2._8_8_;
          local_34e0._16_8_ = auVar6._0_8_;
          local_34e0._24_8_ = auVar6._8_8_;
          local_3da0 = local_34e0._0_8_;
          uStack_3d98 = local_34e0._8_8_;
          uStack_3d90 = local_34e0._16_8_;
          uStack_3d88 = local_34e0._24_8_;
          local_38c0 = local_4b00._0_8_;
          uStack_38b8 = local_4b00._8_8_;
          uStack_38b0 = local_4b00._16_8_;
          uStack_38a8 = local_4b00._24_8_;
          local_38e0 = local_3520._0_8_;
          uStack_38d8 = local_3520._8_8_;
          uStack_38d0 = local_3520._16_8_;
          uStack_38c8 = local_3520._24_8_;
          local_3824 = 0x3f800000;
          local_3624 = 0x3f800000;
          local_3628 = 0x3f800000;
          local_362c = 0x3f800000;
          local_3630 = 0x3f800000;
          local_3634 = 0x3f800000;
          local_3638 = 0x3f800000;
          local_363c = 0x3f800000;
          local_3640 = 0x3f800000;
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          local_3660 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
          auStack_3650 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
          local_3920 = local_3660._0_8_;
          uStack_3918 = local_3660._8_8_;
          uStack_3910 = auStack_3650._0_8_;
          uStack_3908 = auStack_3650._8_8_;
          local_23e0 = local_4b00._0_8_;
          uStack_23d8 = local_4b00._8_8_;
          uStack_23d0 = local_4b00._16_8_;
          uStack_23c8 = local_4b00._24_8_;
          local_2400 = local_3520._0_8_;
          uStack_23f8 = local_3520._8_8_;
          uStack_23f0 = local_3520._16_8_;
          uStack_23e8 = local_3520._24_8_;
          local_2420 = local_34e0._0_8_;
          uStack_2418 = local_34e0._8_8_;
          uStack_2410 = local_34e0._16_8_;
          uStack_2408 = local_34e0._24_8_;
          local_2380 = local_4b00._0_8_;
          uStack_2378 = local_4b00._8_8_;
          uStack_2370 = local_4b00._16_8_;
          uStack_2368 = local_4b00._24_8_;
          local_23a0 = local_3520._0_8_;
          uStack_2398 = local_3520._8_8_;
          uStack_2390 = local_3520._16_8_;
          uStack_2388 = local_3520._24_8_;
          local_23c0 = local_34e0._0_8_;
          uStack_23b8 = local_34e0._8_8_;
          uStack_23b0 = local_34e0._16_8_;
          uStack_23a8 = local_34e0._24_8_;
          auVar47._16_8_ = local_3520._16_8_;
          auVar47._0_16_ = auVar1;
          auVar47._24_8_ = local_3520._24_8_;
          auVar46._16_8_ = local_34e0._16_8_;
          auVar46._0_16_ = auVar2;
          auVar46._24_8_ = local_34e0._24_8_;
          auVar6 = vfmadd213ps_fma(auVar47,local_4b00,auVar46);
          local_3900._0_8_ = auVar6._0_8_;
          local_3900._8_8_ = auVar6._8_8_;
          local_38a0 = 0;
          uStack_3898 = 0;
          uStack_3890 = 0;
          uStack_3888 = 0;
          local_3860 = local_3900._0_8_;
          uStack_3858 = local_3900._8_8_;
          uStack_3850 = 0;
          uStack_3848 = 0;
          local_3880 = 0;
          uStack_3878 = 0;
          uStack_3870 = 0;
          uStack_3868 = 0;
          auVar4 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(ZEXT816(0)));
          local_3900._0_8_ = auVar4._0_8_;
          local_3900._8_8_ = auVar4._8_8_;
          local_3900._16_8_ = auVar4._16_8_;
          local_3900._24_8_ = auVar4._24_8_;
          local_3800 = local_3900._0_8_;
          uStack_37f8 = local_3900._8_8_;
          uStack_37f0 = local_3900._16_8_;
          uStack_37e8 = local_3900._24_8_;
          local_3820 = local_3660._0_8_;
          uStack_3818 = local_3660._8_8_;
          uStack_3810 = auStack_3650._0_8_;
          uStack_3808 = auStack_3650._8_8_;
          auVar23._16_8_ = auStack_3650._0_8_;
          auVar23._0_16_ = local_3660;
          auVar23._24_8_ = auStack_3650._8_8_;
          local_3900 = vminps_avx(auVar4,auVar23);
          local_3700 = local_3900._0_8_;
          uVar109 = local_3700;
          uStack_36f8 = local_3900._8_8_;
          uVar110 = uStack_36f8;
          uStack_36f0 = local_3900._16_8_;
          uVar111 = uStack_36f0;
          uStack_36e8 = local_3900._24_8_;
          uVar112 = uStack_36e8;
          local_3720 = local_4b00._0_8_;
          uStack_3718 = local_4b00._8_8_;
          uStack_3710 = local_4b00._16_8_;
          uStack_3708 = local_4b00._24_8_;
          local_3700._0_4_ = local_3900._0_4_;
          local_3700._4_4_ = local_3900._4_4_;
          uStack_36f8._0_4_ = local_3900._8_4_;
          uStack_36f8._4_4_ = local_3900._12_4_;
          uStack_36f0._0_4_ = local_3900._16_4_;
          uStack_36f0._4_4_ = local_3900._20_4_;
          uStack_36e8._0_4_ = local_3900._24_4_;
          uStack_36e8._4_4_ = local_3900._28_4_;
          local_3ce0._4_4_ = local_3700._4_4_ * local_36c0._4_4_;
          local_3ce0._0_4_ = (float)local_3700 * (float)local_36c0;
          local_3ce0._12_4_ = uStack_36f8._4_4_ * uStack_36b8._4_4_;
          local_3ce0._8_4_ = (float)uStack_36f8 * (float)uStack_36b8;
          local_3ce0._20_4_ = uStack_36f0._4_4_ * uStack_36b0._4_4_;
          local_3ce0._16_4_ = (float)uStack_36f0 * (float)uStack_36b0;
          local_3ce0._28_4_ = uStack_36e8._4_4_;
          local_3ce0._24_4_ = (float)uStack_36e8 * (float)uStack_36a8;
          local_3ca8 = local_3d10;
          local_3c98 = local_3d10;
          local_3700 = uVar109;
          uStack_36f8 = uVar110;
          uStack_36f0 = uVar111;
          uStack_36e8 = uVar112;
          local_3520 = auVar181;
          local_3500 = local_3a6c;
          local_34fc = local_3a6c;
          local_34f8 = local_3a6c;
          local_34f4 = local_3a6c;
          local_34f0 = local_3a6c;
          local_34ec = local_3a6c;
          local_34e8 = local_3a6c;
          local_34e4 = local_3a6c;
          local_34e0 = auVar182;
          local_34c0 = local_3a70;
          local_34bc = local_3a70;
          local_34b8 = local_3a70;
          local_34b4 = local_3a70;
          local_34b0 = local_3a70;
          local_34ac = local_3a70;
          local_34a8 = local_3a70;
          local_34a4 = local_3a70;
          break;
        default:
          local_3ce0._0_32_ = local_4b00;
        }
        local_4b00 = local_3ce0._0_32_;
        local_3c08 = local_4a80;
        local_3c40 = local_3ce0._0_8_;
        uStack_3c38 = local_3ce0._8_8_;
        uStack_3c30 = local_3ce0._16_8_;
        paStack_3c28 = (allocator_type *)local_3ce0._24_8_;
        *local_4a80 = local_3ce0._0_32_;
        local_4a80 = local_4a80 + 1;
        in_stack_ffffffffffffaaf8 = (allocator_type *)local_3ce0._24_8_;
        local_4970 = local_49c8;
        local_4b30 = local_108;
      }
    }
    local_4950 = local_49d8;
    local_4aa8 = local_98;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffaaf8);
  return;
}

Assistant:

static void convolution_pack16to8_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                    for (int k = 0; k < maxk; k++)
                    {
                        const float* slptr = sptr + space_ofs[k] * 16;

                        __m256 _val0 = _mm256_broadcast_ss(slptr);
                        __m256 _val1 = _mm256_broadcast_ss(slptr + 1);
                        __m256 _val2 = _mm256_broadcast_ss(slptr + 2);
                        __m256 _val3 = _mm256_broadcast_ss(slptr + 3);
                        __m256 _val4 = _mm256_broadcast_ss(slptr + 4);
                        __m256 _val5 = _mm256_broadcast_ss(slptr + 5);
                        __m256 _val6 = _mm256_broadcast_ss(slptr + 6);
                        __m256 _val7 = _mm256_broadcast_ss(slptr + 7);
                        __m256 _val8 = _mm256_broadcast_ss(slptr + 8);
                        __m256 _val9 = _mm256_broadcast_ss(slptr + 9);
                        __m256 _vala = _mm256_broadcast_ss(slptr + 10);
                        __m256 _valb = _mm256_broadcast_ss(slptr + 11);
                        __m256 _valc = _mm256_broadcast_ss(slptr + 12);
                        __m256 _vald = _mm256_broadcast_ss(slptr + 13);
                        __m256 _vale = _mm256_broadcast_ss(slptr + 14);
                        __m256 _valf = _mm256_broadcast_ss(slptr + 15);

                        __m256 _w0 = _mm256_load_ps(kptr + 8 * 0);
                        __m256 _w1 = _mm256_load_ps(kptr + 8 * 1);
                        __m256 _w2 = _mm256_load_ps(kptr + 8 * 2);
                        __m256 _w3 = _mm256_load_ps(kptr + 8 * 3);
                        __m256 _w4 = _mm256_load_ps(kptr + 8 * 4);
                        __m256 _w5 = _mm256_load_ps(kptr + 8 * 5);
                        __m256 _w6 = _mm256_load_ps(kptr + 8 * 6);
                        __m256 _w7 = _mm256_load_ps(kptr + 8 * 7);
                        __m256 _w8 = _mm256_load_ps(kptr + 8 * 8);
                        __m256 _w9 = _mm256_load_ps(kptr + 8 * 9);
                        __m256 _wa = _mm256_load_ps(kptr + 8 * 10);
                        __m256 _wb = _mm256_load_ps(kptr + 8 * 11);
                        __m256 _wc = _mm256_load_ps(kptr + 8 * 12);
                        __m256 _wd = _mm256_load_ps(kptr + 8 * 13);
                        __m256 _we = _mm256_load_ps(kptr + 8 * 14);
                        __m256 _wf = _mm256_load_ps(kptr + 8 * 15);

                        _sum = _mm256_fmadd_ps(_val0, _w0, _sum);
                        _sum = _mm256_fmadd_ps(_val1, _w1, _sum);
                        _sum = _mm256_fmadd_ps(_val2, _w2, _sum);
                        _sum = _mm256_fmadd_ps(_val3, _w3, _sum);
                        _sum = _mm256_fmadd_ps(_val4, _w4, _sum);
                        _sum = _mm256_fmadd_ps(_val5, _w5, _sum);
                        _sum = _mm256_fmadd_ps(_val6, _w6, _sum);
                        _sum = _mm256_fmadd_ps(_val7, _w7, _sum);
                        _sum = _mm256_fmadd_ps(_val8, _w8, _sum);
                        _sum = _mm256_fmadd_ps(_val9, _w9, _sum);
                        _sum = _mm256_fmadd_ps(_vala, _wa, _sum);
                        _sum = _mm256_fmadd_ps(_valb, _wb, _sum);
                        _sum = _mm256_fmadd_ps(_valc, _wc, _sum);
                        _sum = _mm256_fmadd_ps(_vald, _wd, _sum);
                        _sum = _mm256_fmadd_ps(_vale, _we, _sum);
                        _sum = _mm256_fmadd_ps(_valf, _wf, _sum);

                        kptr += 128;
                    }
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_storeu_ps(outptr, _sum);
                outptr += 8;
            }
        }
    }
}